

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined4 uVar11;
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined8 uVar107;
  undefined8 uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [12];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  uint uVar122;
  int iVar123;
  ulong uVar124;
  RTCIntersectArguments *pRVar125;
  uint uVar126;
  long lVar127;
  bool bVar128;
  long lVar129;
  ulong uVar130;
  Geometry *geometry;
  long lVar131;
  float fVar132;
  float fVar151;
  float fVar154;
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar133;
  undefined1 auVar140 [16];
  float fVar161;
  float fVar164;
  float fVar167;
  undefined1 auVar141 [32];
  float fVar155;
  float fVar158;
  float fVar168;
  float fVar171;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar190;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 bi_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar218;
  float fVar220;
  vint4 ai_1;
  undefined1 auVar206 [16];
  float fVar221;
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  float fVar219;
  float fVar222;
  undefined1 auVar210 [16];
  undefined1 auVar208 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  float fVar226;
  float fVar239;
  float fVar241;
  vint4 ai_2;
  undefined1 auVar228 [16];
  float fVar243;
  undefined1 auVar229 [16];
  float fVar227;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar248 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [32];
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar245;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar246;
  float fVar256;
  float fVar257;
  undefined1 auVar247 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar264;
  float fVar265;
  float fVar273;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar282;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar274;
  float fVar276;
  float fVar278;
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar272 [32];
  vint4 ai;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar293;
  float fVar294;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar306;
  undefined1 auVar299 [32];
  float fVar305;
  float fVar309;
  undefined1 auVar300 [32];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  undefined1 auVar301 [64];
  float fVar312;
  float fVar319;
  float fVar320;
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  float fVar321;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [64];
  float fVar322;
  float fVar330;
  float fVar332;
  undefined1 auVar324 [16];
  float fVar323;
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  float fVar337;
  float fVar338;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar339 [16];
  float fVar344;
  undefined1 auVar340 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar351;
  float fVar355;
  float fVar356;
  undefined1 auVar352 [16];
  float fVar357;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar358;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar359 [32];
  undefined1 auVar360 [64];
  float fVar367;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  uint local_8a0;
  undefined4 uStack_89c;
  undefined8 local_7e0;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 *local_730;
  undefined1 (*local_728) [16];
  undefined1 (*local_720) [32];
  Precalculations *local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5f0;
  Primitive *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_320 [32];
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  RTCHitN local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar12 = prim[1];
  uVar124 = (ulong)(byte)PVar12;
  lVar20 = uVar124 * 0x25;
  fVar338 = *(float *)(prim + lVar20 + 0x12);
  auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar248 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar248 = vsubps_avx(auVar248,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar175._0_4_ = fVar338 * auVar248._0_4_;
  auVar175._4_4_ = fVar338 * auVar248._4_4_;
  auVar175._8_4_ = fVar338 * auVar248._8_4_;
  auVar175._12_4_ = fVar338 * auVar248._12_4_;
  auVar285._0_4_ = fVar338 * auVar197._0_4_;
  auVar285._4_4_ = fVar338 * auVar197._4_4_;
  auVar285._8_4_ = fVar338 * auVar197._8_4_;
  auVar285._12_4_ = fVar338 * auVar197._12_4_;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 5 + 6)));
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar210 = vcvtdq2ps_avx(auVar210);
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar124 + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 6)));
  auVar209 = vcvtdq2ps_avx(auVar209);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vshufps_avx(auVar285,auVar285,0);
  auVar25 = vshufps_avx(auVar285,auVar285,0x55);
  auVar26 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar338 = auVar26._0_4_;
  fVar219 = auVar26._4_4_;
  fVar342 = auVar26._8_4_;
  fVar222 = auVar26._12_4_;
  fVar226 = auVar25._0_4_;
  fVar239 = auVar25._4_4_;
  fVar241 = auVar25._8_4_;
  fVar243 = auVar25._12_4_;
  fVar205 = auVar24._0_4_;
  fVar218 = auVar24._4_4_;
  fVar220 = auVar24._8_4_;
  fVar221 = auVar24._12_4_;
  auVar345._0_4_ = fVar205 * auVar248._0_4_ + fVar226 * auVar197._0_4_ + fVar338 * auVar232._0_4_;
  auVar345._4_4_ = fVar218 * auVar248._4_4_ + fVar239 * auVar197._4_4_ + fVar219 * auVar232._4_4_;
  auVar345._8_4_ = fVar220 * auVar248._8_4_ + fVar241 * auVar197._8_4_ + fVar342 * auVar232._8_4_;
  auVar345._12_4_ =
       fVar221 * auVar248._12_4_ + fVar243 * auVar197._12_4_ + fVar222 * auVar232._12_4_;
  auVar352._0_4_ = fVar205 * auVar210._0_4_ + fVar226 * auVar195._0_4_ + auVar231._0_4_ * fVar338;
  auVar352._4_4_ = fVar218 * auVar210._4_4_ + fVar239 * auVar195._4_4_ + auVar231._4_4_ * fVar219;
  auVar352._8_4_ = fVar220 * auVar210._8_4_ + fVar241 * auVar195._8_4_ + auVar231._8_4_ * fVar342;
  auVar352._12_4_ =
       fVar221 * auVar210._12_4_ + fVar243 * auVar195._12_4_ + auVar231._12_4_ * fVar222;
  auVar286._0_4_ = fVar205 * auVar209._0_4_ + fVar226 * auVar22._0_4_ + auVar23._0_4_ * fVar338;
  auVar286._4_4_ = fVar218 * auVar209._4_4_ + fVar239 * auVar22._4_4_ + auVar23._4_4_ * fVar219;
  auVar286._8_4_ = fVar220 * auVar209._8_4_ + fVar241 * auVar22._8_4_ + auVar23._8_4_ * fVar342;
  auVar286._12_4_ = fVar221 * auVar209._12_4_ + fVar243 * auVar22._12_4_ + auVar23._12_4_ * fVar222;
  auVar24 = vshufps_avx(auVar175,auVar175,0);
  auVar25 = vshufps_avx(auVar175,auVar175,0x55);
  auVar26 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar338 = auVar26._0_4_;
  fVar219 = auVar26._4_4_;
  fVar342 = auVar26._8_4_;
  fVar222 = auVar26._12_4_;
  fVar226 = auVar25._0_4_;
  fVar239 = auVar25._4_4_;
  fVar241 = auVar25._8_4_;
  fVar243 = auVar25._12_4_;
  fVar205 = auVar24._0_4_;
  fVar218 = auVar24._4_4_;
  fVar220 = auVar24._8_4_;
  fVar221 = auVar24._12_4_;
  auVar176._0_4_ = fVar205 * auVar248._0_4_ + fVar226 * auVar197._0_4_ + fVar338 * auVar232._0_4_;
  auVar176._4_4_ = fVar218 * auVar248._4_4_ + fVar239 * auVar197._4_4_ + fVar219 * auVar232._4_4_;
  auVar176._8_4_ = fVar220 * auVar248._8_4_ + fVar241 * auVar197._8_4_ + fVar342 * auVar232._8_4_;
  auVar176._12_4_ =
       fVar221 * auVar248._12_4_ + fVar243 * auVar197._12_4_ + fVar222 * auVar232._12_4_;
  auVar134._0_4_ = fVar205 * auVar210._0_4_ + auVar231._0_4_ * fVar338 + fVar226 * auVar195._0_4_;
  auVar134._4_4_ = fVar218 * auVar210._4_4_ + auVar231._4_4_ * fVar219 + fVar239 * auVar195._4_4_;
  auVar134._8_4_ = fVar220 * auVar210._8_4_ + auVar231._8_4_ * fVar342 + fVar241 * auVar195._8_4_;
  auVar134._12_4_ =
       fVar221 * auVar210._12_4_ + auVar231._12_4_ * fVar222 + fVar243 * auVar195._12_4_;
  auVar295._8_4_ = 0x7fffffff;
  auVar295._0_8_ = 0x7fffffff7fffffff;
  auVar295._12_4_ = 0x7fffffff;
  auVar248 = vandps_avx(auVar345,auVar295);
  auVar228._8_4_ = 0x219392ef;
  auVar228._0_8_ = 0x219392ef219392ef;
  auVar228._12_4_ = 0x219392ef;
  auVar248 = vcmpps_avx(auVar248,auVar228,1);
  auVar197 = vblendvps_avx(auVar345,auVar228,auVar248);
  auVar248 = vandps_avx(auVar352,auVar295);
  auVar248 = vcmpps_avx(auVar248,auVar228,1);
  auVar232 = vblendvps_avx(auVar352,auVar228,auVar248);
  auVar248 = vandps_avx(auVar295,auVar286);
  auVar248 = vcmpps_avx(auVar248,auVar228,1);
  auVar248 = vblendvps_avx(auVar286,auVar228,auVar248);
  auVar191._0_4_ = fVar205 * auVar209._0_4_ + fVar226 * auVar22._0_4_ + auVar23._0_4_ * fVar338;
  auVar191._4_4_ = fVar218 * auVar209._4_4_ + fVar239 * auVar22._4_4_ + auVar23._4_4_ * fVar219;
  auVar191._8_4_ = fVar220 * auVar209._8_4_ + fVar241 * auVar22._8_4_ + auVar23._8_4_ * fVar342;
  auVar191._12_4_ = fVar221 * auVar209._12_4_ + fVar243 * auVar22._12_4_ + auVar23._12_4_ * fVar222;
  auVar210 = vrcpps_avx(auVar197);
  fVar205 = auVar210._0_4_;
  auVar206._0_4_ = fVar205 * auVar197._0_4_;
  fVar218 = auVar210._4_4_;
  auVar206._4_4_ = fVar218 * auVar197._4_4_;
  fVar220 = auVar210._8_4_;
  auVar206._8_4_ = fVar220 * auVar197._8_4_;
  fVar221 = auVar210._12_4_;
  auVar206._12_4_ = fVar221 * auVar197._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar197 = vsubps_avx(auVar266,auVar206);
  fVar205 = fVar205 + fVar205 * auVar197._0_4_;
  fVar218 = fVar218 + fVar218 * auVar197._4_4_;
  fVar220 = fVar220 + fVar220 * auVar197._8_4_;
  fVar221 = fVar221 + fVar221 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar232);
  fVar226 = auVar197._0_4_;
  auVar247._0_4_ = fVar226 * auVar232._0_4_;
  fVar239 = auVar197._4_4_;
  auVar247._4_4_ = fVar239 * auVar232._4_4_;
  fVar241 = auVar197._8_4_;
  auVar247._8_4_ = fVar241 * auVar232._8_4_;
  fVar243 = auVar197._12_4_;
  auVar247._12_4_ = fVar243 * auVar232._12_4_;
  auVar197 = vsubps_avx(auVar266,auVar247);
  fVar226 = fVar226 + fVar226 * auVar197._0_4_;
  fVar239 = fVar239 + fVar239 * auVar197._4_4_;
  fVar241 = fVar241 + fVar241 * auVar197._8_4_;
  fVar243 = fVar243 + fVar243 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar248);
  fVar246 = auVar197._0_4_;
  auVar287._0_4_ = fVar246 * auVar248._0_4_;
  fVar256 = auVar197._4_4_;
  auVar287._4_4_ = fVar256 * auVar248._4_4_;
  fVar257 = auVar197._8_4_;
  auVar287._8_4_ = fVar257 * auVar248._8_4_;
  fVar258 = auVar197._12_4_;
  auVar287._12_4_ = fVar258 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar266,auVar287);
  fVar246 = fVar246 + fVar246 * auVar248._0_4_;
  fVar256 = fVar256 + fVar256 * auVar248._4_4_;
  fVar257 = fVar257 + fVar257 * auVar248._8_4_;
  fVar258 = fVar258 + fVar258 * auVar248._12_4_;
  auVar248 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar232 = vshufps_avx(auVar248,auVar248,0);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar248 = vpmovsxwd_avx(auVar248);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar210 = vsubps_avx(auVar197,auVar248);
  fVar338 = auVar232._0_4_;
  fVar219 = auVar232._4_4_;
  fVar342 = auVar232._8_4_;
  fVar222 = auVar232._12_4_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar197 = vpmovsxwd_avx(auVar232);
  auVar288._0_4_ = auVar210._0_4_ * fVar338 + auVar248._0_4_;
  auVar288._4_4_ = auVar210._4_4_ * fVar219 + auVar248._4_4_;
  auVar288._8_4_ = auVar210._8_4_ * fVar342 + auVar248._8_4_;
  auVar288._12_4_ = auVar210._12_4_ * fVar222 + auVar248._12_4_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 6);
  auVar232 = vpmovsxwd_avx(auVar210);
  auVar248 = vcvtdq2ps_avx(auVar197);
  auVar197 = vcvtdq2ps_avx(auVar232);
  auVar197 = vsubps_avx(auVar197,auVar248);
  auVar296._0_4_ = auVar197._0_4_ * fVar338 + auVar248._0_4_;
  auVar296._4_4_ = auVar197._4_4_ * fVar219 + auVar248._4_4_;
  auVar296._8_4_ = auVar197._8_4_ * fVar342 + auVar248._8_4_;
  auVar296._12_4_ = auVar197._12_4_ * fVar222 + auVar248._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 6);
  auVar248 = vpmovsxwd_avx(auVar195);
  uVar130 = (ulong)(uint)((int)(uVar124 * 5) << 2);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar124 * 2 + uVar130 + 6);
  auVar197 = vpmovsxwd_avx(auVar231);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar248);
  auVar313._0_4_ = auVar197._0_4_ * fVar338 + auVar248._0_4_;
  auVar313._4_4_ = auVar197._4_4_ * fVar219 + auVar248._4_4_;
  auVar313._8_4_ = auVar197._8_4_ * fVar342 + auVar248._8_4_;
  auVar313._12_4_ = auVar197._12_4_ * fVar222 + auVar248._12_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar130 + 6);
  auVar248 = vpmovsxwd_avx(auVar209);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 6);
  auVar197 = vpmovsxwd_avx(auVar22);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar232 = vsubps_avx(auVar197,auVar248);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 6);
  auVar197 = vpmovsxwd_avx(auVar23);
  auVar324._0_4_ = auVar232._0_4_ * fVar338 + auVar248._0_4_;
  auVar324._4_4_ = auVar232._4_4_ * fVar219 + auVar248._4_4_;
  auVar324._8_4_ = auVar232._8_4_ * fVar342 + auVar248._8_4_;
  auVar324._12_4_ = auVar232._12_4_ * fVar222 + auVar248._12_4_;
  auVar248 = vcvtdq2ps_avx(auVar197);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar124 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar197 = vpmovsxwd_avx(auVar24);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar248);
  auVar339._0_4_ = auVar197._0_4_ * fVar338 + auVar248._0_4_;
  auVar339._4_4_ = auVar197._4_4_ * fVar219 + auVar248._4_4_;
  auVar339._8_4_ = auVar197._8_4_ * fVar342 + auVar248._8_4_;
  auVar339._12_4_ = auVar197._12_4_ * fVar222 + auVar248._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar124) + 6);
  auVar248 = vpmovsxwd_avx(auVar25);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 6);
  auVar197 = vpmovsxwd_avx(auVar26);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar248);
  auVar267._0_4_ = auVar248._0_4_ + auVar197._0_4_ * fVar338;
  auVar267._4_4_ = auVar248._4_4_ + auVar197._4_4_ * fVar219;
  auVar267._8_4_ = auVar248._8_4_ + auVar197._8_4_ * fVar342;
  auVar267._12_4_ = auVar248._12_4_ + auVar197._12_4_ * fVar222;
  auVar248 = vsubps_avx(auVar288,auVar176);
  auVar289._0_4_ = fVar205 * auVar248._0_4_;
  auVar289._4_4_ = fVar218 * auVar248._4_4_;
  auVar289._8_4_ = fVar220 * auVar248._8_4_;
  auVar289._12_4_ = fVar221 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar296,auVar176);
  auVar177._0_4_ = fVar205 * auVar248._0_4_;
  auVar177._4_4_ = fVar218 * auVar248._4_4_;
  auVar177._8_4_ = fVar220 * auVar248._8_4_;
  auVar177._12_4_ = fVar221 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar313,auVar134);
  auVar207._0_4_ = fVar226 * auVar248._0_4_;
  auVar207._4_4_ = fVar239 * auVar248._4_4_;
  auVar207._8_4_ = fVar241 * auVar248._8_4_;
  auVar207._12_4_ = fVar243 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar324,auVar134);
  auVar135._0_4_ = fVar226 * auVar248._0_4_;
  auVar135._4_4_ = fVar239 * auVar248._4_4_;
  auVar135._8_4_ = fVar241 * auVar248._8_4_;
  auVar135._12_4_ = fVar243 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar339,auVar191);
  auVar229._0_4_ = fVar246 * auVar248._0_4_;
  auVar229._4_4_ = fVar256 * auVar248._4_4_;
  auVar229._8_4_ = fVar257 * auVar248._8_4_;
  auVar229._12_4_ = fVar258 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar267,auVar191);
  auVar192._0_4_ = fVar246 * auVar248._0_4_;
  auVar192._4_4_ = fVar256 * auVar248._4_4_;
  auVar192._8_4_ = fVar257 * auVar248._8_4_;
  auVar192._12_4_ = fVar258 * auVar248._12_4_;
  auVar248 = vpminsd_avx(auVar289,auVar177);
  auVar197 = vpminsd_avx(auVar207,auVar135);
  auVar248 = vmaxps_avx(auVar248,auVar197);
  auVar197 = vpminsd_avx(auVar229,auVar192);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar297._4_4_ = uVar11;
  auVar297._0_4_ = uVar11;
  auVar297._8_4_ = uVar11;
  auVar297._12_4_ = uVar11;
  auVar197 = vmaxps_avx(auVar197,auVar297);
  auVar248 = vmaxps_avx(auVar248,auVar197);
  local_3f0._0_4_ = auVar248._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar248._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar248._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar248._12_4_ * 0.99999964;
  auVar248 = vpmaxsd_avx(auVar289,auVar177);
  auVar197 = vpmaxsd_avx(auVar207,auVar135);
  auVar248 = vminps_avx(auVar248,auVar197);
  auVar197 = vpmaxsd_avx(auVar229,auVar192);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar193._4_4_ = uVar11;
  auVar193._0_4_ = uVar11;
  auVar193._8_4_ = uVar11;
  auVar193._12_4_ = uVar11;
  auVar197 = vminps_avx(auVar197,auVar193);
  auVar248 = vminps_avx(auVar248,auVar197);
  auVar136._0_4_ = auVar248._0_4_ * 1.0000004;
  auVar136._4_4_ = auVar248._4_4_ * 1.0000004;
  auVar136._8_4_ = auVar248._8_4_ * 1.0000004;
  auVar136._12_4_ = auVar248._12_4_ * 1.0000004;
  auVar248 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar197 = vpcmpgtd_avx(auVar248,_DAT_01f7fcf0);
  auVar248 = vcmpps_avx(local_3f0,auVar136,2);
  auVar248 = vandps_avx(auVar248,auVar197);
  uVar122 = vmovmskps_avx(auVar248);
  if (uVar122 != 0) {
    uVar122 = uVar122 & 0xff;
    local_5f0 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    uVar126 = 1 << ((byte)k & 0x1f);
    local_720 = (undefined1 (*) [32])&local_120;
    local_728 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar126 & 0xf) << 4));
    local_730 = mm_lookupmask_ps + (long)((int)uVar126 >> 4) * 0x10;
    local_718 = pre;
    local_5e8 = prim;
    do {
      lVar20 = 0;
      if (uVar122 != 0) {
        for (; (uVar122 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar13 = *(uint *)(local_5e8 + 2);
      uVar14 = *(uint *)(local_5e8 + lVar20 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[uVar13].ptr;
      local_5a0._0_8_ = CONCAT44(0,uVar14);
      uVar124 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,uVar14) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar338 = (pGVar16->time_range).lower;
      fVar338 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar338) /
                ((pGVar16->time_range).upper - fVar338));
      auVar248 = vroundss_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),9);
      auVar248 = vminss_avx(auVar248,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar248 = vmaxss_avx(ZEXT816(0) << 0x20,auVar248);
      fVar338 = fVar338 - auVar248._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar127 = (long)(int)auVar248._0_4_ * 0x38;
      lVar20 = *(long *)(_Var17 + 0x10 + lVar127);
      lVar131 = *(long *)(_Var17 + 0x38 + lVar127);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar127);
      auVar248 = vshufps_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),0);
      pfVar1 = (float *)(lVar131 + uVar124 * lVar18);
      fVar219 = auVar248._0_4_;
      fVar342 = auVar248._4_4_;
      fVar222 = auVar248._8_4_;
      fVar205 = auVar248._12_4_;
      pfVar2 = (float *)(lVar131 + (uVar124 + 1) * lVar18);
      lVar129 = (uVar124 + 2) * lVar18;
      pfVar3 = (float *)(lVar131 + lVar129);
      pfVar4 = (float *)(lVar131 + lVar18 * (uVar124 + 3));
      lVar131 = *(long *)(_Var17 + lVar127);
      auVar248 = vshufps_avx(ZEXT416((uint)(1.0 - fVar338)),ZEXT416((uint)(1.0 - fVar338)),0);
      pfVar5 = (float *)(lVar131 + lVar20 * uVar124);
      fVar338 = auVar248._0_4_;
      fVar218 = auVar248._4_4_;
      fVar220 = auVar248._8_4_;
      fVar221 = auVar248._12_4_;
      pfVar6 = (float *)(lVar131 + lVar20 * (uVar124 + 1));
      pfVar7 = (float *)(lVar131 + lVar20 * (uVar124 + 2));
      pfVar8 = (float *)(lVar131 + lVar20 * (uVar124 + 3));
      uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar15 * 0x44;
      local_740 = (undefined1  [8])
                  CONCAT44(fVar342 * pfVar1[1] + fVar218 * pfVar5[1],
                           fVar219 * *pfVar1 + fVar338 * *pfVar5);
      uStack_738._0_4_ = fVar222 * pfVar1[2] + fVar220 * pfVar5[2];
      uStack_738._4_4_ = fVar205 * pfVar1[3] + fVar221 * pfVar5[3];
      local_650 = (undefined1  [8])
                  CONCAT44(fVar218 * pfVar6[1] + fVar342 * pfVar2[1],
                           fVar338 * *pfVar6 + fVar219 * *pfVar2);
      uStack_648._0_4_ = fVar220 * pfVar6[2] + fVar222 * pfVar2[2];
      uStack_648._4_4_ = fVar221 * pfVar6[3] + fVar205 * pfVar2[3];
      local_660 = (undefined1  [8])
                  CONCAT44(fVar218 * pfVar7[1] + fVar342 * pfVar3[1],
                           fVar338 * *pfVar7 + fVar219 * *pfVar3);
      uStack_658._0_4_ = fVar220 * pfVar7[2] + fVar222 * pfVar3[2];
      uStack_658._4_4_ = fVar221 * pfVar7[3] + fVar205 * pfVar3[3];
      local_670 = (undefined1  [8])
                  CONCAT44(fVar218 * pfVar8[1] + fVar342 * pfVar4[1],
                           fVar338 * *pfVar8 + fVar219 * *pfVar4);
      uStack_668._0_4_ = fVar220 * pfVar8[2] + fVar222 * pfVar4[2];
      uStack_668._4_4_ = fVar221 * pfVar8[3] + fVar205 * pfVar4[3];
      auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar210 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar232 = vsubps_avx(_local_740,auVar210);
      auVar248 = vshufps_avx(auVar232,auVar232,0);
      auVar197 = vshufps_avx(auVar232,auVar232,0x55);
      auVar232 = vshufps_avx(auVar232,auVar232,0xaa);
      fVar338 = (local_5f0->vx).field_0.m128[0];
      fVar219 = (local_5f0->vx).field_0.m128[1];
      fVar342 = (local_5f0->vx).field_0.m128[2];
      fVar222 = (local_5f0->vx).field_0.m128[3];
      fVar205 = (local_5f0->vy).field_0.m128[0];
      fVar218 = (local_5f0->vy).field_0.m128[1];
      fVar220 = (local_5f0->vy).field_0.m128[2];
      fVar221 = (local_5f0->vy).field_0.m128[3];
      fVar226 = (local_5f0->vz).field_0.m128[0];
      fVar239 = (local_5f0->vz).field_0.m128[1];
      fVar241 = (local_5f0->vz).field_0.m128[2];
      fVar243 = (local_5f0->vz).field_0.m128[3];
      auVar208._0_8_ =
           CONCAT44(auVar248._4_4_ * fVar219 + auVar197._4_4_ * fVar218 + fVar239 * auVar232._4_4_,
                    auVar248._0_4_ * fVar338 + auVar197._0_4_ * fVar205 + fVar226 * auVar232._0_4_);
      auVar208._8_4_ =
           auVar248._8_4_ * fVar342 + auVar197._8_4_ * fVar220 + fVar241 * auVar232._8_4_;
      auVar208._12_4_ =
           auVar248._12_4_ * fVar222 + auVar197._12_4_ * fVar221 + fVar243 * auVar232._12_4_;
      auVar248 = vblendps_avx(auVar208,_local_740,8);
      auVar195 = vsubps_avx(_local_650,auVar210);
      auVar197 = vshufps_avx(auVar195,auVar195,0);
      auVar232 = vshufps_avx(auVar195,auVar195,0x55);
      auVar195 = vshufps_avx(auVar195,auVar195,0xaa);
      auVar290._0_4_ =
           auVar197._0_4_ * fVar338 + auVar232._0_4_ * fVar205 + fVar226 * auVar195._0_4_;
      auVar290._4_4_ =
           auVar197._4_4_ * fVar219 + auVar232._4_4_ * fVar218 + fVar239 * auVar195._4_4_;
      auVar290._8_4_ =
           auVar197._8_4_ * fVar342 + auVar232._8_4_ * fVar220 + fVar241 * auVar195._8_4_;
      auVar290._12_4_ =
           auVar197._12_4_ * fVar222 + auVar232._12_4_ * fVar221 + fVar243 * auVar195._12_4_;
      auVar197 = vblendps_avx(auVar290,_local_650,8);
      auVar231 = vsubps_avx(_local_660,auVar210);
      auVar232 = vshufps_avx(auVar231,auVar231,0);
      auVar195 = vshufps_avx(auVar231,auVar231,0x55);
      auVar231 = vshufps_avx(auVar231,auVar231,0xaa);
      auVar298._0_4_ =
           auVar232._0_4_ * fVar338 + auVar195._0_4_ * fVar205 + auVar231._0_4_ * fVar226;
      auVar298._4_4_ =
           auVar232._4_4_ * fVar219 + auVar195._4_4_ * fVar218 + auVar231._4_4_ * fVar239;
      auVar298._8_4_ =
           auVar232._8_4_ * fVar342 + auVar195._8_4_ * fVar220 + auVar231._8_4_ * fVar241;
      auVar298._12_4_ =
           auVar232._12_4_ * fVar222 + auVar195._12_4_ * fVar221 + auVar231._12_4_ * fVar243;
      auVar232 = vblendps_avx(auVar298,_local_660,8);
      auVar231 = vsubps_avx(_local_670,auVar210);
      auVar210 = vshufps_avx(auVar231,auVar231,0);
      auVar195 = vshufps_avx(auVar231,auVar231,0x55);
      auVar231 = vshufps_avx(auVar231,auVar231,0xaa);
      auVar178._0_4_ =
           auVar210._0_4_ * fVar338 + auVar195._0_4_ * fVar205 + fVar226 * auVar231._0_4_;
      auVar178._4_4_ =
           auVar210._4_4_ * fVar219 + auVar195._4_4_ * fVar218 + fVar239 * auVar231._4_4_;
      auVar178._8_4_ =
           auVar210._8_4_ * fVar342 + auVar195._8_4_ * fVar220 + fVar241 * auVar231._8_4_;
      auVar178._12_4_ =
           auVar210._12_4_ * fVar222 + auVar195._12_4_ * fVar221 + fVar243 * auVar231._12_4_;
      auVar210 = vblendps_avx(auVar178,_local_670,8);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar248 = vandps_avx(auVar248,auVar230);
      auVar197 = vandps_avx(auVar197,auVar230);
      auVar195 = vmaxps_avx(auVar248,auVar197);
      auVar248 = vandps_avx(auVar232,auVar230);
      auVar197 = vandps_avx(auVar210,auVar230);
      auVar248 = vmaxps_avx(auVar248,auVar197);
      auVar248 = vmaxps_avx(auVar195,auVar248);
      auVar197 = vmovshdup_avx(auVar248);
      auVar197 = vmaxss_avx(auVar197,auVar248);
      auVar248 = vshufpd_avx(auVar248,auVar248,1);
      auVar248 = vmaxss_avx(auVar248,auVar197);
      fVar221 = *(float *)(bspline_basis0 + lVar20 + 0x908);
      fVar226 = *(float *)(bspline_basis0 + lVar20 + 0x90c);
      fVar239 = *(float *)(bspline_basis0 + lVar20 + 0x910);
      fVar241 = *(float *)(bspline_basis0 + lVar20 + 0x914);
      fVar243 = *(float *)(bspline_basis0 + lVar20 + 0x918);
      fVar246 = *(float *)(bspline_basis0 + lVar20 + 0x91c);
      fVar256 = *(float *)(bspline_basis0 + lVar20 + 0x920);
      auVar197 = vshufps_avx(auVar298,auVar298,0);
      register0x00001250 = auVar197;
      _local_6a0 = auVar197;
      auVar232 = vshufps_avx(auVar298,auVar298,0x55);
      register0x00001290 = auVar232;
      _local_560 = auVar232;
      fVar338 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      fVar219 = *(float *)(bspline_basis0 + lVar20 + 0xd90);
      fVar342 = *(float *)(bspline_basis0 + lVar20 + 0xd94);
      fVar222 = *(float *)(bspline_basis0 + lVar20 + 0xd98);
      fVar205 = *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      fVar218 = *(float *)(bspline_basis0 + lVar20 + 0xda0);
      fVar220 = *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar210 = vshufps_avx(auVar178,auVar178,0);
      register0x00001210 = auVar210;
      _local_5c0 = auVar210;
      fVar172 = auVar210._0_4_;
      fVar245 = auVar210._4_4_;
      fVar153 = auVar210._8_4_;
      fVar157 = auVar210._12_4_;
      fVar160 = auVar197._0_4_;
      fVar163 = auVar197._4_4_;
      fVar166 = auVar197._8_4_;
      fVar170 = auVar197._12_4_;
      auVar197 = vshufps_avx(auVar178,auVar178,0x55);
      fVar337 = auVar197._0_4_;
      fVar341 = auVar197._4_4_;
      fVar343 = auVar197._8_4_;
      fVar344 = auVar197._12_4_;
      fVar173 = auVar232._0_4_;
      fVar190 = auVar232._4_4_;
      fVar274 = auVar232._8_4_;
      fVar278 = auVar232._12_4_;
      auVar197 = vshufps_avx(_local_660,_local_660,0xff);
      register0x00001450 = auVar197;
      _local_80 = auVar197;
      auVar232 = vshufps_avx(_local_670,_local_670,0xff);
      register0x00001390 = auVar232;
      _local_240 = auVar232;
      fVar264 = auVar232._0_4_;
      fVar273 = auVar232._4_4_;
      fVar275 = auVar232._8_4_;
      fVar277 = auVar232._12_4_;
      fVar312 = auVar197._0_4_;
      fVar319 = auVar197._4_4_;
      fVar320 = auVar197._8_4_;
      auVar232 = vshufps_avx(auVar290,auVar290,0);
      auVar233._16_16_ = auVar232;
      auVar233._0_16_ = auVar232;
      fVar257 = *(float *)(bspline_basis0 + lVar20 + 0x484);
      fVar258 = *(float *)(bspline_basis0 + lVar20 + 0x488);
      fVar281 = *(float *)(bspline_basis0 + lVar20 + 0x48c);
      fVar283 = *(float *)(bspline_basis0 + lVar20 + 0x490);
      fVar294 = *(float *)(bspline_basis0 + lVar20 + 0x494);
      fVar223 = *(float *)(bspline_basis0 + lVar20 + 0x498);
      fVar335 = *(float *)(bspline_basis0 + lVar20 + 0x49c);
      fVar227 = auVar232._0_4_;
      fVar240 = auVar232._4_4_;
      fVar242 = auVar232._8_4_;
      fVar244 = auVar232._12_4_;
      auVar232 = vshufps_avx(auVar290,auVar290,0x55);
      fVar367 = auVar232._0_4_;
      fVar370 = auVar232._4_4_;
      fVar371 = auVar232._8_4_;
      fVar372 = auVar232._12_4_;
      auVar232 = vshufps_avx(_local_650,_local_650,0xff);
      register0x00001590 = auVar232;
      _local_a0 = auVar232;
      fVar132 = auVar232._0_4_;
      fVar151 = auVar232._4_4_;
      fVar154 = auVar232._8_4_;
      fVar158 = auVar232._12_4_;
      auVar109._8_4_ = auVar208._8_4_;
      auVar109._0_8_ = auVar208._0_8_;
      auVar109._12_4_ = auVar208._12_4_;
      auVar232 = vshufps_avx(auVar109,auVar109,0);
      register0x00001350 = auVar232;
      _local_420 = auVar232;
      pauVar9 = (undefined1 (*) [16])(bspline_basis0 + lVar20);
      fVar303 = *(float *)*pauVar9;
      fVar305 = *(float *)(bspline_basis0 + lVar20 + 4);
      fVar224 = *(float *)(bspline_basis0 + lVar20 + 8);
      auVar118 = *(undefined1 (*) [12])*pauVar9;
      fVar336 = *(float *)(bspline_basis0 + lVar20 + 0xc);
      fStack_490 = *(float *)(bspline_basis0 + lVar20 + 0x10);
      fStack_48c = *(float *)(bspline_basis0 + lVar20 + 0x14);
      fStack_488 = *(float *)(bspline_basis0 + lVar20 + 0x18);
      uStack_484 = *(undefined4 *)(bspline_basis0 + lVar20 + 0x1c);
      fVar280 = auVar232._0_4_;
      fVar282 = auVar232._4_4_;
      fVar284 = auVar232._8_4_;
      fVar259 = auVar232._12_4_;
      auVar291._0_4_ = fVar280 * fVar303 + fVar227 * fVar257 + fVar160 * fVar221 + fVar172 * fVar338
      ;
      auVar291._4_4_ = fVar282 * fVar305 + fVar240 * fVar258 + fVar163 * fVar226 + fVar245 * fVar219
      ;
      auVar291._8_4_ = fVar284 * fVar224 + fVar242 * fVar281 + fVar166 * fVar239 + fVar153 * fVar342
      ;
      auVar291._12_4_ =
           fVar259 * fVar336 + fVar244 * fVar283 + fVar170 * fVar241 + fVar157 * fVar222;
      auVar291._16_4_ =
           fVar280 * fStack_490 + fVar227 * fVar294 + fVar160 * fVar243 + fVar172 * fVar205;
      auVar291._20_4_ =
           fVar282 * fStack_48c + fVar240 * fVar223 + fVar163 * fVar246 + fVar245 * fVar218;
      auVar291._24_4_ =
           fVar284 * fStack_488 + fVar242 * fVar335 + fVar166 * fVar256 + fVar153 * fVar220;
      auVar291._28_4_ = fVar259 + fVar170 + fVar157 + 0.0;
      auVar232 = vshufps_avx(auVar109,auVar109,0x55);
      register0x00001290 = auVar232;
      _local_220 = auVar232;
      fVar174 = auVar232._0_4_;
      fVar265 = auVar232._4_4_;
      fVar276 = auVar232._8_4_;
      fVar279 = auVar232._12_4_;
      auVar346._0_4_ = fVar174 * fVar303 + fVar367 * fVar257 + fVar173 * fVar221 + fVar337 * fVar338
      ;
      auVar346._4_4_ = fVar265 * fVar305 + fVar370 * fVar258 + fVar190 * fVar226 + fVar341 * fVar219
      ;
      auVar346._8_4_ = fVar276 * fVar224 + fVar371 * fVar281 + fVar274 * fVar239 + fVar343 * fVar342
      ;
      auVar346._12_4_ =
           fVar279 * fVar336 + fVar372 * fVar283 + fVar278 * fVar241 + fVar344 * fVar222;
      auVar346._16_4_ =
           fVar174 * fStack_490 + fVar367 * fVar294 + fVar173 * fVar243 + fVar337 * fVar205;
      auVar346._20_4_ =
           fVar265 * fStack_48c + fVar370 * fVar223 + fVar190 * fVar246 + fVar341 * fVar218;
      auVar346._24_4_ =
           fVar276 * fStack_488 + fVar371 * fVar335 + fVar274 * fVar256 + fVar343 * fVar220;
      auVar346._28_4_ = fVar278 + 0.0 + 0.0 + 0.0;
      auVar232 = vpermilps_avx(_local_740,0xff);
      register0x00001490 = auVar232;
      _local_c0 = auVar232;
      fVar322 = auVar232._0_4_;
      fVar330 = auVar232._4_4_;
      fVar332 = auVar232._8_4_;
      auVar141._0_4_ = fVar132 * fVar257 + fVar312 * fVar221 + fVar264 * fVar338 + fVar322 * fVar303
      ;
      auVar141._4_4_ = fVar151 * fVar258 + fVar319 * fVar226 + fVar273 * fVar219 + fVar330 * fVar305
      ;
      auVar141._8_4_ = fVar154 * fVar281 + fVar320 * fVar239 + fVar275 * fVar342 + fVar332 * fVar224
      ;
      auVar141._12_4_ =
           fVar158 * fVar283 + auVar197._12_4_ * fVar241 + fVar277 * fVar222 +
           auVar232._12_4_ * fVar336;
      auVar141._16_4_ =
           fVar132 * fVar294 + fVar312 * fVar243 + fVar264 * fVar205 + fVar322 * fStack_490;
      auVar141._20_4_ =
           fVar151 * fVar223 + fVar319 * fVar246 + fVar273 * fVar218 + fVar330 * fStack_48c;
      auVar141._24_4_ =
           fVar154 * fVar335 + fVar320 * fVar256 + fVar275 * fVar220 + fVar332 * fStack_488;
      auVar141._28_4_ = 0;
      fVar303 = *(float *)(bspline_basis1 + lVar20 + 0x908);
      fVar305 = *(float *)(bspline_basis1 + lVar20 + 0x90c);
      fVar224 = *(float *)(bspline_basis1 + lVar20 + 0x910);
      fVar307 = *(float *)(bspline_basis1 + lVar20 + 0x914);
      fVar309 = *(float *)(bspline_basis1 + lVar20 + 0x918);
      fVar225 = *(float *)(bspline_basis1 + lVar20 + 0x91c);
      fVar260 = *(float *)(bspline_basis1 + lVar20 + 0x920);
      auVar253 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0xd8c);
      auVar301 = ZEXT3264(auVar253);
      fVar293 = auVar253._0_4_;
      fVar302 = auVar253._4_4_;
      fVar304 = auVar253._8_4_;
      fVar306 = auVar253._12_4_;
      fVar308 = auVar253._16_4_;
      fVar310 = auVar253._20_4_;
      fVar311 = auVar253._24_4_;
      fVar261 = *(float *)(bspline_basis1 + lVar20 + 0x484);
      fVar262 = *(float *)(bspline_basis1 + lVar20 + 0x488);
      fVar155 = *(float *)(bspline_basis1 + lVar20 + 0x48c);
      fVar364 = *(float *)(bspline_basis1 + lVar20 + 0x490);
      fVar365 = *(float *)(bspline_basis1 + lVar20 + 0x494);
      fVar366 = *(float *)(bspline_basis1 + lVar20 + 0x498);
      fVar168 = *(float *)(bspline_basis1 + lVar20 + 0x49c);
      fVar133 = *(float *)(bspline_basis1 + lVar20);
      fVar152 = *(float *)(bspline_basis1 + lVar20 + 4);
      fVar156 = *(float *)(bspline_basis1 + lVar20 + 8);
      fVar159 = *(float *)(bspline_basis1 + lVar20 + 0xc);
      fVar162 = *(float *)(bspline_basis1 + lVar20 + 0x10);
      fVar165 = *(float *)(bspline_basis1 + lVar20 + 0x14);
      fVar169 = *(float *)(bspline_basis1 + lVar20 + 0x18);
      auVar234._0_4_ = fVar280 * fVar133 + fVar227 * fVar261 + fVar303 * fVar160 + fVar293 * fVar172
      ;
      auVar234._4_4_ = fVar282 * fVar152 + fVar240 * fVar262 + fVar305 * fVar163 + fVar302 * fVar245
      ;
      auVar234._8_4_ = fVar284 * fVar156 + fVar242 * fVar155 + fVar224 * fVar166 + fVar304 * fVar153
      ;
      auVar234._12_4_ =
           fVar259 * fVar159 + fVar244 * fVar364 + fVar307 * fVar170 + fVar306 * fVar157;
      auVar234._16_4_ =
           fVar280 * fVar162 + fVar227 * fVar365 + fVar309 * fVar160 + fVar308 * fVar172;
      auVar234._20_4_ =
           fVar282 * fVar165 + fVar240 * fVar366 + fVar225 * fVar163 + fVar310 * fVar245;
      auVar234._24_4_ =
           fVar284 * fVar169 + fVar242 * fVar168 + fVar260 * fVar166 + fVar311 * fVar153;
      auVar234._28_4_ = fVar158 + fVar259 + 0.0 + 0.0;
      auVar211._0_4_ = fVar174 * fVar133 + fVar367 * fVar261 + fVar303 * fVar173 + fVar337 * fVar293
      ;
      auVar211._4_4_ = fVar265 * fVar152 + fVar370 * fVar262 + fVar305 * fVar190 + fVar341 * fVar302
      ;
      auVar211._8_4_ = fVar276 * fVar156 + fVar371 * fVar155 + fVar224 * fVar274 + fVar343 * fVar304
      ;
      auVar211._12_4_ =
           fVar279 * fVar159 + fVar372 * fVar364 + fVar307 * fVar278 + fVar344 * fVar306;
      auVar211._16_4_ =
           fVar174 * fVar162 + fVar367 * fVar365 + fVar309 * fVar173 + fVar337 * fVar308;
      auVar211._20_4_ =
           fVar265 * fVar165 + fVar370 * fVar366 + fVar225 * fVar190 + fVar341 * fVar310;
      auVar211._24_4_ =
           fVar276 * fVar169 + fVar371 * fVar168 + fVar260 * fVar274 + fVar343 * fVar311;
      auVar211._28_4_ = fVar279 + fVar259 + 0.0 + 0.0;
      auVar314._0_4_ = fVar132 * fVar261 + fVar312 * fVar303 + fVar293 * fVar264 + fVar322 * fVar133
      ;
      auVar314._4_4_ = fVar151 * fVar262 + fVar319 * fVar305 + fVar302 * fVar273 + fVar330 * fVar152
      ;
      auVar314._8_4_ = fVar154 * fVar155 + fVar320 * fVar224 + fVar304 * fVar275 + fVar332 * fVar156
      ;
      auVar314._12_4_ =
           fVar158 * fVar364 + auVar197._12_4_ * fVar307 + fVar306 * fVar277 +
           auVar232._12_4_ * fVar159;
      auVar314._16_4_ =
           fVar132 * fVar365 + fVar312 * fVar309 + fVar308 * fVar264 + fVar322 * fVar162;
      auVar314._20_4_ =
           fVar151 * fVar366 + fVar319 * fVar225 + fVar310 * fVar273 + fVar330 * fVar165;
      auVar314._24_4_ =
           fVar154 * fVar168 + fVar320 * fVar260 + fVar311 * fVar275 + fVar332 * fVar169;
      auVar314._28_4_ = fVar277 + fVar259 + 0.0 + fVar279;
      local_500 = vsubps_avx(auVar234,auVar291);
      auVar27 = vsubps_avx(auVar211,auVar346);
      fVar338 = local_500._0_4_;
      fVar219 = local_500._4_4_;
      auVar21._4_4_ = auVar346._4_4_ * fVar219;
      auVar21._0_4_ = auVar346._0_4_ * fVar338;
      fVar342 = local_500._8_4_;
      auVar21._8_4_ = auVar346._8_4_ * fVar342;
      fVar222 = local_500._12_4_;
      auVar21._12_4_ = auVar346._12_4_ * fVar222;
      fVar205 = local_500._16_4_;
      auVar21._16_4_ = auVar346._16_4_ * fVar205;
      fVar218 = local_500._20_4_;
      auVar21._20_4_ = auVar346._20_4_ * fVar218;
      fVar220 = local_500._24_4_;
      auVar21._24_4_ = auVar346._24_4_ * fVar220;
      auVar21._28_4_ = fVar279;
      fVar264 = auVar27._0_4_;
      fVar273 = auVar27._4_4_;
      auVar28._4_4_ = fVar273 * auVar291._4_4_;
      auVar28._0_4_ = fVar264 * auVar291._0_4_;
      fVar275 = auVar27._8_4_;
      auVar28._8_4_ = fVar275 * auVar291._8_4_;
      fVar277 = auVar27._12_4_;
      auVar28._12_4_ = fVar277 * auVar291._12_4_;
      fVar312 = auVar27._16_4_;
      auVar28._16_4_ = fVar312 * auVar291._16_4_;
      fVar319 = auVar27._20_4_;
      auVar28._20_4_ = fVar319 * auVar291._20_4_;
      fVar320 = auVar27._24_4_;
      auVar28._24_4_ = fVar320 * auVar291._24_4_;
      auVar28._28_4_ = auVar211._28_4_;
      auVar28 = vsubps_avx(auVar21,auVar28);
      auVar21 = vmaxps_avx(auVar141,auVar314);
      auVar33._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar219 * fVar219 + fVar273 * fVar273);
      auVar33._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar338 * fVar338 + fVar264 * fVar264);
      auVar33._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar342 * fVar342 + fVar275 * fVar275);
      auVar33._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar222 * fVar222 + fVar277 * fVar277);
      auVar33._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar205 * fVar205 + fVar312 * fVar312);
      auVar33._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar218 * fVar218 + fVar319 * fVar319);
      auVar33._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar220 * fVar220 + fVar320 * fVar320);
      auVar33._28_4_ = auVar234._28_4_ + auVar211._28_4_;
      auVar326._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar326._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar326._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar326._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar326._16_4_ = auVar28._16_4_ * auVar28._16_4_;
      auVar326._20_4_ = auVar28._20_4_ * auVar28._20_4_;
      auVar326._24_4_ = auVar28._24_4_ * auVar28._24_4_;
      auVar326._28_4_ = auVar28._28_4_;
      auVar21 = vcmpps_avx(auVar326,auVar33,2);
      auVar197 = ZEXT416((uint)(float)(int)uVar15);
      local_580._0_16_ = auVar197;
      auVar197 = vshufps_avx(auVar197,auVar197,0);
      auVar212._16_16_ = auVar197;
      auVar212._0_16_ = auVar197;
      auVar28 = vcmpps_avx(_DAT_01faff40,auVar212,1);
      auVar217 = ZEXT3264(auVar28);
      auVar110._8_4_ = auVar208._8_4_;
      auVar110._0_8_ = auVar208._0_8_;
      auVar110._12_4_ = auVar208._12_4_;
      auVar197 = vpermilps_avx(auVar110,0xaa);
      register0x00001490 = auVar197;
      _local_260 = auVar197;
      auVar232 = vpermilps_avx(auVar290,0xaa);
      register0x00001550 = auVar232;
      _local_480 = auVar232;
      auVar210 = vpermilps_avx(auVar298,0xaa);
      register0x00001590 = auVar210;
      _local_440 = auVar210;
      auVar195 = vpermilps_avx(auVar178,0xaa);
      register0x00001310 = auVar195;
      _local_460 = auVar195;
      auVar33 = auVar28 & auVar21;
      uVar126 = *(uint *)(ray + k * 4 + 0x60);
      auVar248 = ZEXT416((uint)(auVar248._0_4_ * 4.7683716e-07));
      auVar326 = local_620;
      auVar212 = local_640;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
LAB_00f4eb22:
        bVar128 = false;
      }
      else {
        local_4c0 = vandps_avx(auVar21,auVar28);
        fVar323 = auVar197._0_4_;
        fVar331 = auVar197._4_4_;
        fVar333 = auVar197._8_4_;
        fVar334 = auVar197._12_4_;
        fVar351 = auVar232._0_4_;
        fVar355 = auVar232._4_4_;
        fVar356 = auVar232._8_4_;
        fVar357 = auVar232._12_4_;
        fVar358 = auVar210._0_4_;
        fVar361 = auVar210._4_4_;
        fVar362 = auVar210._8_4_;
        fVar363 = auVar210._12_4_;
        fVar338 = auVar195._0_4_;
        fVar219 = auVar195._4_4_;
        fVar342 = auVar195._8_4_;
        fVar222 = auVar195._12_4_;
        fVar205 = auVar28._28_4_ +
                  *(float *)(bspline_basis1 + lVar20 + 0x924) +
                  *(float *)(bspline_basis1 + lVar20 + 0x4a0);
        local_4e0._0_4_ =
             fVar323 * fVar133 + fVar351 * fVar261 + fVar358 * fVar303 + fVar293 * fVar338;
        local_4e0._4_4_ =
             fVar331 * fVar152 + fVar355 * fVar262 + fVar361 * fVar305 + fVar302 * fVar219;
        fStack_4d8 = fVar333 * fVar156 + fVar356 * fVar155 + fVar362 * fVar224 + fVar304 * fVar342;
        fStack_4d4 = fVar334 * fVar159 + fVar357 * fVar364 + fVar363 * fVar307 + fVar306 * fVar222;
        fStack_4d0 = fVar323 * fVar162 + fVar351 * fVar365 + fVar358 * fVar309 + fVar308 * fVar338;
        fStack_4cc = fVar331 * fVar165 + fVar355 * fVar366 + fVar361 * fVar225 + fVar310 * fVar219;
        fStack_4c8 = fVar333 * fVar169 + fVar356 * fVar168 + fVar362 * fVar260 + fVar311 * fVar342;
        fStack_4c4 = local_4c0._28_4_ + fVar205;
        local_4a0._0_4_ = auVar118._0_4_;
        local_4a0._4_4_ = auVar118._4_4_;
        fStack_498 = auVar118._8_4_;
        local_7a0._0_4_ = auVar117._0_4_;
        local_7a0._4_4_ = auVar117._4_4_;
        uStack_798._0_4_ = auVar117._8_4_;
        uStack_798._4_4_ = auVar117._12_4_;
        fStack_790 = auVar117._16_4_;
        fStack_78c = auVar117._20_4_;
        fStack_788 = auVar117._24_4_;
        fVar132 = fVar323 * (float)local_4a0._0_4_ +
                  fVar351 * fVar257 + fVar358 * fVar221 + fVar338 * (float)local_7a0._0_4_;
        fVar151 = fVar331 * (float)local_4a0._4_4_ +
                  fVar355 * fVar258 + fVar361 * fVar226 + fVar219 * (float)local_7a0._4_4_;
        fVar154 = fVar333 * fStack_498 +
                  fVar356 * fVar281 + fVar362 * fVar239 + fVar342 * (float)uStack_798;
        fVar158 = fVar334 * fVar336 +
                  fVar357 * fVar283 + fVar363 * fVar241 + fVar222 * uStack_798._4_4_;
        fVar161 = fVar323 * fStack_490 +
                  fVar351 * fVar294 + fVar358 * fVar243 + fVar338 * fStack_790;
        fVar164 = fVar331 * fStack_48c +
                  fVar355 * fVar223 + fVar361 * fVar246 + fVar219 * fStack_78c;
        fVar167 = fVar333 * fStack_488 +
                  fVar356 * fVar335 + fVar362 * fVar256 + fVar342 * fStack_788;
        fVar171 = fStack_4c4 + fVar205 + local_4c0._28_4_ + auVar28._28_4_;
        fVar205 = *(float *)(bspline_basis0 + lVar20 + 0x1210);
        fVar218 = *(float *)(bspline_basis0 + lVar20 + 0x1214);
        fVar220 = *(float *)(bspline_basis0 + lVar20 + 0x1218);
        fVar221 = *(float *)(bspline_basis0 + lVar20 + 0x121c);
        fVar226 = *(float *)(bspline_basis0 + lVar20 + 0x1220);
        fVar239 = *(float *)(bspline_basis0 + lVar20 + 0x1224);
        fVar241 = *(float *)(bspline_basis0 + lVar20 + 0x1228);
        fVar243 = *(float *)(bspline_basis0 + lVar20 + 0x1694);
        fVar246 = *(float *)(bspline_basis0 + lVar20 + 0x1698);
        fVar256 = *(float *)(bspline_basis0 + lVar20 + 0x169c);
        fVar257 = *(float *)(bspline_basis0 + lVar20 + 0x16a0);
        fVar258 = *(float *)(bspline_basis0 + lVar20 + 0x16a4);
        fVar281 = *(float *)(bspline_basis0 + lVar20 + 0x16a8);
        fVar283 = *(float *)(bspline_basis0 + lVar20 + 0x16ac);
        fVar294 = *(float *)(bspline_basis0 + lVar20 + 0x1b18);
        fVar223 = *(float *)(bspline_basis0 + lVar20 + 0x1b1c);
        fVar335 = *(float *)(bspline_basis0 + lVar20 + 0x1b20);
        fVar303 = *(float *)(bspline_basis0 + lVar20 + 0x1b24);
        fVar305 = *(float *)(bspline_basis0 + lVar20 + 0x1b28);
        fVar224 = *(float *)(bspline_basis0 + lVar20 + 0x1b2c);
        fVar336 = *(float *)(bspline_basis0 + lVar20 + 0x1b30);
        fVar307 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar309 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar225 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar260 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        fVar261 = *(float *)(bspline_basis0 + lVar20 + 0x1fac);
        fVar262 = *(float *)(bspline_basis0 + lVar20 + 0x1fb0);
        fVar155 = *(float *)(bspline_basis0 + lVar20 + 0x1fb4);
        fVar263 = *(float *)(bspline_basis1 + lVar20 + 0x4a0) + 0.0;
        fVar364 = *(float *)(bspline_basis0 + lVar20 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar20 + 0x1fb8);
        fVar321 = *(float *)(bspline_basis0 + lVar20 + 0x16b0) + fVar364;
        auVar182._0_4_ =
             fVar174 * fVar205 + fVar173 * fVar294 + fVar307 * fVar337 + fVar367 * fVar243;
        auVar182._4_4_ =
             fVar265 * fVar218 + fVar190 * fVar223 + fVar309 * fVar341 + fVar370 * fVar246;
        auVar182._8_4_ =
             fVar276 * fVar220 + fVar274 * fVar335 + fVar225 * fVar343 + fVar371 * fVar256;
        auVar182._12_4_ =
             fVar279 * fVar221 + fVar278 * fVar303 + fVar260 * fVar344 + fVar372 * fVar257;
        auVar182._16_4_ =
             fVar174 * fVar226 + fVar173 * fVar305 + fVar261 * fVar337 + fVar367 * fVar258;
        auVar182._20_4_ =
             fVar265 * fVar239 + fVar190 * fVar224 + fVar262 * fVar341 + fVar370 * fVar281;
        auVar182._24_4_ =
             fVar276 * fVar241 + fVar274 * fVar336 + fVar155 * fVar343 + fVar371 * fVar283;
        auVar182._28_4_ = fVar364 + auVar253._28_4_ + 0.0 + fVar263;
        auVar249._0_4_ =
             fVar351 * fVar243 + fVar358 * fVar294 + fVar338 * fVar307 + fVar323 * fVar205;
        auVar249._4_4_ =
             fVar355 * fVar246 + fVar361 * fVar223 + fVar219 * fVar309 + fVar331 * fVar218;
        auVar249._8_4_ =
             fVar356 * fVar256 + fVar362 * fVar335 + fVar342 * fVar225 + fVar333 * fVar220;
        auVar249._12_4_ =
             fVar357 * fVar257 + fVar363 * fVar303 + fVar222 * fVar260 + fVar334 * fVar221;
        auVar249._16_4_ =
             fVar351 * fVar258 + fVar358 * fVar305 + fVar338 * fVar261 + fVar323 * fVar226;
        auVar249._20_4_ =
             fVar355 * fVar281 + fVar361 * fVar224 + fVar219 * fVar262 + fVar331 * fVar239;
        auVar249._24_4_ =
             fVar356 * fVar283 + fVar362 * fVar336 + fVar342 * fVar155 + fVar333 * fVar241;
        auVar249._28_4_ = fVar321 + *(float *)(bspline_basis0 + lVar20 + 0x122c);
        fVar364 = *(float *)(bspline_basis1 + lVar20 + 0x1b18);
        fVar365 = *(float *)(bspline_basis1 + lVar20 + 0x1b1c);
        fVar366 = *(float *)(bspline_basis1 + lVar20 + 0x1b20);
        fVar168 = *(float *)(bspline_basis1 + lVar20 + 0x1b24);
        fVar133 = *(float *)(bspline_basis1 + lVar20 + 0x1b28);
        fVar152 = *(float *)(bspline_basis1 + lVar20 + 0x1b2c);
        fVar156 = *(float *)(bspline_basis1 + lVar20 + 0x1b30);
        fVar159 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar162 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar165 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar169 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        fVar264 = *(float *)(bspline_basis1 + lVar20 + 0x1fac);
        fVar273 = *(float *)(bspline_basis1 + lVar20 + 0x1fb0);
        fVar275 = *(float *)(bspline_basis1 + lVar20 + 0x1fb4);
        fVar277 = *(float *)(bspline_basis1 + lVar20 + 0x1694);
        fVar293 = *(float *)(bspline_basis1 + lVar20 + 0x1698);
        fVar302 = *(float *)(bspline_basis1 + lVar20 + 0x169c);
        fVar304 = *(float *)(bspline_basis1 + lVar20 + 0x16a0);
        fVar306 = *(float *)(bspline_basis1 + lVar20 + 0x16a4);
        fVar308 = *(float *)(bspline_basis1 + lVar20 + 0x16a8);
        fVar310 = *(float *)(bspline_basis1 + lVar20 + 0x16ac);
        fVar311 = *(float *)(bspline_basis1 + lVar20 + 0x1210);
        fVar312 = *(float *)(bspline_basis1 + lVar20 + 0x1214);
        fVar319 = *(float *)(bspline_basis1 + lVar20 + 0x1218);
        fVar320 = *(float *)(bspline_basis1 + lVar20 + 0x121c);
        fVar322 = *(float *)(bspline_basis1 + lVar20 + 0x1220);
        fVar330 = *(float *)(bspline_basis1 + lVar20 + 0x1224);
        fVar332 = *(float *)(bspline_basis1 + lVar20 + 0x1228);
        auVar268._0_4_ =
             fVar280 * fVar311 + fVar227 * fVar277 + fVar160 * fVar364 + fVar172 * fVar159;
        auVar268._4_4_ =
             fVar282 * fVar312 + fVar240 * fVar293 + fVar163 * fVar365 + fVar245 * fVar162;
        auVar268._8_4_ =
             fVar284 * fVar319 + fVar242 * fVar302 + fVar166 * fVar366 + fVar153 * fVar165;
        auVar268._12_4_ =
             fVar259 * fVar320 + fVar244 * fVar304 + fVar170 * fVar168 + fVar157 * fVar169;
        auVar268._16_4_ =
             fVar280 * fVar322 + fVar227 * fVar306 + fVar160 * fVar133 + fVar172 * fVar264;
        auVar268._20_4_ =
             fVar282 * fVar330 + fVar240 * fVar308 + fVar163 * fVar152 + fVar245 * fVar273;
        auVar268._24_4_ =
             fVar284 * fVar332 + fVar242 * fVar310 + fVar166 * fVar156 + fVar153 * fVar275;
        auVar268._28_4_ = fVar334 + fVar334 + fVar321 + fVar157;
        auVar315._0_4_ =
             fVar174 * fVar311 + fVar367 * fVar277 + fVar173 * fVar364 + fVar159 * fVar337;
        auVar315._4_4_ =
             fVar265 * fVar312 + fVar370 * fVar293 + fVar190 * fVar365 + fVar162 * fVar341;
        auVar315._8_4_ =
             fVar276 * fVar319 + fVar371 * fVar302 + fVar274 * fVar366 + fVar165 * fVar343;
        auVar315._12_4_ =
             fVar279 * fVar320 + fVar372 * fVar304 + fVar278 * fVar168 + fVar169 * fVar344;
        auVar315._16_4_ =
             fVar174 * fVar322 + fVar367 * fVar306 + fVar173 * fVar133 + fVar264 * fVar337;
        auVar315._20_4_ =
             fVar265 * fVar330 + fVar370 * fVar308 + fVar190 * fVar152 + fVar273 * fVar341;
        auVar315._24_4_ =
             fVar276 * fVar332 + fVar371 * fVar310 + fVar274 * fVar156 + fVar275 * fVar343;
        auVar315._28_4_ = fVar334 + fVar334 + fVar334 + fVar321;
        auVar199._0_4_ =
             fVar323 * fVar311 + fVar351 * fVar277 + fVar358 * fVar364 + fVar338 * fVar159;
        auVar199._4_4_ =
             fVar331 * fVar312 + fVar355 * fVar293 + fVar361 * fVar365 + fVar219 * fVar162;
        auVar199._8_4_ =
             fVar333 * fVar319 + fVar356 * fVar302 + fVar362 * fVar366 + fVar342 * fVar165;
        auVar199._12_4_ =
             fVar334 * fVar320 + fVar357 * fVar304 + fVar363 * fVar168 + fVar222 * fVar169;
        auVar199._16_4_ =
             fVar323 * fVar322 + fVar351 * fVar306 + fVar358 * fVar133 + fVar338 * fVar264;
        auVar199._20_4_ =
             fVar331 * fVar330 + fVar355 * fVar308 + fVar361 * fVar152 + fVar219 * fVar273;
        auVar199._24_4_ =
             fVar333 * fVar332 + fVar356 * fVar310 + fVar362 * fVar156 + fVar342 * fVar275;
        auVar199._28_4_ =
             *(float *)(bspline_basis1 + lVar20 + 0x122c) +
             *(float *)(bspline_basis1 + lVar20 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar20 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar20 + 0x1fb8);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar114._4_4_ =
             fVar282 * fVar218 + fVar240 * fVar246 + fVar163 * fVar223 + fVar245 * fVar309;
        auVar114._0_4_ =
             fVar280 * fVar205 + fVar227 * fVar243 + fVar160 * fVar294 + fVar172 * fVar307;
        auVar114._8_4_ =
             fVar284 * fVar220 + fVar242 * fVar256 + fVar166 * fVar335 + fVar153 * fVar225;
        auVar114._12_4_ =
             fVar259 * fVar221 + fVar244 * fVar257 + fVar170 * fVar303 + fVar157 * fVar260;
        auVar114._16_4_ =
             fVar280 * fVar226 + fVar227 * fVar258 + fVar160 * fVar305 + fVar172 * fVar261;
        auVar114._20_4_ =
             fVar282 * fVar239 + fVar240 * fVar281 + fVar163 * fVar224 + fVar245 * fVar262;
        auVar114._24_4_ =
             fVar284 * fVar241 + fVar242 * fVar283 + fVar166 * fVar336 + fVar153 * fVar155;
        auVar114._28_4_ =
             *(float *)(bspline_basis0 + lVar20 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar20 + 0x1fb8) + fVar263;
        auVar253 = vandps_avx(auVar114,auVar235);
        auVar21 = vandps_avx(auVar182,auVar235);
        auVar21 = vmaxps_avx(auVar253,auVar21);
        auVar253 = vandps_avx(auVar249,auVar235);
        auVar253 = vmaxps_avx(auVar21,auVar253);
        auVar197 = vpermilps_avx(auVar248,0);
        auVar250._16_16_ = auVar197;
        auVar250._0_16_ = auVar197;
        auVar253 = vcmpps_avx(auVar253,auVar250,1);
        auVar28 = vblendvps_avx(auVar114,local_500,auVar253);
        auVar33 = vblendvps_avx(auVar182,auVar27,auVar253);
        auVar253 = vandps_avx(auVar268,auVar235);
        auVar21 = vandps_avx(auVar315,auVar235);
        auVar326 = vmaxps_avx(auVar253,auVar21);
        auVar253 = vandps_avx(auVar199,auVar235);
        auVar253 = vmaxps_avx(auVar326,auVar253);
        auVar326 = vcmpps_avx(auVar253,auVar250,1);
        auVar253 = vblendvps_avx(auVar268,local_500,auVar326);
        auVar27 = vblendvps_avx(auVar315,auVar27,auVar326);
        fVar261 = auVar28._0_4_;
        fVar262 = auVar28._4_4_;
        fVar155 = auVar28._8_4_;
        fVar364 = auVar28._12_4_;
        fVar365 = auVar28._16_4_;
        fVar366 = auVar28._20_4_;
        fVar168 = auVar28._24_4_;
        fVar172 = -auVar28._28_4_;
        fVar133 = auVar253._0_4_;
        fVar152 = auVar253._4_4_;
        fVar156 = auVar253._8_4_;
        fVar159 = auVar253._12_4_;
        fVar162 = auVar253._16_4_;
        fVar165 = auVar253._20_4_;
        fVar169 = auVar253._24_4_;
        fVar338 = auVar33._0_4_;
        fVar205 = auVar33._4_4_;
        fVar226 = auVar33._8_4_;
        fVar246 = auVar33._12_4_;
        fVar281 = auVar33._16_4_;
        fVar335 = auVar33._20_4_;
        fVar336 = auVar33._24_4_;
        auVar142._0_4_ = fVar338 * fVar338 + fVar261 * fVar261;
        auVar142._4_4_ = fVar205 * fVar205 + fVar262 * fVar262;
        auVar142._8_4_ = fVar226 * fVar226 + fVar155 * fVar155;
        auVar142._12_4_ = fVar246 * fVar246 + fVar364 * fVar364;
        auVar142._16_4_ = fVar281 * fVar281 + fVar365 * fVar365;
        auVar142._20_4_ = fVar335 * fVar335 + fVar366 * fVar366;
        auVar142._24_4_ = fVar336 * fVar336 + fVar168 * fVar168;
        auVar142._28_4_ = auVar315._28_4_ + auVar28._28_4_;
        auVar28 = vrsqrtps_avx(auVar142);
        fVar219 = auVar28._0_4_;
        fVar342 = auVar28._4_4_;
        auVar29._4_4_ = fVar342 * 1.5;
        auVar29._0_4_ = fVar219 * 1.5;
        fVar222 = auVar28._8_4_;
        auVar29._8_4_ = fVar222 * 1.5;
        fVar218 = auVar28._12_4_;
        auVar29._12_4_ = fVar218 * 1.5;
        fVar220 = auVar28._16_4_;
        auVar29._16_4_ = fVar220 * 1.5;
        fVar221 = auVar28._20_4_;
        auVar29._20_4_ = fVar221 * 1.5;
        fVar239 = auVar28._24_4_;
        fVar260 = auVar21._28_4_;
        auVar29._24_4_ = fVar239 * 1.5;
        auVar29._28_4_ = fVar260;
        auVar30._4_4_ = fVar342 * fVar342 * fVar342 * auVar142._4_4_ * 0.5;
        auVar30._0_4_ = fVar219 * fVar219 * fVar219 * auVar142._0_4_ * 0.5;
        auVar30._8_4_ = fVar222 * fVar222 * fVar222 * auVar142._8_4_ * 0.5;
        auVar30._12_4_ = fVar218 * fVar218 * fVar218 * auVar142._12_4_ * 0.5;
        auVar30._16_4_ = fVar220 * fVar220 * fVar220 * auVar142._16_4_ * 0.5;
        auVar30._20_4_ = fVar221 * fVar221 * fVar221 * auVar142._20_4_ * 0.5;
        auVar30._24_4_ = fVar239 * fVar239 * fVar239 * auVar142._24_4_ * 0.5;
        auVar30._28_4_ = auVar142._28_4_;
        auVar21 = vsubps_avx(auVar29,auVar30);
        fVar219 = auVar21._0_4_;
        fVar218 = auVar21._4_4_;
        fVar239 = auVar21._8_4_;
        fVar256 = auVar21._12_4_;
        fVar283 = auVar21._16_4_;
        fVar303 = auVar21._20_4_;
        fVar307 = auVar21._24_4_;
        fVar342 = auVar27._0_4_;
        fVar220 = auVar27._4_4_;
        fVar241 = auVar27._8_4_;
        fVar257 = auVar27._12_4_;
        fVar294 = auVar27._16_4_;
        fVar305 = auVar27._20_4_;
        fVar309 = auVar27._24_4_;
        auVar143._0_4_ = fVar342 * fVar342 + fVar133 * fVar133;
        auVar143._4_4_ = fVar220 * fVar220 + fVar152 * fVar152;
        auVar143._8_4_ = fVar241 * fVar241 + fVar156 * fVar156;
        auVar143._12_4_ = fVar257 * fVar257 + fVar159 * fVar159;
        auVar143._16_4_ = fVar294 * fVar294 + fVar162 * fVar162;
        auVar143._20_4_ = fVar305 * fVar305 + fVar165 * fVar165;
        auVar143._24_4_ = fVar309 * fVar309 + fVar169 * fVar169;
        auVar143._28_4_ = auVar253._28_4_ + auVar21._28_4_;
        auVar253 = vrsqrtps_avx(auVar143);
        fVar222 = auVar253._0_4_;
        fVar221 = auVar253._4_4_;
        auVar31._4_4_ = fVar221 * 1.5;
        auVar31._0_4_ = fVar222 * 1.5;
        fVar243 = auVar253._8_4_;
        auVar31._8_4_ = fVar243 * 1.5;
        fVar258 = auVar253._12_4_;
        auVar31._12_4_ = fVar258 * 1.5;
        fVar223 = auVar253._16_4_;
        auVar31._16_4_ = fVar223 * 1.5;
        fVar224 = auVar253._20_4_;
        auVar31._20_4_ = fVar224 * 1.5;
        fVar225 = auVar253._24_4_;
        auVar31._24_4_ = fVar225 * 1.5;
        auVar31._28_4_ = fVar260;
        auVar253._4_4_ = fVar221 * fVar221 * fVar221 * auVar143._4_4_ * 0.5;
        auVar253._0_4_ = fVar222 * fVar222 * fVar222 * auVar143._0_4_ * 0.5;
        auVar253._8_4_ = fVar243 * fVar243 * fVar243 * auVar143._8_4_ * 0.5;
        auVar253._12_4_ = fVar258 * fVar258 * fVar258 * auVar143._12_4_ * 0.5;
        auVar253._16_4_ = fVar223 * fVar223 * fVar223 * auVar143._16_4_ * 0.5;
        auVar253._20_4_ = fVar224 * fVar224 * fVar224 * auVar143._20_4_ * 0.5;
        auVar253._24_4_ = fVar225 * fVar225 * fVar225 * auVar143._24_4_ * 0.5;
        auVar253._28_4_ = auVar143._28_4_;
        auVar253 = vsubps_avx(auVar31,auVar253);
        fVar222 = auVar253._0_4_;
        fVar221 = auVar253._4_4_;
        fVar243 = auVar253._8_4_;
        fVar258 = auVar253._12_4_;
        fVar223 = auVar253._16_4_;
        fVar224 = auVar253._20_4_;
        fVar225 = auVar253._24_4_;
        fVar338 = auVar141._0_4_ * fVar338 * fVar219;
        fVar205 = auVar141._4_4_ * fVar205 * fVar218;
        auVar32._4_4_ = fVar205;
        auVar32._0_4_ = fVar338;
        fVar226 = auVar141._8_4_ * fVar226 * fVar239;
        auVar32._8_4_ = fVar226;
        fVar246 = auVar141._12_4_ * fVar246 * fVar256;
        auVar32._12_4_ = fVar246;
        fVar281 = auVar141._16_4_ * fVar281 * fVar283;
        auVar32._16_4_ = fVar281;
        fVar335 = auVar141._20_4_ * fVar335 * fVar303;
        auVar32._20_4_ = fVar335;
        fVar336 = auVar141._24_4_ * fVar336 * fVar307;
        auVar32._24_4_ = fVar336;
        auVar32._28_4_ = fVar260;
        local_7a0._4_4_ = fVar205 + auVar291._4_4_;
        local_7a0._0_4_ = fVar338 + auVar291._0_4_;
        uStack_798._0_4_ = fVar226 + auVar291._8_4_;
        uStack_798._4_4_ = fVar246 + auVar291._12_4_;
        fStack_790 = fVar281 + auVar291._16_4_;
        fStack_78c = fVar335 + auVar291._20_4_;
        fStack_788 = fVar336 + auVar291._24_4_;
        fStack_784 = fVar260 + auVar291._28_4_;
        fVar246 = auVar141._0_4_ * fVar219 * -fVar261;
        fVar281 = auVar141._4_4_ * fVar218 * -fVar262;
        auVar34._4_4_ = fVar281;
        auVar34._0_4_ = fVar246;
        fVar335 = auVar141._8_4_ * fVar239 * -fVar155;
        auVar34._8_4_ = fVar335;
        fVar336 = auVar141._12_4_ * fVar256 * -fVar364;
        auVar34._12_4_ = fVar336;
        fVar260 = auVar141._16_4_ * fVar283 * -fVar365;
        auVar34._16_4_ = fVar260;
        fVar261 = auVar141._20_4_ * fVar303 * -fVar366;
        auVar34._20_4_ = fVar261;
        fVar262 = auVar141._24_4_ * fVar307 * -fVar168;
        auVar34._24_4_ = fVar262;
        auVar34._28_4_ = fVar172;
        fVar338 = fVar219 * 0.0 * auVar141._0_4_;
        fVar219 = fVar218 * 0.0 * auVar141._4_4_;
        auVar35._4_4_ = fVar219;
        auVar35._0_4_ = fVar338;
        fVar205 = fVar239 * 0.0 * auVar141._8_4_;
        auVar35._8_4_ = fVar205;
        fVar218 = fVar256 * 0.0 * auVar141._12_4_;
        auVar35._12_4_ = fVar218;
        fVar226 = fVar283 * 0.0 * auVar141._16_4_;
        auVar35._16_4_ = fVar226;
        fVar239 = fVar303 * 0.0 * auVar141._20_4_;
        auVar35._20_4_ = fVar239;
        fVar256 = fVar307 * 0.0 * auVar141._24_4_;
        auVar35._24_4_ = fVar256;
        auVar35._28_4_ = fVar357;
        auVar112._4_4_ = fVar151;
        auVar112._0_4_ = fVar132;
        auVar112._8_4_ = fVar154;
        auVar112._12_4_ = fVar158;
        auVar112._16_4_ = fVar161;
        auVar112._20_4_ = fVar164;
        auVar112._24_4_ = fVar167;
        auVar112._28_4_ = fVar171;
        auVar269._0_4_ = fVar132 + fVar338;
        auVar269._4_4_ = fVar151 + fVar219;
        auVar269._8_4_ = fVar154 + fVar205;
        auVar269._12_4_ = fVar158 + fVar218;
        auVar269._16_4_ = fVar161 + fVar226;
        auVar269._20_4_ = fVar164 + fVar239;
        auVar269._24_4_ = fVar167 + fVar256;
        auVar269._28_4_ = fVar171 + fVar357;
        fVar338 = auVar314._0_4_ * fVar342 * fVar222;
        fVar219 = auVar314._4_4_ * fVar220 * fVar221;
        auVar36._4_4_ = fVar219;
        auVar36._0_4_ = fVar338;
        fVar342 = auVar314._8_4_ * fVar241 * fVar243;
        auVar36._8_4_ = fVar342;
        fVar205 = auVar314._12_4_ * fVar257 * fVar258;
        auVar36._12_4_ = fVar205;
        fVar218 = auVar314._16_4_ * fVar294 * fVar223;
        auVar36._16_4_ = fVar218;
        fVar220 = auVar314._20_4_ * fVar305 * fVar224;
        auVar36._20_4_ = fVar220;
        fVar226 = auVar314._24_4_ * fVar309 * fVar225;
        auVar36._24_4_ = fVar226;
        auVar36._28_4_ = auVar27._28_4_;
        auVar212 = vsubps_avx(auVar291,auVar32);
        auVar325._0_4_ = auVar234._0_4_ + fVar338;
        auVar325._4_4_ = auVar234._4_4_ + fVar219;
        auVar325._8_4_ = auVar234._8_4_ + fVar342;
        auVar325._12_4_ = auVar234._12_4_ + fVar205;
        auVar325._16_4_ = auVar234._16_4_ + fVar218;
        auVar325._20_4_ = auVar234._20_4_ + fVar220;
        auVar325._24_4_ = auVar234._24_4_ + fVar226;
        auVar325._28_4_ = auVar234._28_4_ + auVar27._28_4_;
        fVar338 = auVar314._0_4_ * fVar222 * -fVar133;
        fVar219 = auVar314._4_4_ * fVar221 * -fVar152;
        auVar27._4_4_ = fVar219;
        auVar27._0_4_ = fVar338;
        fVar342 = auVar314._8_4_ * fVar243 * -fVar156;
        auVar27._8_4_ = fVar342;
        fVar205 = auVar314._12_4_ * fVar258 * -fVar159;
        auVar27._12_4_ = fVar205;
        fVar218 = auVar314._16_4_ * fVar223 * -fVar162;
        auVar27._16_4_ = fVar218;
        fVar220 = auVar314._20_4_ * fVar224 * -fVar165;
        auVar27._20_4_ = fVar220;
        fVar226 = auVar314._24_4_ * fVar225 * -fVar169;
        auVar27._24_4_ = fVar226;
        auVar27._28_4_ = fVar363;
        auVar29 = vsubps_avx(auVar346,auVar34);
        auVar340._0_4_ = fVar338 + auVar211._0_4_;
        auVar340._4_4_ = fVar219 + auVar211._4_4_;
        auVar340._8_4_ = fVar342 + auVar211._8_4_;
        auVar340._12_4_ = fVar205 + auVar211._12_4_;
        auVar340._16_4_ = fVar218 + auVar211._16_4_;
        auVar340._20_4_ = fVar220 + auVar211._20_4_;
        auVar340._24_4_ = fVar226 + auVar211._24_4_;
        auVar340._28_4_ = fVar363 + auVar211._28_4_;
        fVar338 = fVar222 * 0.0 * auVar314._0_4_;
        fVar219 = fVar221 * 0.0 * auVar314._4_4_;
        auVar37._4_4_ = fVar219;
        auVar37._0_4_ = fVar338;
        fVar342 = fVar243 * 0.0 * auVar314._8_4_;
        auVar37._8_4_ = fVar342;
        fVar222 = fVar258 * 0.0 * auVar314._12_4_;
        auVar37._12_4_ = fVar222;
        fVar205 = fVar223 * 0.0 * auVar314._16_4_;
        auVar37._16_4_ = fVar205;
        fVar218 = fVar224 * 0.0 * auVar314._20_4_;
        auVar37._20_4_ = fVar218;
        fVar220 = fVar225 * 0.0 * auVar314._24_4_;
        auVar37._24_4_ = fVar220;
        auVar37._28_4_ = fVar172;
        auVar30 = vsubps_avx(auVar112,auVar35);
        auVar368._0_4_ = (float)local_4e0._0_4_ + fVar338;
        auVar368._4_4_ = (float)local_4e0._4_4_ + fVar219;
        auVar368._8_4_ = fStack_4d8 + fVar342;
        auVar368._12_4_ = fStack_4d4 + fVar222;
        auVar368._16_4_ = fStack_4d0 + fVar205;
        auVar368._20_4_ = fStack_4cc + fVar218;
        auVar368._24_4_ = fStack_4c8 + fVar220;
        auVar368._28_4_ = fStack_4c4 + fVar172;
        auVar253 = vsubps_avx(auVar234,auVar36);
        auVar21 = vsubps_avx(auVar211,auVar27);
        auVar28 = vsubps_avx(_local_4e0,auVar37);
        auVar27 = vsubps_avx(auVar340,auVar29);
        auVar33 = vsubps_avx(auVar368,auVar30);
        auVar38._4_4_ = auVar30._4_4_ * auVar27._4_4_;
        auVar38._0_4_ = auVar30._0_4_ * auVar27._0_4_;
        auVar38._8_4_ = auVar30._8_4_ * auVar27._8_4_;
        auVar38._12_4_ = auVar30._12_4_ * auVar27._12_4_;
        auVar38._16_4_ = auVar30._16_4_ * auVar27._16_4_;
        auVar38._20_4_ = auVar30._20_4_ * auVar27._20_4_;
        auVar38._24_4_ = auVar30._24_4_ * auVar27._24_4_;
        auVar38._28_4_ = fVar363;
        auVar39._4_4_ = auVar29._4_4_ * auVar33._4_4_;
        auVar39._0_4_ = auVar29._0_4_ * auVar33._0_4_;
        auVar39._8_4_ = auVar29._8_4_ * auVar33._8_4_;
        auVar39._12_4_ = auVar29._12_4_ * auVar33._12_4_;
        auVar39._16_4_ = auVar29._16_4_ * auVar33._16_4_;
        auVar39._20_4_ = auVar29._20_4_ * auVar33._20_4_;
        auVar39._24_4_ = auVar29._24_4_ * auVar33._24_4_;
        auVar39._28_4_ = auVar211._28_4_;
        auVar326 = vsubps_avx(auVar39,auVar38);
        auVar40._4_4_ = auVar212._4_4_ * auVar33._4_4_;
        auVar40._0_4_ = auVar212._0_4_ * auVar33._0_4_;
        auVar40._8_4_ = auVar212._8_4_ * auVar33._8_4_;
        auVar40._12_4_ = auVar212._12_4_ * auVar33._12_4_;
        auVar40._16_4_ = auVar212._16_4_ * auVar33._16_4_;
        auVar40._20_4_ = auVar212._20_4_ * auVar33._20_4_;
        auVar40._24_4_ = auVar212._24_4_ * auVar33._24_4_;
        auVar40._28_4_ = auVar33._28_4_;
        auVar211 = vsubps_avx(auVar325,auVar212);
        auVar41._4_4_ = auVar30._4_4_ * auVar211._4_4_;
        auVar41._0_4_ = auVar30._0_4_ * auVar211._0_4_;
        auVar41._8_4_ = auVar30._8_4_ * auVar211._8_4_;
        auVar41._12_4_ = auVar30._12_4_ * auVar211._12_4_;
        auVar41._16_4_ = auVar30._16_4_ * auVar211._16_4_;
        auVar41._20_4_ = auVar30._20_4_ * auVar211._20_4_;
        auVar41._24_4_ = auVar30._24_4_ * auVar211._24_4_;
        auVar41._28_4_ = auVar234._28_4_;
        auVar234 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar211._4_4_ * auVar29._4_4_;
        auVar42._0_4_ = auVar211._0_4_ * auVar29._0_4_;
        auVar42._8_4_ = auVar211._8_4_ * auVar29._8_4_;
        auVar42._12_4_ = auVar211._12_4_ * auVar29._12_4_;
        auVar42._16_4_ = auVar211._16_4_ * auVar29._16_4_;
        auVar42._20_4_ = auVar211._20_4_ * auVar29._20_4_;
        auVar42._24_4_ = auVar211._24_4_ * auVar29._24_4_;
        auVar42._28_4_ = auVar33._28_4_;
        auVar43._4_4_ = auVar212._4_4_ * auVar27._4_4_;
        auVar43._0_4_ = auVar212._0_4_ * auVar27._0_4_;
        auVar43._8_4_ = auVar212._8_4_ * auVar27._8_4_;
        auVar43._12_4_ = auVar212._12_4_ * auVar27._12_4_;
        auVar43._16_4_ = auVar212._16_4_ * auVar27._16_4_;
        auVar43._20_4_ = auVar212._20_4_ * auVar27._20_4_;
        auVar43._24_4_ = auVar212._24_4_ * auVar27._24_4_;
        auVar43._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar43,auVar42);
        auVar144._0_4_ = auVar326._0_4_ * 0.0 + auVar27._0_4_ + auVar234._0_4_ * 0.0;
        auVar144._4_4_ = auVar326._4_4_ * 0.0 + auVar27._4_4_ + auVar234._4_4_ * 0.0;
        auVar144._8_4_ = auVar326._8_4_ * 0.0 + auVar27._8_4_ + auVar234._8_4_ * 0.0;
        auVar144._12_4_ = auVar326._12_4_ * 0.0 + auVar27._12_4_ + auVar234._12_4_ * 0.0;
        auVar144._16_4_ = auVar326._16_4_ * 0.0 + auVar27._16_4_ + auVar234._16_4_ * 0.0;
        auVar144._20_4_ = auVar326._20_4_ * 0.0 + auVar27._20_4_ + auVar234._20_4_ * 0.0;
        auVar144._24_4_ = auVar326._24_4_ * 0.0 + auVar27._24_4_ + auVar234._24_4_ * 0.0;
        auVar144._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar234._28_4_;
        auVar291 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
        auVar253 = vblendvps_avx(auVar253,_local_7a0,auVar291);
        auVar115._4_4_ = auVar346._4_4_ + fVar281;
        auVar115._0_4_ = auVar346._0_4_ + fVar246;
        auVar115._8_4_ = auVar346._8_4_ + fVar335;
        auVar115._12_4_ = auVar346._12_4_ + fVar336;
        auVar115._16_4_ = auVar346._16_4_ + fVar260;
        auVar115._20_4_ = auVar346._20_4_ + fVar261;
        auVar115._24_4_ = auVar346._24_4_ + fVar262;
        auVar115._28_4_ = auVar346._28_4_ + fVar172;
        auVar21 = vblendvps_avx(auVar21,auVar115,auVar291);
        auVar28 = vblendvps_avx(auVar28,auVar269,auVar291);
        auVar27 = vblendvps_avx(auVar212,auVar325,auVar291);
        auVar33 = vblendvps_avx(auVar29,auVar340,auVar291);
        auVar326 = vblendvps_avx(auVar30,auVar368,auVar291);
        auVar212 = vblendvps_avx(auVar325,auVar212,auVar291);
        auVar211 = vblendvps_avx(auVar340,auVar29,auVar291);
        auVar197 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar234 = vblendvps_avx(auVar368,auVar30,auVar291);
        auVar212 = vsubps_avx(auVar212,auVar253);
        auVar346 = vsubps_avx(auVar211,auVar21);
        auVar234 = vsubps_avx(auVar234,auVar28);
        auVar29 = vsubps_avx(auVar21,auVar33);
        fVar338 = auVar346._0_4_;
        fVar168 = auVar28._0_4_;
        fVar218 = auVar346._4_4_;
        fVar133 = auVar28._4_4_;
        auVar44._4_4_ = fVar133 * fVar218;
        auVar44._0_4_ = fVar168 * fVar338;
        fVar241 = auVar346._8_4_;
        fVar152 = auVar28._8_4_;
        auVar44._8_4_ = fVar152 * fVar241;
        fVar258 = auVar346._12_4_;
        fVar156 = auVar28._12_4_;
        auVar44._12_4_ = fVar156 * fVar258;
        fVar335 = auVar346._16_4_;
        fVar159 = auVar28._16_4_;
        auVar44._16_4_ = fVar159 * fVar335;
        fVar307 = auVar346._20_4_;
        fVar162 = auVar28._20_4_;
        auVar44._20_4_ = fVar162 * fVar307;
        fVar262 = auVar346._24_4_;
        fVar165 = auVar28._24_4_;
        auVar44._24_4_ = fVar165 * fVar262;
        auVar44._28_4_ = auVar211._28_4_;
        fVar219 = auVar21._0_4_;
        fVar166 = auVar234._0_4_;
        fVar220 = auVar21._4_4_;
        fVar170 = auVar234._4_4_;
        auVar45._4_4_ = fVar170 * fVar220;
        auVar45._0_4_ = fVar166 * fVar219;
        fVar243 = auVar21._8_4_;
        fVar173 = auVar234._8_4_;
        auVar45._8_4_ = fVar173 * fVar243;
        fVar281 = auVar21._12_4_;
        fVar174 = auVar234._12_4_;
        auVar45._12_4_ = fVar174 * fVar281;
        fVar303 = auVar21._16_4_;
        fVar190 = auVar234._16_4_;
        auVar45._16_4_ = fVar190 * fVar303;
        fVar309 = auVar21._20_4_;
        fVar265 = auVar234._20_4_;
        auVar45._20_4_ = fVar265 * fVar309;
        fVar155 = auVar21._24_4_;
        fVar274 = auVar234._24_4_;
        auVar45._24_4_ = fVar274 * fVar155;
        auVar45._28_4_ = auVar340._28_4_;
        auVar21 = vsubps_avx(auVar45,auVar44);
        fVar342 = auVar253._0_4_;
        fVar221 = auVar253._4_4_;
        auVar46._4_4_ = fVar170 * fVar221;
        auVar46._0_4_ = fVar166 * fVar342;
        fVar246 = auVar253._8_4_;
        auVar46._8_4_ = fVar173 * fVar246;
        fVar283 = auVar253._12_4_;
        auVar46._12_4_ = fVar174 * fVar283;
        fVar305 = auVar253._16_4_;
        auVar46._16_4_ = fVar190 * fVar305;
        fVar225 = auVar253._20_4_;
        auVar46._20_4_ = fVar265 * fVar225;
        fVar364 = auVar253._24_4_;
        auVar46._24_4_ = fVar274 * fVar364;
        auVar46._28_4_ = auVar340._28_4_;
        fVar222 = auVar212._0_4_;
        auVar359._0_4_ = fVar168 * fVar222;
        fVar226 = auVar212._4_4_;
        auVar359._4_4_ = fVar133 * fVar226;
        fVar256 = auVar212._8_4_;
        auVar359._8_4_ = fVar152 * fVar256;
        fVar294 = auVar212._12_4_;
        auVar359._12_4_ = fVar156 * fVar294;
        fVar224 = auVar212._16_4_;
        auVar359._16_4_ = fVar159 * fVar224;
        fVar260 = auVar212._20_4_;
        auVar359._20_4_ = fVar162 * fVar260;
        fVar365 = auVar212._24_4_;
        auVar359._24_4_ = fVar165 * fVar365;
        auVar359._28_4_ = 0;
        auVar211 = vsubps_avx(auVar359,auVar46);
        auVar47._4_4_ = fVar220 * fVar226;
        auVar47._0_4_ = fVar219 * fVar222;
        auVar47._8_4_ = fVar243 * fVar256;
        auVar47._12_4_ = fVar281 * fVar294;
        auVar47._16_4_ = fVar303 * fVar224;
        auVar47._20_4_ = fVar309 * fVar260;
        auVar47._24_4_ = fVar155 * fVar365;
        auVar47._28_4_ = auVar340._28_4_;
        auVar48._4_4_ = fVar221 * fVar218;
        auVar48._0_4_ = fVar342 * fVar338;
        auVar48._8_4_ = fVar246 * fVar241;
        auVar48._12_4_ = fVar283 * fVar258;
        auVar48._16_4_ = fVar305 * fVar335;
        auVar48._20_4_ = fVar225 * fVar307;
        auVar48._24_4_ = fVar364 * fVar262;
        auVar48._28_4_ = auVar368._28_4_;
        auVar30 = vsubps_avx(auVar48,auVar47);
        auVar31 = vsubps_avx(auVar28,auVar326);
        fVar205 = auVar30._28_4_ + auVar211._28_4_;
        auVar183._0_4_ = auVar30._0_4_ + auVar211._0_4_ * 0.0 + auVar21._0_4_ * 0.0;
        auVar183._4_4_ = auVar30._4_4_ + auVar211._4_4_ * 0.0 + auVar21._4_4_ * 0.0;
        auVar183._8_4_ = auVar30._8_4_ + auVar211._8_4_ * 0.0 + auVar21._8_4_ * 0.0;
        auVar183._12_4_ = auVar30._12_4_ + auVar211._12_4_ * 0.0 + auVar21._12_4_ * 0.0;
        auVar183._16_4_ = auVar30._16_4_ + auVar211._16_4_ * 0.0 + auVar21._16_4_ * 0.0;
        auVar183._20_4_ = auVar30._20_4_ + auVar211._20_4_ * 0.0 + auVar21._20_4_ * 0.0;
        auVar183._24_4_ = auVar30._24_4_ + auVar211._24_4_ * 0.0 + auVar21._24_4_ * 0.0;
        auVar183._28_4_ = fVar205 + auVar21._28_4_;
        fVar169 = auVar29._0_4_;
        fVar172 = auVar29._4_4_;
        auVar49._4_4_ = fVar172 * auVar326._4_4_;
        auVar49._0_4_ = fVar169 * auVar326._0_4_;
        fVar245 = auVar29._8_4_;
        auVar49._8_4_ = fVar245 * auVar326._8_4_;
        fVar153 = auVar29._12_4_;
        auVar49._12_4_ = fVar153 * auVar326._12_4_;
        fVar157 = auVar29._16_4_;
        auVar49._16_4_ = fVar157 * auVar326._16_4_;
        fVar160 = auVar29._20_4_;
        auVar49._20_4_ = fVar160 * auVar326._20_4_;
        fVar163 = auVar29._24_4_;
        auVar49._24_4_ = fVar163 * auVar326._24_4_;
        auVar49._28_4_ = fVar205;
        fVar205 = auVar31._0_4_;
        fVar239 = auVar31._4_4_;
        auVar50._4_4_ = auVar33._4_4_ * fVar239;
        auVar50._0_4_ = auVar33._0_4_ * fVar205;
        fVar257 = auVar31._8_4_;
        auVar50._8_4_ = auVar33._8_4_ * fVar257;
        fVar223 = auVar31._12_4_;
        auVar50._12_4_ = auVar33._12_4_ * fVar223;
        fVar336 = auVar31._16_4_;
        auVar50._16_4_ = auVar33._16_4_ * fVar336;
        fVar261 = auVar31._20_4_;
        auVar50._20_4_ = auVar33._20_4_ * fVar261;
        fVar366 = auVar31._24_4_;
        auVar50._24_4_ = auVar33._24_4_ * fVar366;
        auVar50._28_4_ = auVar30._28_4_;
        auVar211 = vsubps_avx(auVar50,auVar49);
        auVar29 = vsubps_avx(auVar253,auVar27);
        fVar276 = auVar29._0_4_;
        fVar278 = auVar29._4_4_;
        auVar51._4_4_ = fVar278 * auVar326._4_4_;
        auVar51._0_4_ = fVar276 * auVar326._0_4_;
        fVar279 = auVar29._8_4_;
        auVar51._8_4_ = fVar279 * auVar326._8_4_;
        fVar280 = auVar29._12_4_;
        auVar51._12_4_ = fVar280 * auVar326._12_4_;
        fVar282 = auVar29._16_4_;
        auVar51._16_4_ = fVar282 * auVar326._16_4_;
        fVar284 = auVar29._20_4_;
        auVar51._20_4_ = fVar284 * auVar326._20_4_;
        fVar259 = auVar29._24_4_;
        auVar51._24_4_ = fVar259 * auVar326._24_4_;
        auVar51._28_4_ = auVar326._28_4_;
        auVar52._4_4_ = auVar27._4_4_ * fVar239;
        auVar52._0_4_ = auVar27._0_4_ * fVar205;
        auVar52._8_4_ = auVar27._8_4_ * fVar257;
        auVar52._12_4_ = auVar27._12_4_ * fVar223;
        auVar52._16_4_ = auVar27._16_4_ * fVar336;
        auVar52._20_4_ = auVar27._20_4_ * fVar261;
        auVar52._24_4_ = auVar27._24_4_ * fVar366;
        auVar52._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar51,auVar52);
        auVar53._4_4_ = auVar33._4_4_ * fVar278;
        auVar53._0_4_ = auVar33._0_4_ * fVar276;
        auVar53._8_4_ = auVar33._8_4_ * fVar279;
        auVar53._12_4_ = auVar33._12_4_ * fVar280;
        auVar53._16_4_ = auVar33._16_4_ * fVar282;
        auVar53._20_4_ = auVar33._20_4_ * fVar284;
        auVar53._24_4_ = auVar33._24_4_ * fVar259;
        auVar53._28_4_ = auVar326._28_4_;
        auVar54._4_4_ = auVar27._4_4_ * fVar172;
        auVar54._0_4_ = auVar27._0_4_ * fVar169;
        auVar54._8_4_ = auVar27._8_4_ * fVar245;
        auVar54._12_4_ = auVar27._12_4_ * fVar153;
        auVar54._16_4_ = auVar27._16_4_ * fVar157;
        auVar54._20_4_ = auVar27._20_4_ * fVar160;
        auVar54._24_4_ = auVar27._24_4_ * fVar163;
        auVar54._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar54,auVar53);
        auVar360 = ZEXT864(0) << 0x20;
        auVar236._0_4_ = auVar211._0_4_ * 0.0 + auVar27._0_4_ + auVar21._0_4_ * 0.0;
        auVar236._4_4_ = auVar211._4_4_ * 0.0 + auVar27._4_4_ + auVar21._4_4_ * 0.0;
        auVar236._8_4_ = auVar211._8_4_ * 0.0 + auVar27._8_4_ + auVar21._8_4_ * 0.0;
        auVar236._12_4_ = auVar211._12_4_ * 0.0 + auVar27._12_4_ + auVar21._12_4_ * 0.0;
        auVar236._16_4_ = auVar211._16_4_ * 0.0 + auVar27._16_4_ + auVar21._16_4_ * 0.0;
        auVar236._20_4_ = auVar211._20_4_ * 0.0 + auVar27._20_4_ + auVar21._20_4_ * 0.0;
        auVar236._24_4_ = auVar211._24_4_ * 0.0 + auVar27._24_4_ + auVar21._24_4_ * 0.0;
        auVar236._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar183,auVar236);
        auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
        auVar232 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar197 = vpand_avx(auVar232,auVar197);
        auVar232 = vpmovsxwd_avx(auVar197);
        auVar210 = vpunpckhwd_avx(auVar197,auVar197);
        auVar213._16_16_ = auVar210;
        auVar213._0_16_ = auVar232;
        if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar213 >> 0x7f,0) == '\0') &&
              (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar210 >> 0x3f,0) == '\0') &&
            (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar210[0xf]) {
LAB_00f50080:
          auVar150 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar217 = ZEXT3264(auVar213);
          auVar329 = ZEXT3264(local_620);
          auVar318 = ZEXT3264(local_640);
        }
        else {
          auVar55._4_4_ = fVar239 * fVar218;
          auVar55._0_4_ = fVar205 * fVar338;
          auVar55._8_4_ = fVar257 * fVar241;
          auVar55._12_4_ = fVar223 * fVar258;
          auVar55._16_4_ = fVar336 * fVar335;
          auVar55._20_4_ = fVar261 * fVar307;
          auVar55._24_4_ = fVar366 * fVar262;
          auVar55._28_4_ = auVar210._12_4_;
          auVar347._0_4_ = fVar169 * fVar166;
          auVar347._4_4_ = fVar172 * fVar170;
          auVar347._8_4_ = fVar245 * fVar173;
          auVar347._12_4_ = fVar153 * fVar174;
          auVar347._16_4_ = fVar157 * fVar190;
          auVar347._20_4_ = fVar160 * fVar265;
          auVar347._24_4_ = fVar163 * fVar274;
          auVar347._28_4_ = 0;
          auVar21 = vsubps_avx(auVar347,auVar55);
          auVar56._4_4_ = fVar278 * fVar170;
          auVar56._0_4_ = fVar276 * fVar166;
          auVar56._8_4_ = fVar279 * fVar173;
          auVar56._12_4_ = fVar280 * fVar174;
          auVar56._16_4_ = fVar282 * fVar190;
          auVar56._20_4_ = fVar284 * fVar265;
          auVar56._24_4_ = fVar259 * fVar274;
          auVar56._28_4_ = auVar234._28_4_;
          auVar57._4_4_ = fVar239 * fVar226;
          auVar57._0_4_ = fVar205 * fVar222;
          auVar57._8_4_ = fVar257 * fVar256;
          auVar57._12_4_ = fVar223 * fVar294;
          auVar57._16_4_ = fVar336 * fVar224;
          auVar57._20_4_ = fVar261 * fVar260;
          auVar57._24_4_ = fVar366 * fVar365;
          auVar57._28_4_ = auVar31._28_4_;
          auVar33 = vsubps_avx(auVar57,auVar56);
          auVar58._4_4_ = fVar172 * fVar226;
          auVar58._0_4_ = fVar169 * fVar222;
          auVar58._8_4_ = fVar245 * fVar256;
          auVar58._12_4_ = fVar153 * fVar294;
          auVar58._16_4_ = fVar157 * fVar224;
          auVar58._20_4_ = fVar160 * fVar260;
          auVar58._24_4_ = fVar163 * fVar365;
          auVar58._28_4_ = auVar183._28_4_;
          auVar59._4_4_ = fVar278 * fVar218;
          auVar59._0_4_ = fVar276 * fVar338;
          auVar59._8_4_ = fVar279 * fVar241;
          auVar59._12_4_ = fVar280 * fVar258;
          auVar59._16_4_ = fVar282 * fVar335;
          auVar59._20_4_ = fVar284 * fVar307;
          auVar59._24_4_ = fVar259 * fVar262;
          auVar59._28_4_ = auVar346._28_4_;
          auVar326 = vsubps_avx(auVar59,auVar58);
          auVar292._0_4_ = auVar21._0_4_ * 0.0 + auVar326._0_4_ + auVar33._0_4_ * 0.0;
          auVar292._4_4_ = auVar21._4_4_ * 0.0 + auVar326._4_4_ + auVar33._4_4_ * 0.0;
          auVar292._8_4_ = auVar21._8_4_ * 0.0 + auVar326._8_4_ + auVar33._8_4_ * 0.0;
          auVar292._12_4_ = auVar21._12_4_ * 0.0 + auVar326._12_4_ + auVar33._12_4_ * 0.0;
          auVar292._16_4_ = auVar21._16_4_ * 0.0 + auVar326._16_4_ + auVar33._16_4_ * 0.0;
          auVar292._20_4_ = auVar21._20_4_ * 0.0 + auVar326._20_4_ + auVar33._20_4_ * 0.0;
          auVar292._24_4_ = auVar21._24_4_ * 0.0 + auVar326._24_4_ + auVar33._24_4_ * 0.0;
          auVar292._28_4_ = auVar346._28_4_ + auVar326._28_4_ + auVar183._28_4_;
          auVar27 = vrcpps_avx(auVar292);
          fVar338 = auVar27._0_4_;
          fVar222 = auVar27._4_4_;
          auVar60._4_4_ = auVar292._4_4_ * fVar222;
          auVar60._0_4_ = auVar292._0_4_ * fVar338;
          fVar205 = auVar27._8_4_;
          auVar60._8_4_ = auVar292._8_4_ * fVar205;
          fVar218 = auVar27._12_4_;
          auVar60._12_4_ = auVar292._12_4_ * fVar218;
          fVar226 = auVar27._16_4_;
          auVar60._16_4_ = auVar292._16_4_ * fVar226;
          fVar239 = auVar27._20_4_;
          auVar60._20_4_ = auVar292._20_4_ * fVar239;
          fVar241 = auVar27._24_4_;
          auVar60._24_4_ = auVar292._24_4_ * fVar241;
          auVar60._28_4_ = auVar31._28_4_;
          auVar348._8_4_ = 0x3f800000;
          auVar348._0_8_ = 0x3f8000003f800000;
          auVar348._12_4_ = 0x3f800000;
          auVar348._16_4_ = 0x3f800000;
          auVar348._20_4_ = 0x3f800000;
          auVar348._24_4_ = 0x3f800000;
          auVar348._28_4_ = 0x3f800000;
          auVar211 = vsubps_avx(auVar348,auVar60);
          fVar338 = auVar211._0_4_ * fVar338 + fVar338;
          fVar222 = auVar211._4_4_ * fVar222 + fVar222;
          fVar205 = auVar211._8_4_ * fVar205 + fVar205;
          fVar218 = auVar211._12_4_ * fVar218 + fVar218;
          fVar226 = auVar211._16_4_ * fVar226 + fVar226;
          fVar239 = auVar211._20_4_ * fVar239 + fVar239;
          fVar241 = auVar211._24_4_ * fVar241 + fVar241;
          auVar61._4_4_ =
               (auVar21._4_4_ * fVar221 + auVar33._4_4_ * fVar220 + auVar326._4_4_ * fVar133) *
               fVar222;
          auVar61._0_4_ =
               (auVar21._0_4_ * fVar342 + auVar33._0_4_ * fVar219 + auVar326._0_4_ * fVar168) *
               fVar338;
          auVar61._8_4_ =
               (auVar21._8_4_ * fVar246 + auVar33._8_4_ * fVar243 + auVar326._8_4_ * fVar152) *
               fVar205;
          auVar61._12_4_ =
               (auVar21._12_4_ * fVar283 + auVar33._12_4_ * fVar281 + auVar326._12_4_ * fVar156) *
               fVar218;
          auVar61._16_4_ =
               (auVar21._16_4_ * fVar305 + auVar33._16_4_ * fVar303 + auVar326._16_4_ * fVar159) *
               fVar226;
          auVar61._20_4_ =
               (auVar21._20_4_ * fVar225 + auVar33._20_4_ * fVar309 + auVar326._20_4_ * fVar162) *
               fVar239;
          auVar61._24_4_ =
               (auVar21._24_4_ * fVar364 + auVar33._24_4_ * fVar155 + auVar326._24_4_ * fVar165) *
               fVar241;
          auVar61._28_4_ = auVar253._28_4_ + auVar212._28_4_ + auVar28._28_4_;
          auVar232 = vpermilps_avx(ZEXT416(uVar126),0);
          auVar214._16_16_ = auVar232;
          auVar214._0_16_ = auVar232;
          auVar253 = vcmpps_avx(auVar214,auVar61,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar251._4_4_ = uVar11;
          auVar251._0_4_ = uVar11;
          auVar251._8_4_ = uVar11;
          auVar251._12_4_ = uVar11;
          auVar251._16_4_ = uVar11;
          auVar251._20_4_ = uVar11;
          auVar251._24_4_ = uVar11;
          auVar251._28_4_ = uVar11;
          auVar21 = vcmpps_avx(auVar61,auVar251,2);
          auVar253 = vandps_avx(auVar21,auVar253);
          auVar232 = vpackssdw_avx(auVar253._0_16_,auVar253._16_16_);
          auVar197 = vpand_avx(auVar197,auVar232);
          auVar232 = vpmovsxwd_avx(auVar197);
          auVar210 = vpshufd_avx(auVar197,0xee);
          auVar210 = vpmovsxwd_avx(auVar210);
          auVar213._16_16_ = auVar210;
          auVar213._0_16_ = auVar232;
          if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar213 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar213 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar213 >> 0x7f,0) == '\0') &&
                (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar210 >> 0x3f,0) == '\0') &&
              (auVar213 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar210[0xf]) goto LAB_00f50080;
          auVar253 = vcmpps_avx(ZEXT832(0) << 0x20,auVar292,4);
          auVar232 = vpackssdw_avx(auVar253._0_16_,auVar253._16_16_);
          auVar197 = vpand_avx(auVar197,auVar232);
          auVar232 = vpmovsxwd_avx(auVar197);
          auVar197 = vpunpckhwd_avx(auVar197,auVar197);
          auVar217 = ZEXT1664(auVar197);
          auVar270._16_16_ = auVar197;
          auVar270._0_16_ = auVar232;
          auVar150 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar329 = ZEXT3264(local_620);
          auVar318 = ZEXT3264(local_640);
          if ((((((((auVar270 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar270 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar270 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar270 >> 0x7f,0) != '\0') ||
                (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar197 >> 0x3f,0) != '\0') ||
              (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar197[0xf] < '\0') {
            auVar215._0_4_ = auVar183._0_4_ * fVar338;
            auVar215._4_4_ = auVar183._4_4_ * fVar222;
            auVar215._8_4_ = auVar183._8_4_ * fVar205;
            auVar215._12_4_ = auVar183._12_4_ * fVar218;
            auVar215._16_4_ = auVar183._16_4_ * fVar226;
            auVar215._20_4_ = auVar183._20_4_ * fVar239;
            auVar215._24_4_ = auVar183._24_4_ * fVar241;
            auVar215._28_4_ = 0;
            auVar62._4_4_ = auVar236._4_4_ * fVar222;
            auVar62._0_4_ = auVar236._0_4_ * fVar338;
            auVar62._8_4_ = auVar236._8_4_ * fVar205;
            auVar62._12_4_ = auVar236._12_4_ * fVar218;
            auVar62._16_4_ = auVar236._16_4_ * fVar226;
            auVar62._20_4_ = auVar236._20_4_ * fVar239;
            auVar62._24_4_ = auVar236._24_4_ * fVar241;
            auVar62._28_4_ = auVar211._28_4_ + auVar27._28_4_;
            auVar252._8_4_ = 0x3f800000;
            auVar252._0_8_ = 0x3f8000003f800000;
            auVar252._12_4_ = 0x3f800000;
            auVar252._16_4_ = 0x3f800000;
            auVar252._20_4_ = 0x3f800000;
            auVar252._24_4_ = 0x3f800000;
            auVar252._28_4_ = 0x3f800000;
            auVar253 = vsubps_avx(auVar252,auVar215);
            auVar253 = vblendvps_avx(auVar253,auVar215,auVar291);
            auVar329 = ZEXT3264(auVar253);
            auVar253 = vsubps_avx(auVar252,auVar62);
            auVar217 = ZEXT3264(auVar253);
            _local_520 = vblendvps_avx(auVar253,auVar62,auVar291);
            auVar150 = ZEXT3264(auVar270);
            auVar318 = ZEXT3264(auVar61);
          }
        }
        auVar301 = ZEXT3264(auVar141);
        auVar212 = auVar318._0_32_;
        auVar326 = auVar329._0_32_;
        auVar253 = auVar150._0_32_;
        if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar253 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar253 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar253 >> 0x7f,0) == '\0') &&
              (auVar150 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar253 >> 0xbf,0) == '\0') &&
            (auVar150 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar150[0x1f]) goto LAB_00f4eb22;
        auVar21 = vsubps_avx(auVar314,auVar141);
        fVar219 = auVar141._0_4_ + auVar329._0_4_ * auVar21._0_4_;
        fVar342 = auVar141._4_4_ + auVar329._4_4_ * auVar21._4_4_;
        fVar222 = auVar141._8_4_ + auVar329._8_4_ * auVar21._8_4_;
        fVar205 = auVar141._12_4_ + auVar329._12_4_ * auVar21._12_4_;
        fVar218 = auVar141._16_4_ + auVar329._16_4_ * auVar21._16_4_;
        fVar220 = auVar141._20_4_ + auVar329._20_4_ * auVar21._20_4_;
        fVar221 = auVar141._24_4_ + auVar329._24_4_ * auVar21._24_4_;
        fVar226 = auVar21._28_4_ + 0.0;
        fVar338 = *(float *)((long)local_718->ray_space + k * 4 + -0x20);
        auVar63._4_4_ = (fVar342 + fVar342) * fVar338;
        auVar63._0_4_ = (fVar219 + fVar219) * fVar338;
        auVar63._8_4_ = (fVar222 + fVar222) * fVar338;
        auVar63._12_4_ = (fVar205 + fVar205) * fVar338;
        auVar63._16_4_ = (fVar218 + fVar218) * fVar338;
        auVar63._20_4_ = (fVar220 + fVar220) * fVar338;
        auVar63._24_4_ = (fVar221 + fVar221) * fVar338;
        auVar63._28_4_ = fVar226 + fVar226;
        auVar21 = vcmpps_avx(auVar212,auVar63,6);
        auVar28 = auVar253 & auVar21;
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0x7f,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0xbf,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar28[0x1f]) {
LAB_00f4ebbc:
          bVar128 = false;
        }
        else {
          local_320 = vandps_avx(auVar21,auVar253);
          local_3c0 = (float)local_520._0_4_ + (float)local_520._0_4_ + -1.0;
          fStack_3bc = (float)local_520._4_4_ + (float)local_520._4_4_ + -1.0;
          fStack_3b8 = (float)uStack_518 + (float)uStack_518 + -1.0;
          fStack_3b4 = uStack_518._4_4_ + uStack_518._4_4_ + -1.0;
          fStack_3b0 = (float)uStack_510 + (float)uStack_510 + -1.0;
          fStack_3ac = uStack_510._4_4_ + uStack_510._4_4_ + -1.0;
          fStack_3a8 = (float)uStack_508 + (float)uStack_508 + -1.0;
          fStack_3a4 = uStack_508._4_4_ + uStack_508._4_4_ + -1.0;
          local_380 = 0;
          uStack_368 = uStack_738;
          uStack_358 = uStack_648;
          uStack_348 = uStack_658;
          uStack_338 = uStack_668;
          local_520._4_4_ = fStack_3bc;
          local_520._0_4_ = local_3c0;
          uStack_518._0_4_ = fStack_3b8;
          uStack_518._4_4_ = fStack_3b4;
          uStack_510._0_4_ = fStack_3b0;
          uStack_510._4_4_ = fStack_3ac;
          auVar121 = _local_520;
          uStack_508._0_4_ = fStack_3a8;
          uStack_508._4_4_ = fStack_3a4;
          auVar253 = _local_520;
          _local_520 = auVar253;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00f4ebbc;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar128 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar194._0_4_ = 1.0 / (float)(int)uVar15;
            auVar194._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar197 = vshufps_avx(auVar194,auVar194,0);
            local_300[0] = auVar197._0_4_ * (auVar329._0_4_ + 0.0);
            local_300[1] = auVar197._4_4_ * (auVar329._4_4_ + 1.0);
            local_300[2] = auVar197._8_4_ * (auVar329._8_4_ + 2.0);
            local_300[3] = auVar197._12_4_ * (auVar329._12_4_ + 3.0);
            fStack_2f0 = auVar197._0_4_ * (auVar329._16_4_ + 4.0);
            fStack_2ec = auVar197._4_4_ * (auVar329._20_4_ + 5.0);
            fStack_2e8 = auVar197._8_4_ * (auVar329._24_4_ + 6.0);
            fStack_2e4 = auVar329._28_4_ + 7.0;
            uStack_510 = auVar121._16_8_;
            uStack_508 = auVar253._24_8_;
            local_2e0 = local_520;
            uStack_2d8 = uStack_518;
            uStack_2d0 = uStack_510;
            uStack_2c8 = uStack_508;
            local_2c0 = auVar212;
            iVar123 = vmovmskps_avx(local_320);
            uVar130 = CONCAT44((int)((ulong)lVar129 >> 0x20),iVar123);
            uVar124 = 0;
            if (uVar130 != 0) {
              for (; (uVar130 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            if (iVar123 == 0) goto LAB_00f4ebbc;
            auVar197 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
            local_6c0._16_16_ = auVar197;
            local_6c0._0_16_ = auVar197;
            auVar197 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
            auVar232 = *local_728;
            uVar107 = *(undefined8 *)(local_730 + 0x10);
            uVar108 = *(undefined8 *)(local_730 + 0x18);
            _local_6e0 = ZEXT1632(*local_728);
            uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
            local_640 = auVar212;
            local_620 = auVar326;
            _local_4a0 = *pauVar9;
            local_3e0 = auVar326;
            local_3a0 = auVar212;
            local_37c = uVar15;
            local_370 = local_740;
            local_360 = local_650;
            local_350 = local_660;
            local_340 = local_670;
            do {
              local_1a0 = local_300[uVar124];
              local_180 = *(undefined4 *)((long)&local_2e0 + uVar124 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar124 * 4);
              fVar219 = 1.0 - local_1a0;
              fVar338 = local_1a0 * fVar219 * 4.0;
              auVar210 = ZEXT416((uint)(local_1a0 * local_1a0 * 0.5));
              auVar210 = vshufps_avx(auVar210,auVar210,0);
              auVar195 = ZEXT416((uint)((fVar219 * fVar219 + fVar338) * 0.5));
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar231 = ZEXT416((uint)((-local_1a0 * local_1a0 - fVar338) * 0.5));
              auVar231 = vshufps_avx(auVar231,auVar231,0);
              local_710.context = context->user;
              auVar209 = ZEXT416((uint)(fVar219 * -fVar219 * 0.5));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar196._0_4_ =
                   auVar209._0_4_ * (float)local_740._0_4_ +
                   auVar231._0_4_ * (float)local_650._0_4_ +
                   auVar210._0_4_ * (float)local_670._0_4_ + auVar195._0_4_ * (float)local_660._0_4_
              ;
              auVar196._4_4_ =
                   auVar209._4_4_ * (float)local_740._4_4_ +
                   auVar231._4_4_ * (float)local_650._4_4_ +
                   auVar210._4_4_ * (float)local_670._4_4_ + auVar195._4_4_ * (float)local_660._4_4_
              ;
              auVar196._8_4_ =
                   auVar209._8_4_ * (float)uStack_738 +
                   auVar231._8_4_ * (float)uStack_648 +
                   auVar210._8_4_ * (float)uStack_668 + auVar195._8_4_ * (float)uStack_658;
              auVar196._12_4_ =
                   auVar209._12_4_ * uStack_738._4_4_ +
                   auVar231._12_4_ * uStack_648._4_4_ +
                   auVar210._12_4_ * uStack_668._4_4_ + auVar195._12_4_ * uStack_658._4_4_;
              local_1f0 = vshufps_avx(auVar196,auVar196,0);
              local_200[0] = (RTCHitN)local_1f0[0];
              local_200[1] = (RTCHitN)local_1f0[1];
              local_200[2] = (RTCHitN)local_1f0[2];
              local_200[3] = (RTCHitN)local_1f0[3];
              local_200[4] = (RTCHitN)local_1f0[4];
              local_200[5] = (RTCHitN)local_1f0[5];
              local_200[6] = (RTCHitN)local_1f0[6];
              local_200[7] = (RTCHitN)local_1f0[7];
              local_200[8] = (RTCHitN)local_1f0[8];
              local_200[9] = (RTCHitN)local_1f0[9];
              local_200[10] = (RTCHitN)local_1f0[10];
              local_200[0xb] = (RTCHitN)local_1f0[0xb];
              local_200[0xc] = (RTCHitN)local_1f0[0xc];
              local_200[0xd] = (RTCHitN)local_1f0[0xd];
              local_200[0xe] = (RTCHitN)local_1f0[0xe];
              local_200[0xf] = (RTCHitN)local_1f0[0xf];
              local_1d0 = vshufps_avx(auVar196,auVar196,0x55);
              local_1e0 = local_1d0;
              local_1b0 = vshufps_avx(auVar196,auVar196,0xaa);
              local_1c0 = local_1b0;
              fStack_19c = local_1a0;
              fStack_198 = local_1a0;
              fStack_194 = local_1a0;
              fStack_190 = local_1a0;
              fStack_18c = local_1a0;
              fStack_188 = local_1a0;
              fStack_184 = local_1a0;
              uStack_17c = local_180;
              uStack_178 = local_180;
              uStack_174 = local_180;
              uStack_170 = local_180;
              uStack_16c = local_180;
              uStack_168 = local_180;
              uStack_164 = local_180;
              local_780 = auVar197._0_8_;
              uStack_778 = auVar197._8_8_;
              local_160 = local_780;
              uStack_158 = uStack_778;
              uStack_150 = local_780;
              uStack_148 = uStack_778;
              local_140 = local_6c0._0_8_;
              uStack_138 = local_6c0._8_8_;
              uStack_130 = local_6c0._16_8_;
              uStack_128 = local_6c0._24_8_;
              auVar253 = vcmpps_avx(auVar360._0_32_,auVar360._0_32_,0xf);
              local_720[1] = auVar253;
              *local_720 = auVar253;
              local_120 = (local_710.context)->instID[0];
              uStack_11c = local_120;
              uStack_118 = local_120;
              uStack_114 = local_120;
              uStack_110 = local_120;
              uStack_10c = local_120;
              uStack_108 = local_120;
              uStack_104 = local_120;
              local_100 = (local_710.context)->instPrimID[0];
              uStack_fc = local_100;
              uStack_f8 = local_100;
              uStack_f4 = local_100;
              uStack_f0 = local_100;
              uStack_ec = local_100;
              uStack_e8 = local_100;
              uStack_e4 = local_100;
              local_7a0 = auVar232._0_8_;
              uStack_798 = auVar232._8_8_;
              local_760 = local_7a0;
              uStack_758 = uStack_798;
              local_710.valid = (int *)&local_760;
              local_710.geometryUserPtr = pGVar16->userPtr;
              local_710.hit = local_200;
              local_710.N = 8;
              auVar138._4_4_ = fVar151;
              auVar138._0_4_ = fVar132;
              auVar138._8_4_ = fVar154;
              auVar138._12_4_ = fVar158;
              auVar179 = local_6e0._0_16_;
              uStack_750 = uVar107;
              uStack_748 = uVar108;
              local_710.ray = (RTCRayN *)ray;
              if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar301 = ZEXT1664(auVar301._0_16_);
                (*pGVar16->occlusionFilterN)(&local_710);
                auVar318 = ZEXT3264(local_640);
                auVar329 = ZEXT3264(local_620);
                auVar360 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar179._8_8_ = uStack_758;
                auVar179._0_8_ = local_760;
                auVar138._8_8_ = uStack_748;
                auVar138._0_8_ = uStack_750;
              }
              auVar210 = vpcmpeqd_avx(auVar179,ZEXT816(0) << 0x40);
              auVar195 = vpcmpeqd_avx(auVar138,ZEXT816(0) << 0x40);
              auVar217 = ZEXT1664(auVar195);
              auVar200._16_16_ = auVar195;
              auVar200._0_16_ = auVar210;
              auVar21 = auVar253 & ~auVar200;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar21 >> 0x7f,0) == '\0') &&
                    (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0xbf,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar21[0x1f]) {
                auVar145._0_4_ = auVar210._0_4_ ^ auVar253._0_4_;
                auVar145._4_4_ = auVar210._4_4_ ^ auVar253._4_4_;
                auVar145._8_4_ = auVar210._8_4_ ^ auVar253._8_4_;
                auVar145._12_4_ = auVar210._12_4_ ^ auVar253._12_4_;
                auVar145._16_4_ = auVar195._0_4_ ^ auVar253._16_4_;
                auVar145._20_4_ = auVar195._4_4_ ^ auVar253._20_4_;
                auVar145._24_4_ = auVar195._8_4_ ^ auVar253._24_4_;
                auVar145._28_4_ = auVar195._12_4_ ^ auVar253._28_4_;
              }
              else {
                p_Var19 = context->args->filter;
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar217 = ZEXT1664(auVar195);
                  auVar301 = ZEXT1664(auVar301._0_16_);
                  (*p_Var19)(&local_710);
                  auVar318 = ZEXT3264(local_640);
                  auVar329 = ZEXT3264(local_620);
                  auVar360 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar179._8_8_ = uStack_758;
                  auVar179._0_8_ = local_760;
                  auVar138._8_8_ = uStack_748;
                  auVar138._0_8_ = uStack_750;
                }
                auVar210 = vpcmpeqd_avx(auVar179,ZEXT816(0) << 0x40);
                auVar195 = vpcmpeqd_avx(auVar138,ZEXT816(0) << 0x40);
                auVar184._16_16_ = auVar195;
                auVar184._0_16_ = auVar210;
                auVar145._0_4_ = auVar210._0_4_ ^ auVar253._0_4_;
                auVar145._4_4_ = auVar210._4_4_ ^ auVar253._4_4_;
                auVar145._8_4_ = auVar210._8_4_ ^ auVar253._8_4_;
                auVar145._12_4_ = auVar210._12_4_ ^ auVar253._12_4_;
                auVar145._16_4_ = auVar195._0_4_ ^ auVar253._16_4_;
                auVar145._20_4_ = auVar195._4_4_ ^ auVar253._20_4_;
                auVar145._24_4_ = auVar195._8_4_ ^ auVar253._24_4_;
                auVar145._28_4_ = auVar195._12_4_ ^ auVar253._28_4_;
                auVar201._8_4_ = 0xff800000;
                auVar201._0_8_ = 0xff800000ff800000;
                auVar201._12_4_ = 0xff800000;
                auVar201._16_4_ = 0xff800000;
                auVar201._20_4_ = 0xff800000;
                auVar201._24_4_ = 0xff800000;
                auVar201._28_4_ = 0xff800000;
                auVar253 = vblendvps_avx(auVar201,*(undefined1 (*) [32])(local_710.ray + 0x100),
                                         auVar184);
                *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar253;
              }
              auVar212 = auVar318._0_32_;
              auVar326 = auVar329._0_32_;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                bVar128 = true;
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
              uVar130 = uVar130 ^ 1L << (uVar124 & 0x3f);
              uVar124 = 0;
              if (uVar130 != 0) {
                for (; (uVar130 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
                }
              }
              bVar128 = false;
            } while (uVar130 != 0);
          }
        }
      }
      auVar360 = ZEXT3264(auVar233);
      local_640 = auVar212;
      local_620 = auVar326;
      if (8 < (int)uVar15) {
        _local_4a0 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar248 = vshufps_avx(auVar248,auVar248,0);
        local_4c0._16_16_ = auVar248;
        local_4c0._0_16_ = auVar248;
        auVar248 = vpermilps_avx(ZEXT416(uVar126),0);
        register0x00001210 = auVar248;
        _local_4e0 = auVar248;
        auVar139._0_4_ = 1.0 / (float)local_580._0_4_;
        auVar139._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar248 = vshufps_avx(auVar139,auVar139,0);
        register0x00001210 = auVar248;
        _local_e0 = auVar248;
        auVar248 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
        local_500._16_16_ = auVar248;
        local_500._0_16_ = auVar248;
        auVar248 = vshufps_avx(ZEXT416((uint)local_5a0._0_4_),ZEXT416((uint)local_5a0._0_4_),0);
        local_5a0._16_16_ = auVar248;
        local_5a0._0_16_ = auVar248;
        auVar150 = ZEXT3264(local_5a0);
        lVar131 = 8;
        do {
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar131 * 4 + lVar20);
          fVar338 = *(float *)*pauVar10;
          fVar219 = *(float *)(*pauVar10 + 4);
          fVar342 = *(float *)(*pauVar10 + 8);
          fVar222 = *(float *)(*pauVar10 + 0xc);
          fVar205 = *(float *)(*pauVar10 + 0x10);
          fVar218 = *(float *)(*pauVar10 + 0x14);
          fVar220 = *(float *)(*pauVar10 + 0x18);
          auVar120 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar20 + 0x21aefac + lVar131 * 4);
          fVar221 = *(float *)*pauVar10;
          fVar226 = *(float *)(*pauVar10 + 4);
          fVar239 = *(float *)(*pauVar10 + 8);
          fVar241 = *(float *)(*pauVar10 + 0xc);
          fVar243 = *(float *)(*pauVar10 + 0x10);
          fVar246 = *(float *)(*pauVar10 + 0x14);
          fVar256 = *(float *)(*pauVar10 + 0x18);
          auVar119 = *pauVar10;
          pfVar1 = (float *)(lVar20 + 0x21af430 + lVar131 * 4);
          fVar258 = *pfVar1;
          fVar281 = pfVar1[1];
          fVar283 = pfVar1[2];
          fVar294 = pfVar1[3];
          fVar223 = pfVar1[4];
          fVar335 = pfVar1[5];
          fVar303 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar20 + 0x21af8b4 + lVar131 * 4);
          fVar257 = *(float *)*pauVar10;
          fVar305 = *(float *)(*pauVar10 + 4);
          fVar224 = *(float *)(*pauVar10 + 8);
          fVar336 = *(float *)(*pauVar10 + 0xc);
          fVar307 = *(float *)(*pauVar10 + 0x10);
          fVar309 = *(float *)(*pauVar10 + 0x14);
          fVar225 = *(float *)(*pauVar10 + 0x18);
          auVar117 = *pauVar10;
          fVar260 = auVar217._28_4_;
          fStack_8e4 = fVar260 + *(float *)pauVar10[1];
          fVar245 = fVar260 + fStack_8e4;
          local_900._0_4_ =
               (float)local_420._0_4_ * fVar338 +
               auVar360._0_4_ * fVar221 +
               (float)local_6a0._0_4_ * fVar258 + (float)local_5c0._0_4_ * fVar257;
          local_900._4_4_ =
               (float)local_420._4_4_ * fVar219 +
               auVar360._4_4_ * fVar226 +
               (float)local_6a0._4_4_ * fVar281 + (float)local_5c0._4_4_ * fVar305;
          fStack_8f8 = fStack_418 * fVar342 +
                       auVar360._8_4_ * fVar239 + fStack_698 * fVar283 + fStack_5b8 * fVar224;
          fStack_8f4 = fStack_414 * fVar222 +
                       auVar360._12_4_ * fVar241 + fStack_694 * fVar294 + fStack_5b4 * fVar336;
          fStack_8f0 = fStack_410 * fVar205 +
                       auVar360._16_4_ * fVar243 + fStack_690 * fVar223 + fStack_5b0 * fVar307;
          fStack_8ec = fStack_40c * fVar218 +
                       auVar360._20_4_ * fVar246 + fStack_68c * fVar335 + fStack_5ac * fVar309;
          fStack_8e8 = fStack_408 * fVar220 +
                       auVar360._24_4_ * fVar256 + fStack_688 * fVar303 + fStack_5a8 * fVar225;
          fStack_8e4 = fStack_8e4 + fVar260 + fVar260 + auVar150._28_4_;
          auVar216._0_4_ =
               (float)local_220._0_4_ * fVar338 +
               fVar337 * fVar257 + (float)local_560._0_4_ * fVar258 + fVar221 * fVar367;
          auVar216._4_4_ =
               (float)local_220._4_4_ * fVar219 +
               fVar341 * fVar305 + (float)local_560._4_4_ * fVar281 + fVar226 * fVar370;
          auVar216._8_4_ =
               fStack_218 * fVar342 + fVar343 * fVar224 + fStack_558 * fVar283 + fVar239 * fVar371;
          auVar216._12_4_ =
               fStack_214 * fVar222 + fVar344 * fVar336 + fStack_554 * fVar294 + fVar241 * fVar372;
          auVar216._16_4_ =
               fStack_210 * fVar205 + fVar337 * fVar307 + fStack_550 * fVar223 + fVar243 * fVar367;
          auVar216._20_4_ =
               fStack_20c * fVar218 + fVar341 * fVar309 + fStack_54c * fVar335 + fVar246 * fVar370;
          auVar216._24_4_ =
               fStack_208 * fVar220 + fVar343 * fVar225 + fStack_548 * fVar303 + fVar256 * fVar371;
          auVar216._28_4_ = fStack_8e4 + auVar301._28_4_ + fVar260 + fVar260;
          auVar217 = ZEXT3264(auVar216);
          fVar133 = (float)local_c0._0_4_ * fVar338 +
                    (float)local_a0._0_4_ * fVar221 +
                    (float)local_80._0_4_ * fVar258 + fVar257 * (float)local_240._0_4_;
          fVar152 = (float)local_c0._4_4_ * fVar219 +
                    (float)local_a0._4_4_ * fVar226 +
                    (float)local_80._4_4_ * fVar281 + fVar305 * (float)local_240._4_4_;
          fVar156 = fStack_b8 * fVar342 +
                    fStack_98 * fVar239 + fStack_78 * fVar283 + fVar224 * fStack_238;
          fVar159 = fStack_b4 * fVar222 +
                    fStack_94 * fVar241 + fStack_74 * fVar294 + fVar336 * fStack_234;
          fVar162 = fStack_b0 * fVar205 +
                    fStack_90 * fVar243 + fStack_70 * fVar223 + fVar307 * fStack_230;
          fVar165 = fStack_ac * fVar218 +
                    fStack_8c * fVar246 + fStack_6c * fVar335 + fVar309 * fStack_22c;
          fVar169 = fStack_a8 * fVar220 +
                    fStack_88 * fVar256 + fStack_68 * fVar303 + fVar225 * fStack_228;
          fVar172 = fStack_8e4 + fVar245;
          auVar121 = *(undefined1 (*) [24])(bspline_basis1 + lVar131 * 4 + lVar20);
          uVar107 = *(undefined8 *)((undefined1 (*) [24])(bspline_basis1 + lVar131 * 4 + lVar20))[1]
          ;
          pfVar1 = (float *)(lVar20 + 0x21b13cc + lVar131 * 4);
          fVar305 = *pfVar1;
          fVar224 = pfVar1[1];
          fVar336 = pfVar1[2];
          fVar307 = pfVar1[3];
          fVar309 = pfVar1[4];
          fVar225 = pfVar1[5];
          fVar260 = pfVar1[6];
          auVar253 = *(undefined1 (*) [32])(lVar20 + 0x21b1850 + lVar131 * 4);
          auVar150 = ZEXT3264(auVar253);
          pfVar1 = (float *)(lVar20 + 0x21b1cd4 + lVar131 * 4);
          fVar261 = *pfVar1;
          fVar262 = pfVar1[1];
          fVar155 = pfVar1[2];
          fVar364 = pfVar1[3];
          fVar365 = pfVar1[4];
          fVar366 = pfVar1[5];
          fVar168 = pfVar1[6];
          fVar257 = auVar360._28_4_;
          fVar338 = auVar253._0_4_;
          fVar342 = auVar253._4_4_;
          fVar205 = auVar253._8_4_;
          fVar220 = auVar253._12_4_;
          fVar226 = auVar253._16_4_;
          fVar241 = auVar253._20_4_;
          fVar246 = auVar253._24_4_;
          fVar245 = fVar344 + fVar344 + fVar245;
          local_7e0._0_4_ = auVar121._0_4_;
          local_7e0._4_4_ = auVar121._4_4_;
          fStack_7d8 = auVar121._8_4_;
          fStack_7d4 = auVar121._12_4_;
          fStack_7d0 = auVar121._16_4_;
          fStack_7cc = auVar121._20_4_;
          fStack_7c8 = (float)uVar107;
          fStack_7c4 = (float)((ulong)uVar107 >> 0x20);
          auVar271._0_4_ =
               (float)local_420._0_4_ * (float)local_7e0 +
               fVar305 * auVar360._0_4_ +
               (float)local_6a0._0_4_ * fVar338 + (float)local_5c0._0_4_ * fVar261;
          auVar271._4_4_ =
               (float)local_420._4_4_ * local_7e0._4_4_ +
               fVar224 * auVar360._4_4_ +
               (float)local_6a0._4_4_ * fVar342 + (float)local_5c0._4_4_ * fVar262;
          auVar271._8_4_ =
               fStack_418 * fStack_7d8 +
               fVar336 * auVar360._8_4_ + fStack_698 * fVar205 + fStack_5b8 * fVar155;
          auVar271._12_4_ =
               fStack_414 * fStack_7d4 +
               fVar307 * auVar360._12_4_ + fStack_694 * fVar220 + fStack_5b4 * fVar364;
          auVar271._16_4_ =
               fStack_410 * fStack_7d0 +
               fVar309 * auVar360._16_4_ + fStack_690 * fVar226 + fStack_5b0 * fVar365;
          auVar271._20_4_ =
               fStack_40c * fStack_7cc +
               fVar225 * auVar360._20_4_ + fStack_68c * fVar241 + fStack_5ac * fVar366;
          auVar271._24_4_ =
               fStack_408 * fStack_7c8 +
               fVar260 * auVar360._24_4_ + fStack_688 * fVar246 + fStack_5a8 * fVar168;
          auVar271._28_4_ = fVar344 + pfVar1[7] + fVar245;
          auVar254._0_4_ =
               (float)local_220._0_4_ * (float)local_7e0 +
               fVar367 * fVar305 + (float)local_560._0_4_ * fVar338 + fVar337 * fVar261;
          auVar254._4_4_ =
               (float)local_220._4_4_ * local_7e0._4_4_ +
               fVar370 * fVar224 + (float)local_560._4_4_ * fVar342 + fVar341 * fVar262;
          auVar254._8_4_ =
               fStack_218 * fStack_7d8 +
               fVar371 * fVar336 + fStack_558 * fVar205 + fVar343 * fVar155;
          auVar254._12_4_ =
               fStack_214 * fStack_7d4 +
               fVar372 * fVar307 + fStack_554 * fVar220 + fVar344 * fVar364;
          auVar254._16_4_ =
               fStack_210 * fStack_7d0 +
               fVar367 * fVar309 + fStack_550 * fVar226 + fVar337 * fVar365;
          auVar254._20_4_ =
               fStack_20c * fStack_7cc +
               fVar370 * fVar225 + fStack_54c * fVar241 + fVar341 * fVar366;
          auVar254._24_4_ =
               fStack_208 * fStack_7c8 +
               fVar371 * fVar260 + fStack_548 * fVar246 + fVar343 * fVar168;
          auVar254._28_4_ = fVar245 + fVar344 + fVar344 + fVar257;
          auVar299._0_4_ =
               (float)local_a0._0_4_ * fVar305 +
               (float)local_80._0_4_ * fVar338 + fVar261 * (float)local_240._0_4_ +
               (float)local_7e0 * (float)local_c0._0_4_;
          auVar299._4_4_ =
               (float)local_a0._4_4_ * fVar224 +
               (float)local_80._4_4_ * fVar342 + fVar262 * (float)local_240._4_4_ +
               local_7e0._4_4_ * (float)local_c0._4_4_;
          auVar299._8_4_ =
               fStack_98 * fVar336 + fStack_78 * fVar205 + fVar155 * fStack_238 +
               fStack_7d8 * fStack_b8;
          auVar299._12_4_ =
               fStack_94 * fVar307 + fStack_74 * fVar220 + fVar364 * fStack_234 +
               fStack_7d4 * fStack_b4;
          auVar299._16_4_ =
               fStack_90 * fVar309 + fStack_70 * fVar226 + fVar365 * fStack_230 +
               fStack_7d0 * fStack_b0;
          auVar299._20_4_ =
               fStack_8c * fVar225 + fStack_6c * fVar241 + fVar366 * fStack_22c +
               fStack_7cc * fStack_ac;
          auVar299._24_4_ =
               fStack_88 * fVar260 + fStack_68 * fVar246 + fVar168 * fStack_228 +
               fStack_7c8 * fStack_a8;
          auVar299._28_4_ = fVar344 + fVar344 + pfVar1[7] + fVar245;
          auVar301 = ZEXT3264(auVar299);
          auVar28 = vsubps_avx(auVar271,_local_900);
          auVar27 = vsubps_avx(auVar254,auVar216);
          fVar219 = auVar28._0_4_;
          fVar222 = auVar28._4_4_;
          auVar64._4_4_ = auVar216._4_4_ * fVar222;
          auVar64._0_4_ = auVar216._0_4_ * fVar219;
          fVar218 = auVar28._8_4_;
          auVar64._8_4_ = auVar216._8_4_ * fVar218;
          fVar221 = auVar28._12_4_;
          auVar64._12_4_ = auVar216._12_4_ * fVar221;
          fVar239 = auVar28._16_4_;
          auVar64._16_4_ = auVar216._16_4_ * fVar239;
          fVar243 = auVar28._20_4_;
          auVar64._20_4_ = auVar216._20_4_ * fVar243;
          fVar256 = auVar28._24_4_;
          auVar64._24_4_ = auVar216._24_4_ * fVar256;
          auVar64._28_4_ = fVar245;
          fVar245 = auVar27._0_4_;
          fVar153 = auVar27._4_4_;
          auVar65._4_4_ = fVar153 * (float)local_900._4_4_;
          auVar65._0_4_ = fVar245 * (float)local_900._0_4_;
          fVar157 = auVar27._8_4_;
          auVar65._8_4_ = fVar157 * fStack_8f8;
          fVar160 = auVar27._12_4_;
          auVar65._12_4_ = fVar160 * fStack_8f4;
          fVar163 = auVar27._16_4_;
          auVar65._16_4_ = fVar163 * fStack_8f0;
          fVar166 = auVar27._20_4_;
          auVar65._20_4_ = fVar166 * fStack_8ec;
          fVar170 = auVar27._24_4_;
          auVar65._24_4_ = fVar170 * fStack_8e8;
          auVar65._28_4_ = auVar254._28_4_;
          auVar33 = vsubps_avx(auVar64,auVar65);
          auVar111._4_4_ = fVar152;
          auVar111._0_4_ = fVar133;
          auVar111._8_4_ = fVar156;
          auVar111._12_4_ = fVar159;
          auVar111._16_4_ = fVar162;
          auVar111._20_4_ = fVar165;
          auVar111._24_4_ = fVar169;
          auVar111._28_4_ = fVar172;
          auVar21 = vmaxps_avx(auVar111,auVar299);
          auVar66._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar222 * fVar222 + fVar153 * fVar153);
          auVar66._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar219 * fVar219 + fVar245 * fVar245);
          auVar66._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar218 * fVar218 + fVar157 * fVar157);
          auVar66._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar221 * fVar221 + fVar160 * fVar160)
          ;
          auVar66._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar239 * fVar239 + fVar163 * fVar163)
          ;
          auVar66._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar243 * fVar243 + fVar166 * fVar166)
          ;
          auVar66._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar256 * fVar256 + fVar170 * fVar170)
          ;
          auVar66._28_4_ = auVar271._28_4_ + auVar254._28_4_;
          auVar67._4_4_ = auVar33._4_4_ * auVar33._4_4_;
          auVar67._0_4_ = auVar33._0_4_ * auVar33._0_4_;
          auVar67._8_4_ = auVar33._8_4_ * auVar33._8_4_;
          auVar67._12_4_ = auVar33._12_4_ * auVar33._12_4_;
          auVar67._16_4_ = auVar33._16_4_ * auVar33._16_4_;
          auVar67._20_4_ = auVar33._20_4_ * auVar33._20_4_;
          auVar67._24_4_ = auVar33._24_4_ * auVar33._24_4_;
          auVar67._28_4_ = auVar33._28_4_;
          auVar21 = vcmpps_avx(auVar67,auVar66,2);
          local_380 = (uint)lVar131;
          auVar197 = vpshufd_avx(ZEXT416(local_380),0);
          auVar248 = vpor_avx(auVar197,_DAT_01f7fcf0);
          auVar197 = vpor_avx(auVar197,_DAT_01fafea0);
          auVar248 = vpcmpgtd_avx(_local_4a0,auVar248);
          auVar197 = vpcmpgtd_avx(_local_4a0,auVar197);
          auVar202._16_16_ = auVar197;
          auVar202._0_16_ = auVar248;
          auVar33 = auVar202 & auVar21;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar360 = ZEXT3264(auVar360._0_32_);
          }
          else {
            fVar245 = (float)local_7e0 * (float)local_260._0_4_ +
                      fVar305 * (float)local_480._0_4_ +
                      (float)local_440._0_4_ * fVar338 + (float)local_460._0_4_ * fVar261;
            fVar153 = local_7e0._4_4_ * (float)local_260._4_4_ +
                      fVar224 * (float)local_480._4_4_ +
                      (float)local_440._4_4_ * fVar342 + (float)local_460._4_4_ * fVar262;
            fVar157 = fStack_7d8 * fStack_258 +
                      fVar336 * fStack_478 + fStack_438 * fVar205 + fStack_458 * fVar155;
            fVar160 = fStack_7d4 * fStack_254 +
                      fVar307 * fStack_474 + fStack_434 * fVar220 + fStack_454 * fVar364;
            fVar163 = fStack_7d0 * fStack_250 +
                      fVar309 * fStack_470 + fStack_430 * fVar226 + fStack_450 * fVar365;
            fVar166 = fStack_7cc * fStack_24c +
                      fVar225 * fStack_46c + fStack_42c * fVar241 + fStack_44c * fVar366;
            fVar170 = fStack_7c8 * fStack_248 +
                      fVar260 * fStack_468 + fStack_428 * fVar246 + fStack_448 * fVar168;
            fVar173 = fStack_7c4 + auVar253._28_4_ + fVar257 + 0.0;
            local_6e0._0_4_ = auVar119._0_4_;
            local_6e0._4_4_ = auVar119._4_4_;
            uStack_6d8._0_4_ = auVar119._8_4_;
            uStack_6d8._4_4_ = auVar119._12_4_;
            uStack_6d0._0_4_ = auVar119._16_4_;
            uStack_6d0._4_4_ = auVar119._20_4_;
            uStack_6c8._0_4_ = auVar119._24_4_;
            local_7a0._0_4_ = auVar117._0_4_;
            local_7a0._4_4_ = auVar117._4_4_;
            uStack_798._0_4_ = auVar117._8_4_;
            uStack_798._4_4_ = auVar117._12_4_;
            fStack_790 = auVar117._16_4_;
            fStack_78c = auVar117._20_4_;
            fStack_788 = auVar117._24_4_;
            fVar265 = (float)local_460._0_4_ * (float)local_7a0._0_4_;
            fVar274 = (float)local_460._4_4_ * (float)local_7a0._4_4_;
            fVar276 = fStack_458 * (float)uStack_798;
            fVar278 = fStack_454 * uStack_798._4_4_;
            fVar279 = fStack_450 * fStack_790;
            fVar280 = fStack_44c * fStack_78c;
            fVar282 = fStack_448 * fStack_788;
            pfVar1 = (float *)(lVar20 + 0x21b0640 + lVar131 * 4);
            fVar338 = *pfVar1;
            fVar219 = pfVar1[1];
            fVar342 = pfVar1[2];
            fVar222 = pfVar1[3];
            fVar205 = pfVar1[4];
            fVar218 = pfVar1[5];
            fVar220 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b0ac4 + lVar131 * 4);
            fVar221 = *pfVar2;
            fVar226 = pfVar2[1];
            fVar239 = pfVar2[2];
            fVar241 = pfVar2[3];
            fVar243 = pfVar2[4];
            fVar246 = pfVar2[5];
            fVar256 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21b01bc + lVar131 * 4);
            fVar305 = *pfVar3;
            fVar224 = pfVar3[1];
            fVar336 = pfVar3[2];
            fVar307 = pfVar3[3];
            fVar309 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar260 = pfVar3[6];
            fVar174 = pfVar1[7] + pfVar2[7];
            fVar190 = pfVar2[7] + fStack_544 + 0.0;
            fVar284 = fStack_544 + fStack_404 + fStack_544 + 0.0;
            pfVar1 = (float *)(lVar20 + 0x21afd38 + lVar131 * 4);
            fVar261 = *pfVar1;
            fVar262 = pfVar1[1];
            fVar155 = pfVar1[2];
            fVar364 = pfVar1[3];
            fVar365 = pfVar1[4];
            fVar366 = pfVar1[5];
            fVar168 = pfVar1[6];
            local_7a0._4_4_ =
                 (float)local_420._4_4_ * fVar262 +
                 fVar224 * fVar240 +
                 (float)local_6a0._4_4_ * fVar219 + (float)local_5c0._4_4_ * fVar226;
            local_7a0._0_4_ =
                 (float)local_420._0_4_ * fVar261 +
                 fVar305 * fVar227 +
                 (float)local_6a0._0_4_ * fVar338 + (float)local_5c0._0_4_ * fVar221;
            uStack_798._0_4_ =
                 fStack_418 * fVar155 +
                 fVar336 * fVar242 + fStack_698 * fVar342 + fStack_5b8 * fVar239;
            uStack_798._4_4_ =
                 fStack_414 * fVar364 +
                 fVar307 * fVar244 + fStack_694 * fVar222 + fStack_5b4 * fVar241;
            fStack_790 = fStack_410 * fVar365 +
                         fVar309 * fVar227 + fStack_690 * fVar205 + fStack_5b0 * fVar243;
            fStack_78c = fStack_40c * fVar366 +
                         fVar225 * fVar240 + fStack_68c * fVar218 + fStack_5ac * fVar246;
            fStack_788 = fStack_408 * fVar168 +
                         fVar260 * fVar242 + fStack_688 * fVar220 + fStack_5a8 * fVar256;
            fStack_784 = fVar174 + fVar190;
            auVar185._0_4_ =
                 (float)local_220._0_4_ * fVar261 +
                 (float)local_560._0_4_ * fVar338 + fVar221 * fVar337 + fVar305 * fVar367;
            auVar185._4_4_ =
                 (float)local_220._4_4_ * fVar262 +
                 (float)local_560._4_4_ * fVar219 + fVar226 * fVar341 + fVar224 * fVar370;
            auVar185._8_4_ =
                 fStack_218 * fVar155 + fStack_558 * fVar342 + fVar239 * fVar343 + fVar336 * fVar371
            ;
            auVar185._12_4_ =
                 fStack_214 * fVar364 + fStack_554 * fVar222 + fVar241 * fVar344 + fVar307 * fVar372
            ;
            auVar185._16_4_ =
                 fStack_210 * fVar365 + fStack_550 * fVar205 + fVar243 * fVar337 + fVar309 * fVar367
            ;
            auVar185._20_4_ =
                 fStack_20c * fVar366 + fStack_54c * fVar218 + fVar246 * fVar341 + fVar225 * fVar370
            ;
            auVar185._24_4_ =
                 fStack_208 * fVar168 + fStack_548 * fVar220 + fVar256 * fVar343 + fVar260 * fVar371
            ;
            auVar185._28_4_ = fVar190 + fVar284;
            auVar353._0_4_ =
                 fVar305 * (float)local_480._0_4_ +
                 (float)local_440._0_4_ * fVar338 + (float)local_460._0_4_ * fVar221 +
                 fVar261 * (float)local_260._0_4_;
            auVar353._4_4_ =
                 fVar224 * (float)local_480._4_4_ +
                 (float)local_440._4_4_ * fVar219 + (float)local_460._4_4_ * fVar226 +
                 fVar262 * (float)local_260._4_4_;
            auVar353._8_4_ =
                 fVar336 * fStack_478 + fStack_438 * fVar342 + fStack_458 * fVar239 +
                 fVar155 * fStack_258;
            auVar353._12_4_ =
                 fVar307 * fStack_474 + fStack_434 * fVar222 + fStack_454 * fVar241 +
                 fVar364 * fStack_254;
            auVar353._16_4_ =
                 fVar309 * fStack_470 + fStack_430 * fVar205 + fStack_450 * fVar243 +
                 fVar365 * fStack_250;
            auVar353._20_4_ =
                 fVar225 * fStack_46c + fStack_42c * fVar218 + fStack_44c * fVar246 +
                 fVar366 * fStack_24c;
            auVar353._24_4_ =
                 fVar260 * fStack_468 + fStack_428 * fVar220 + fStack_448 * fVar256 +
                 fVar168 * fStack_248;
            auVar353._28_4_ = pfVar3[7] + fVar174 + fVar284;
            pfVar1 = (float *)(lVar20 + 0x21b2a60 + lVar131 * 4);
            fVar338 = *pfVar1;
            fVar219 = pfVar1[1];
            fVar342 = pfVar1[2];
            fVar222 = pfVar1[3];
            fVar205 = pfVar1[4];
            fVar218 = pfVar1[5];
            fVar220 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b2ee4 + lVar131 * 4);
            fVar221 = *pfVar2;
            fVar226 = pfVar2[1];
            fVar239 = pfVar2[2];
            fVar241 = pfVar2[3];
            fVar243 = pfVar2[4];
            fVar246 = pfVar2[5];
            fVar256 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21b25dc + lVar131 * 4);
            fVar305 = *pfVar3;
            fVar224 = pfVar3[1];
            fVar336 = pfVar3[2];
            fVar307 = pfVar3[3];
            fVar309 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar260 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x21b2158 + lVar131 * 4);
            fVar261 = *pfVar4;
            fVar262 = pfVar4[1];
            fVar155 = pfVar4[2];
            fVar364 = pfVar4[3];
            fVar365 = pfVar4[4];
            fVar366 = pfVar4[5];
            fVar168 = pfVar4[6];
            auVar316._0_4_ =
                 fVar261 * (float)local_420._0_4_ +
                 fVar305 * fVar227 +
                 (float)local_6a0._0_4_ * fVar338 + (float)local_5c0._0_4_ * fVar221;
            auVar316._4_4_ =
                 fVar262 * (float)local_420._4_4_ +
                 fVar224 * fVar240 +
                 (float)local_6a0._4_4_ * fVar219 + (float)local_5c0._4_4_ * fVar226;
            auVar316._8_4_ =
                 fVar155 * fStack_418 +
                 fVar336 * fVar242 + fStack_698 * fVar342 + fStack_5b8 * fVar239;
            auVar316._12_4_ =
                 fVar364 * fStack_414 +
                 fVar307 * fVar244 + fStack_694 * fVar222 + fStack_5b4 * fVar241;
            auVar316._16_4_ =
                 fVar365 * fStack_410 +
                 fVar309 * fVar227 + fStack_690 * fVar205 + fStack_5b0 * fVar243;
            auVar316._20_4_ =
                 fVar366 * fStack_40c +
                 fVar225 * fVar240 + fStack_68c * fVar218 + fStack_5ac * fVar246;
            auVar316._24_4_ =
                 fVar168 * fStack_408 +
                 fVar260 * fVar242 + fStack_688 * fVar220 + fStack_5a8 * fVar256;
            auVar316._28_4_ = fStack_5a4 + fStack_5a4 + fStack_404 + fStack_5a4;
            auVar349._0_4_ =
                 fVar261 * (float)local_220._0_4_ +
                 fVar305 * fVar367 + fVar338 * (float)local_560._0_4_ + fVar221 * fVar337;
            auVar349._4_4_ =
                 fVar262 * (float)local_220._4_4_ +
                 fVar224 * fVar370 + fVar219 * (float)local_560._4_4_ + fVar226 * fVar341;
            auVar349._8_4_ =
                 fVar155 * fStack_218 + fVar336 * fVar371 + fVar342 * fStack_558 + fVar239 * fVar343
            ;
            auVar349._12_4_ =
                 fVar364 * fStack_214 + fVar307 * fVar372 + fVar222 * fStack_554 + fVar241 * fVar344
            ;
            auVar349._16_4_ =
                 fVar365 * fStack_210 + fVar309 * fVar367 + fVar205 * fStack_550 + fVar243 * fVar337
            ;
            auVar349._20_4_ =
                 fVar366 * fStack_20c + fVar225 * fVar370 + fVar218 * fStack_54c + fVar246 * fVar341
            ;
            auVar349._24_4_ =
                 fVar168 * fStack_208 + fVar260 * fVar371 + fVar220 * fStack_548 + fVar256 * fVar343
            ;
            auVar349._28_4_ = fStack_5a4 + fStack_5a4 + fStack_204 + fStack_5a4;
            auVar255._8_4_ = 0x7fffffff;
            auVar255._0_8_ = 0x7fffffff7fffffff;
            auVar255._12_4_ = 0x7fffffff;
            auVar255._16_4_ = 0x7fffffff;
            auVar255._20_4_ = 0x7fffffff;
            auVar255._24_4_ = 0x7fffffff;
            auVar255._28_4_ = 0x7fffffff;
            auVar253 = vandps_avx(_local_7a0,auVar255);
            auVar33 = vandps_avx(auVar185,auVar255);
            auVar33 = vmaxps_avx(auVar253,auVar33);
            auVar253 = vandps_avx(auVar353,auVar255);
            auVar33 = vmaxps_avx(auVar33,auVar253);
            auVar33 = vcmpps_avx(auVar33,local_4c0,1);
            auVar326 = vblendvps_avx(_local_7a0,auVar28,auVar33);
            auVar146._0_4_ =
                 fVar261 * (float)local_260._0_4_ +
                 fVar305 * (float)local_480._0_4_ +
                 (float)local_460._0_4_ * fVar221 + (float)local_440._0_4_ * fVar338;
            auVar146._4_4_ =
                 fVar262 * (float)local_260._4_4_ +
                 fVar224 * (float)local_480._4_4_ +
                 (float)local_460._4_4_ * fVar226 + (float)local_440._4_4_ * fVar219;
            auVar146._8_4_ =
                 fVar155 * fStack_258 +
                 fVar336 * fStack_478 + fStack_458 * fVar239 + fStack_438 * fVar342;
            auVar146._12_4_ =
                 fVar364 * fStack_254 +
                 fVar307 * fStack_474 + fStack_454 * fVar241 + fStack_434 * fVar222;
            auVar146._16_4_ =
                 fVar365 * fStack_250 +
                 fVar309 * fStack_470 + fStack_450 * fVar243 + fStack_430 * fVar205;
            auVar146._20_4_ =
                 fVar366 * fStack_24c +
                 fVar225 * fStack_46c + fStack_44c * fVar246 + fStack_42c * fVar218;
            auVar146._24_4_ =
                 fVar168 * fStack_248 +
                 fVar260 * fStack_468 + fStack_448 * fVar256 + fStack_428 * fVar220;
            auVar146._28_4_ = auVar253._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar212 = vblendvps_avx(auVar185,auVar27,auVar33);
            auVar253 = vandps_avx(auVar316,auVar255);
            auVar33 = vandps_avx(auVar349,auVar255);
            auVar141 = vmaxps_avx(auVar253,auVar33);
            auVar253 = vandps_avx(auVar146,auVar255);
            auVar253 = vmaxps_avx(auVar141,auVar253);
            local_780._0_4_ = auVar120._0_4_;
            local_780._4_4_ = auVar120._4_4_;
            uStack_778._0_4_ = auVar120._8_4_;
            uStack_778._4_4_ = auVar120._12_4_;
            fStack_770 = auVar120._16_4_;
            fStack_76c = auVar120._20_4_;
            fStack_768 = auVar120._24_4_;
            auVar33 = vcmpps_avx(auVar253,local_4c0,1);
            auVar253 = vblendvps_avx(auVar316,auVar28,auVar33);
            auVar147._0_4_ =
                 (float)local_260._0_4_ * (float)local_780._0_4_ +
                 (float)local_480._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_440._0_4_ * fVar258 + fVar265;
            auVar147._4_4_ =
                 (float)local_260._4_4_ * (float)local_780._4_4_ +
                 (float)local_480._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_440._4_4_ * fVar281 + fVar274;
            auVar147._8_4_ =
                 fStack_258 * (float)uStack_778 +
                 fStack_478 * (float)uStack_6d8 + fStack_438 * fVar283 + fVar276;
            auVar147._12_4_ =
                 fStack_254 * uStack_778._4_4_ +
                 fStack_474 * uStack_6d8._4_4_ + fStack_434 * fVar294 + fVar278;
            auVar147._16_4_ =
                 fStack_250 * fStack_770 +
                 fStack_470 * (float)uStack_6d0 + fStack_430 * fVar223 + fVar279;
            auVar147._20_4_ =
                 fStack_24c * fStack_76c +
                 fStack_46c * uStack_6d0._4_4_ + fStack_42c * fVar335 + fVar280;
            auVar147._24_4_ =
                 fStack_248 * fStack_768 +
                 fStack_468 * (float)uStack_6c8 + fStack_428 * fVar303 + fVar282;
            auVar147._28_4_ = auVar141._28_4_ + fVar173 + fVar257 + 0.0;
            auVar28 = vblendvps_avx(auVar349,auVar27,auVar33);
            fVar274 = auVar326._0_4_;
            fVar276 = auVar326._4_4_;
            fVar278 = auVar326._8_4_;
            fVar279 = auVar326._12_4_;
            fVar280 = auVar326._16_4_;
            fVar282 = auVar326._20_4_;
            fVar284 = auVar326._24_4_;
            fVar259 = auVar326._28_4_;
            fVar294 = auVar253._0_4_;
            fVar335 = auVar253._4_4_;
            fVar305 = auVar253._8_4_;
            fVar336 = auVar253._12_4_;
            fVar309 = auVar253._16_4_;
            fVar260 = auVar253._20_4_;
            fVar262 = auVar253._24_4_;
            fVar338 = auVar212._0_4_;
            fVar342 = auVar212._4_4_;
            fVar205 = auVar212._8_4_;
            fVar220 = auVar212._12_4_;
            fVar226 = auVar212._16_4_;
            fVar241 = auVar212._20_4_;
            fVar246 = auVar212._24_4_;
            auVar327._0_4_ = fVar338 * fVar338 + fVar274 * fVar274;
            auVar327._4_4_ = fVar342 * fVar342 + fVar276 * fVar276;
            auVar327._8_4_ = fVar205 * fVar205 + fVar278 * fVar278;
            auVar327._12_4_ = fVar220 * fVar220 + fVar279 * fVar279;
            auVar327._16_4_ = fVar226 * fVar226 + fVar280 * fVar280;
            auVar327._20_4_ = fVar241 * fVar241 + fVar282 * fVar282;
            auVar327._24_4_ = fVar246 * fVar246 + fVar284 * fVar284;
            auVar327._28_4_ = auVar27._28_4_ + fStack_684;
            auVar27 = vrsqrtps_avx(auVar327);
            fVar219 = auVar27._0_4_;
            fVar222 = auVar27._4_4_;
            auVar68._4_4_ = fVar222 * 1.5;
            auVar68._0_4_ = fVar219 * 1.5;
            fVar218 = auVar27._8_4_;
            auVar68._8_4_ = fVar218 * 1.5;
            fVar221 = auVar27._12_4_;
            auVar68._12_4_ = fVar221 * 1.5;
            fVar239 = auVar27._16_4_;
            auVar68._16_4_ = fVar239 * 1.5;
            fVar243 = auVar27._20_4_;
            auVar68._20_4_ = fVar243 * 1.5;
            fVar256 = auVar27._24_4_;
            auVar68._24_4_ = fVar256 * 1.5;
            auVar68._28_4_ = auVar349._28_4_;
            auVar69._4_4_ = fVar222 * fVar222 * fVar222 * auVar327._4_4_ * 0.5;
            auVar69._0_4_ = fVar219 * fVar219 * fVar219 * auVar327._0_4_ * 0.5;
            auVar69._8_4_ = fVar218 * fVar218 * fVar218 * auVar327._8_4_ * 0.5;
            auVar69._12_4_ = fVar221 * fVar221 * fVar221 * auVar327._12_4_ * 0.5;
            auVar69._16_4_ = fVar239 * fVar239 * fVar239 * auVar327._16_4_ * 0.5;
            auVar69._20_4_ = fVar243 * fVar243 * fVar243 * auVar327._20_4_ * 0.5;
            auVar69._24_4_ = fVar256 * fVar256 * fVar256 * auVar327._24_4_ * 0.5;
            auVar69._28_4_ = auVar327._28_4_;
            auVar33 = vsubps_avx(auVar68,auVar69);
            fVar364 = auVar33._0_4_;
            fVar365 = auVar33._4_4_;
            fVar366 = auVar33._8_4_;
            fVar168 = auVar33._12_4_;
            fVar174 = auVar33._16_4_;
            fVar190 = auVar33._20_4_;
            fVar265 = auVar33._24_4_;
            fVar219 = auVar28._0_4_;
            fVar222 = auVar28._4_4_;
            fVar218 = auVar28._8_4_;
            fVar221 = auVar28._12_4_;
            fVar239 = auVar28._16_4_;
            fVar243 = auVar28._20_4_;
            fVar256 = auVar28._24_4_;
            auVar300._0_4_ = fVar219 * fVar219 + fVar294 * fVar294;
            auVar300._4_4_ = fVar222 * fVar222 + fVar335 * fVar335;
            auVar300._8_4_ = fVar218 * fVar218 + fVar305 * fVar305;
            auVar300._12_4_ = fVar221 * fVar221 + fVar336 * fVar336;
            auVar300._16_4_ = fVar239 * fVar239 + fVar309 * fVar309;
            auVar300._20_4_ = fVar243 * fVar243 + fVar260 * fVar260;
            auVar300._24_4_ = fVar256 * fVar256 + fVar262 * fVar262;
            auVar300._28_4_ = auVar27._28_4_ + auVar253._28_4_;
            auVar253 = vrsqrtps_avx(auVar300);
            fVar257 = auVar253._0_4_;
            fVar258 = auVar253._4_4_;
            auVar70._4_4_ = fVar258 * 1.5;
            auVar70._0_4_ = fVar257 * 1.5;
            fVar281 = auVar253._8_4_;
            auVar70._8_4_ = fVar281 * 1.5;
            fVar283 = auVar253._12_4_;
            auVar70._12_4_ = fVar283 * 1.5;
            fVar223 = auVar253._16_4_;
            auVar70._16_4_ = fVar223 * 1.5;
            fVar303 = auVar253._20_4_;
            auVar70._20_4_ = fVar303 * 1.5;
            fVar224 = auVar253._24_4_;
            auVar70._24_4_ = fVar224 * 1.5;
            auVar70._28_4_ = auVar349._28_4_;
            auVar71._4_4_ = fVar258 * fVar258 * fVar258 * auVar300._4_4_ * 0.5;
            auVar71._0_4_ = fVar257 * fVar257 * fVar257 * auVar300._0_4_ * 0.5;
            auVar71._8_4_ = fVar281 * fVar281 * fVar281 * auVar300._8_4_ * 0.5;
            auVar71._12_4_ = fVar283 * fVar283 * fVar283 * auVar300._12_4_ * 0.5;
            auVar71._16_4_ = fVar223 * fVar223 * fVar223 * auVar300._16_4_ * 0.5;
            auVar71._20_4_ = fVar303 * fVar303 * fVar303 * auVar300._20_4_ * 0.5;
            auVar71._24_4_ = fVar224 * fVar224 * fVar224 * auVar300._24_4_ * 0.5;
            auVar71._28_4_ = auVar300._28_4_;
            auVar28 = vsubps_avx(auVar70,auVar71);
            fVar223 = auVar28._0_4_;
            fVar303 = auVar28._4_4_;
            fVar224 = auVar28._8_4_;
            fVar307 = auVar28._12_4_;
            fVar225 = auVar28._16_4_;
            fVar261 = auVar28._20_4_;
            fVar155 = auVar28._24_4_;
            fVar338 = fVar133 * fVar364 * fVar338;
            fVar342 = fVar152 * fVar365 * fVar342;
            auVar72._4_4_ = fVar342;
            auVar72._0_4_ = fVar338;
            fVar205 = fVar156 * fVar366 * fVar205;
            auVar72._8_4_ = fVar205;
            fVar220 = fVar159 * fVar168 * fVar220;
            auVar72._12_4_ = fVar220;
            fVar226 = fVar162 * fVar174 * fVar226;
            auVar72._16_4_ = fVar226;
            fVar241 = fVar165 * fVar190 * fVar241;
            auVar72._20_4_ = fVar241;
            fVar246 = fVar169 * fVar265 * fVar246;
            auVar72._24_4_ = fVar246;
            auVar72._28_4_ = auVar253._28_4_;
            local_780._4_4_ = fVar342 + (float)local_900._4_4_;
            local_780._0_4_ = fVar338 + (float)local_900._0_4_;
            uStack_778._0_4_ = fVar205 + fStack_8f8;
            uStack_778._4_4_ = fVar220 + fStack_8f4;
            fStack_770 = fVar226 + fStack_8f0;
            fStack_76c = fVar241 + fStack_8ec;
            fStack_768 = fVar246 + fStack_8e8;
            fStack_764 = auVar253._28_4_ + fStack_8e4;
            fVar226 = fVar133 * fVar364 * -fVar274;
            fVar241 = fVar152 * fVar365 * -fVar276;
            auVar73._4_4_ = fVar241;
            auVar73._0_4_ = fVar226;
            fVar246 = fVar156 * fVar366 * -fVar278;
            auVar73._8_4_ = fVar246;
            fVar257 = fVar159 * fVar168 * -fVar279;
            auVar73._12_4_ = fVar257;
            fVar258 = fVar162 * fVar174 * -fVar280;
            auVar73._16_4_ = fVar258;
            fVar281 = fVar165 * fVar190 * -fVar282;
            auVar73._20_4_ = fVar281;
            fVar283 = fVar169 * fVar265 * -fVar284;
            auVar73._24_4_ = fVar283;
            auVar73._28_4_ = -fVar259;
            fVar338 = fVar364 * 0.0 * fVar133;
            fVar342 = fVar365 * 0.0 * fVar152;
            auVar74._4_4_ = fVar342;
            auVar74._0_4_ = fVar338;
            fVar205 = fVar366 * 0.0 * fVar156;
            auVar74._8_4_ = fVar205;
            fVar220 = fVar168 * 0.0 * fVar159;
            auVar74._12_4_ = fVar220;
            fVar364 = fVar174 * 0.0 * fVar162;
            auVar74._16_4_ = fVar364;
            fVar365 = fVar190 * 0.0 * fVar165;
            auVar74._20_4_ = fVar365;
            fVar366 = fVar265 * 0.0 * fVar169;
            auVar74._24_4_ = fVar366;
            auVar74._28_4_ = fVar259;
            auVar253 = vsubps_avx(_local_900,auVar72);
            auVar369._0_4_ = fVar338 + auVar147._0_4_;
            auVar369._4_4_ = fVar342 + auVar147._4_4_;
            auVar369._8_4_ = fVar205 + auVar147._8_4_;
            auVar369._12_4_ = fVar220 + auVar147._12_4_;
            auVar369._16_4_ = fVar364 + auVar147._16_4_;
            auVar369._20_4_ = fVar365 + auVar147._20_4_;
            auVar369._24_4_ = fVar366 + auVar147._24_4_;
            auVar369._28_4_ = fVar259 + auVar147._28_4_;
            fVar338 = auVar299._0_4_ * fVar223 * fVar219;
            fVar219 = auVar299._4_4_ * fVar303 * fVar222;
            auVar75._4_4_ = fVar219;
            auVar75._0_4_ = fVar338;
            fVar342 = auVar299._8_4_ * fVar224 * fVar218;
            auVar75._8_4_ = fVar342;
            fVar222 = auVar299._12_4_ * fVar307 * fVar221;
            auVar75._12_4_ = fVar222;
            fVar205 = auVar299._16_4_ * fVar225 * fVar239;
            auVar75._16_4_ = fVar205;
            fVar218 = auVar299._20_4_ * fVar261 * fVar243;
            auVar75._20_4_ = fVar218;
            fVar220 = auVar299._24_4_ * fVar155 * fVar256;
            auVar75._24_4_ = fVar220;
            auVar75._28_4_ = fStack_8e4;
            auVar346 = vsubps_avx(auVar216,auVar73);
            auVar354._0_4_ = auVar271._0_4_ + fVar338;
            auVar354._4_4_ = auVar271._4_4_ + fVar219;
            auVar354._8_4_ = auVar271._8_4_ + fVar342;
            auVar354._12_4_ = auVar271._12_4_ + fVar222;
            auVar354._16_4_ = auVar271._16_4_ + fVar205;
            auVar354._20_4_ = auVar271._20_4_ + fVar218;
            auVar354._24_4_ = auVar271._24_4_ + fVar220;
            auVar354._28_4_ = auVar271._28_4_ + fStack_8e4;
            fVar338 = fVar223 * -fVar294 * auVar299._0_4_;
            fVar219 = fVar303 * -fVar335 * auVar299._4_4_;
            auVar76._4_4_ = fVar219;
            auVar76._0_4_ = fVar338;
            fVar342 = fVar224 * -fVar305 * auVar299._8_4_;
            auVar76._8_4_ = fVar342;
            fVar222 = fVar307 * -fVar336 * auVar299._12_4_;
            auVar76._12_4_ = fVar222;
            fVar205 = fVar225 * -fVar309 * auVar299._16_4_;
            auVar76._16_4_ = fVar205;
            fVar218 = fVar261 * -fVar260 * auVar299._20_4_;
            auVar76._20_4_ = fVar218;
            fVar220 = fVar155 * -fVar262 * auVar299._24_4_;
            auVar76._24_4_ = fVar220;
            auVar76._28_4_ = fVar172;
            auVar29 = vsubps_avx(auVar147,auVar74);
            auVar237._0_4_ = auVar254._0_4_ + fVar338;
            auVar237._4_4_ = auVar254._4_4_ + fVar219;
            auVar237._8_4_ = auVar254._8_4_ + fVar342;
            auVar237._12_4_ = auVar254._12_4_ + fVar222;
            auVar237._16_4_ = auVar254._16_4_ + fVar205;
            auVar237._20_4_ = auVar254._20_4_ + fVar218;
            auVar237._24_4_ = auVar254._24_4_ + fVar220;
            auVar237._28_4_ = auVar254._28_4_ + fVar172;
            fVar338 = fVar223 * 0.0 * auVar299._0_4_;
            fVar219 = fVar303 * 0.0 * auVar299._4_4_;
            auVar77._4_4_ = fVar219;
            auVar77._0_4_ = fVar338;
            fVar342 = fVar224 * 0.0 * auVar299._8_4_;
            auVar77._8_4_ = fVar342;
            fVar222 = fVar307 * 0.0 * auVar299._12_4_;
            auVar77._12_4_ = fVar222;
            fVar205 = fVar225 * 0.0 * auVar299._16_4_;
            auVar77._16_4_ = fVar205;
            fVar218 = fVar261 * 0.0 * auVar299._20_4_;
            auVar77._20_4_ = fVar218;
            fVar220 = fVar155 * 0.0 * auVar299._24_4_;
            auVar77._24_4_ = fVar220;
            auVar77._28_4_ = auVar147._28_4_;
            auVar27 = vsubps_avx(auVar271,auVar75);
            auVar116._4_4_ = fVar153;
            auVar116._0_4_ = fVar245;
            auVar116._8_4_ = fVar157;
            auVar116._12_4_ = fVar160;
            auVar116._16_4_ = fVar163;
            auVar116._20_4_ = fVar166;
            auVar116._24_4_ = fVar170;
            auVar116._28_4_ = fVar173;
            auVar317._0_4_ = fVar245 + fVar338;
            auVar317._4_4_ = fVar153 + fVar219;
            auVar317._8_4_ = fVar157 + fVar342;
            auVar317._12_4_ = fVar160 + fVar222;
            auVar317._16_4_ = fVar163 + fVar205;
            auVar317._20_4_ = fVar166 + fVar218;
            auVar317._24_4_ = fVar170 + fVar220;
            auVar317._28_4_ = fVar173 + auVar147._28_4_;
            auVar33 = vsubps_avx(auVar254,auVar76);
            auVar326 = vsubps_avx(auVar116,auVar77);
            auVar212 = vsubps_avx(auVar237,auVar346);
            auVar141 = vsubps_avx(auVar317,auVar29);
            auVar78._4_4_ = auVar29._4_4_ * auVar212._4_4_;
            auVar78._0_4_ = auVar29._0_4_ * auVar212._0_4_;
            auVar78._8_4_ = auVar29._8_4_ * auVar212._8_4_;
            auVar78._12_4_ = auVar29._12_4_ * auVar212._12_4_;
            auVar78._16_4_ = auVar29._16_4_ * auVar212._16_4_;
            auVar78._20_4_ = auVar29._20_4_ * auVar212._20_4_;
            auVar78._24_4_ = auVar29._24_4_ * auVar212._24_4_;
            auVar78._28_4_ = auVar349._28_4_;
            auVar79._4_4_ = auVar346._4_4_ * auVar141._4_4_;
            auVar79._0_4_ = auVar346._0_4_ * auVar141._0_4_;
            auVar79._8_4_ = auVar346._8_4_ * auVar141._8_4_;
            auVar79._12_4_ = auVar346._12_4_ * auVar141._12_4_;
            auVar79._16_4_ = auVar346._16_4_ * auVar141._16_4_;
            auVar79._20_4_ = auVar346._20_4_ * auVar141._20_4_;
            auVar79._24_4_ = auVar346._24_4_ * auVar141._24_4_;
            auVar79._28_4_ = fVar173;
            auVar211 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = auVar253._4_4_ * auVar141._4_4_;
            auVar80._0_4_ = auVar253._0_4_ * auVar141._0_4_;
            auVar80._8_4_ = auVar253._8_4_ * auVar141._8_4_;
            auVar80._12_4_ = auVar253._12_4_ * auVar141._12_4_;
            auVar80._16_4_ = auVar253._16_4_ * auVar141._16_4_;
            auVar80._20_4_ = auVar253._20_4_ * auVar141._20_4_;
            auVar80._24_4_ = auVar253._24_4_ * auVar141._24_4_;
            auVar80._28_4_ = auVar141._28_4_;
            auVar141 = vsubps_avx(auVar354,auVar253);
            auVar81._4_4_ = auVar29._4_4_ * auVar141._4_4_;
            auVar81._0_4_ = auVar29._0_4_ * auVar141._0_4_;
            auVar81._8_4_ = auVar29._8_4_ * auVar141._8_4_;
            auVar81._12_4_ = auVar29._12_4_ * auVar141._12_4_;
            auVar81._16_4_ = auVar29._16_4_ * auVar141._16_4_;
            auVar81._20_4_ = auVar29._20_4_ * auVar141._20_4_;
            auVar81._24_4_ = auVar29._24_4_ * auVar141._24_4_;
            auVar81._28_4_ = auVar28._28_4_;
            auVar234 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar346._4_4_ * auVar141._4_4_;
            auVar82._0_4_ = auVar346._0_4_ * auVar141._0_4_;
            auVar82._8_4_ = auVar346._8_4_ * auVar141._8_4_;
            auVar82._12_4_ = auVar346._12_4_ * auVar141._12_4_;
            auVar82._16_4_ = auVar346._16_4_ * auVar141._16_4_;
            auVar82._20_4_ = auVar346._20_4_ * auVar141._20_4_;
            auVar82._24_4_ = auVar346._24_4_ * auVar141._24_4_;
            auVar82._28_4_ = auVar28._28_4_;
            auVar83._4_4_ = auVar253._4_4_ * auVar212._4_4_;
            auVar83._0_4_ = auVar253._0_4_ * auVar212._0_4_;
            auVar83._8_4_ = auVar253._8_4_ * auVar212._8_4_;
            auVar83._12_4_ = auVar253._12_4_ * auVar212._12_4_;
            auVar83._16_4_ = auVar253._16_4_ * auVar212._16_4_;
            auVar83._20_4_ = auVar253._20_4_ * auVar212._20_4_;
            auVar83._24_4_ = auVar253._24_4_ * auVar212._24_4_;
            auVar83._28_4_ = auVar212._28_4_;
            auVar28 = vsubps_avx(auVar83,auVar82);
            auVar186._0_4_ = auVar211._0_4_ * 0.0 + auVar28._0_4_ + auVar234._0_4_ * 0.0;
            auVar186._4_4_ = auVar211._4_4_ * 0.0 + auVar28._4_4_ + auVar234._4_4_ * 0.0;
            auVar186._8_4_ = auVar211._8_4_ * 0.0 + auVar28._8_4_ + auVar234._8_4_ * 0.0;
            auVar186._12_4_ = auVar211._12_4_ * 0.0 + auVar28._12_4_ + auVar234._12_4_ * 0.0;
            auVar186._16_4_ = auVar211._16_4_ * 0.0 + auVar28._16_4_ + auVar234._16_4_ * 0.0;
            auVar186._20_4_ = auVar211._20_4_ * 0.0 + auVar28._20_4_ + auVar234._20_4_ * 0.0;
            auVar186._24_4_ = auVar211._24_4_ * 0.0 + auVar28._24_4_ + auVar234._24_4_ * 0.0;
            auVar186._28_4_ = auVar211._28_4_ + auVar28._28_4_ + auVar234._28_4_;
            auVar314 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
            auVar28 = vblendvps_avx(auVar27,_local_780,auVar314);
            auVar217 = ZEXT3264(auVar28);
            auVar113._4_4_ = auVar216._4_4_ + fVar241;
            auVar113._0_4_ = auVar216._0_4_ + fVar226;
            auVar113._8_4_ = auVar216._8_4_ + fVar246;
            auVar113._12_4_ = auVar216._12_4_ + fVar257;
            auVar113._16_4_ = auVar216._16_4_ + fVar258;
            auVar113._20_4_ = auVar216._20_4_ + fVar281;
            auVar113._24_4_ = auVar216._24_4_ + fVar283;
            auVar113._28_4_ = auVar216._28_4_ + -fVar259;
            auVar27 = vblendvps_avx(auVar33,auVar113,auVar314);
            auVar33 = vblendvps_avx(auVar326,auVar369,auVar314);
            auVar326 = vblendvps_avx(auVar253,auVar354,auVar314);
            auVar212 = vblendvps_avx(auVar346,auVar237,auVar314);
            auVar141 = vblendvps_avx(auVar29,auVar317,auVar314);
            auVar211 = vblendvps_avx(auVar354,auVar253,auVar314);
            auVar234 = vblendvps_avx(auVar237,auVar346,auVar314);
            auVar291 = vblendvps_avx(auVar317,auVar29,auVar314);
            auVar253 = vandps_avx(auVar202,auVar21);
            auVar211 = vsubps_avx(auVar211,auVar28);
            auVar30 = vsubps_avx(auVar234,auVar27);
            auVar291 = vsubps_avx(auVar291,auVar33);
            auVar31 = vsubps_avx(auVar27,auVar212);
            fVar338 = auVar30._0_4_;
            fVar278 = auVar33._0_4_;
            fVar221 = auVar30._4_4_;
            fVar279 = auVar33._4_4_;
            auVar84._4_4_ = fVar279 * fVar221;
            auVar84._0_4_ = fVar278 * fVar338;
            fVar257 = auVar30._8_4_;
            fVar280 = auVar33._8_4_;
            auVar84._8_4_ = fVar280 * fVar257;
            fVar303 = auVar30._12_4_;
            fVar282 = auVar33._12_4_;
            auVar84._12_4_ = fVar282 * fVar303;
            fVar260 = auVar30._16_4_;
            fVar284 = auVar33._16_4_;
            auVar84._16_4_ = fVar284 * fVar260;
            fVar168 = auVar30._20_4_;
            fVar259 = auVar33._20_4_;
            auVar84._20_4_ = fVar259 * fVar168;
            fVar170 = auVar30._24_4_;
            fVar264 = auVar33._24_4_;
            auVar84._24_4_ = fVar264 * fVar170;
            auVar84._28_4_ = auVar234._28_4_;
            fVar219 = auVar27._0_4_;
            fVar273 = auVar291._0_4_;
            fVar226 = auVar27._4_4_;
            fVar275 = auVar291._4_4_;
            auVar85._4_4_ = fVar275 * fVar226;
            auVar85._0_4_ = fVar273 * fVar219;
            fVar258 = auVar27._8_4_;
            fVar277 = auVar291._8_4_;
            auVar85._8_4_ = fVar277 * fVar258;
            fVar305 = auVar27._12_4_;
            fVar293 = auVar291._12_4_;
            auVar85._12_4_ = fVar293 * fVar305;
            fVar261 = auVar27._16_4_;
            fVar302 = auVar291._16_4_;
            auVar85._16_4_ = fVar302 * fVar261;
            fVar245 = auVar27._20_4_;
            fVar304 = auVar291._20_4_;
            auVar85._20_4_ = fVar304 * fVar245;
            fVar173 = auVar27._24_4_;
            fVar306 = auVar291._24_4_;
            uVar11 = auVar346._28_4_;
            auVar85._24_4_ = fVar306 * fVar173;
            auVar85._28_4_ = uVar11;
            auVar234 = vsubps_avx(auVar85,auVar84);
            fVar342 = auVar28._0_4_;
            fVar239 = auVar28._4_4_;
            auVar86._4_4_ = fVar275 * fVar239;
            auVar86._0_4_ = fVar273 * fVar342;
            fVar281 = auVar28._8_4_;
            auVar86._8_4_ = fVar277 * fVar281;
            fVar224 = auVar28._12_4_;
            auVar86._12_4_ = fVar293 * fVar224;
            fVar262 = auVar28._16_4_;
            auVar86._16_4_ = fVar302 * fVar262;
            fVar153 = auVar28._20_4_;
            auVar86._20_4_ = fVar304 * fVar153;
            fVar174 = auVar28._24_4_;
            auVar86._24_4_ = fVar306 * fVar174;
            auVar86._28_4_ = uVar11;
            fVar222 = auVar211._0_4_;
            fVar241 = auVar211._4_4_;
            auVar87._4_4_ = fVar279 * fVar241;
            auVar87._0_4_ = fVar278 * fVar222;
            fVar283 = auVar211._8_4_;
            auVar87._8_4_ = fVar280 * fVar283;
            fVar336 = auVar211._12_4_;
            auVar87._12_4_ = fVar282 * fVar336;
            fVar155 = auVar211._16_4_;
            auVar87._16_4_ = fVar284 * fVar155;
            fVar157 = auVar211._20_4_;
            auVar87._20_4_ = fVar259 * fVar157;
            fVar190 = auVar211._24_4_;
            auVar87._24_4_ = fVar264 * fVar190;
            auVar87._28_4_ = auVar354._28_4_;
            auVar346 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = fVar226 * fVar241;
            auVar88._0_4_ = fVar219 * fVar222;
            auVar88._8_4_ = fVar258 * fVar283;
            auVar88._12_4_ = fVar305 * fVar336;
            auVar88._16_4_ = fVar261 * fVar155;
            auVar88._20_4_ = fVar245 * fVar157;
            auVar88._24_4_ = fVar173 * fVar190;
            auVar88._28_4_ = uVar11;
            auVar89._4_4_ = fVar239 * fVar221;
            auVar89._0_4_ = fVar342 * fVar338;
            auVar89._8_4_ = fVar281 * fVar257;
            auVar89._12_4_ = fVar224 * fVar303;
            auVar89._16_4_ = fVar262 * fVar260;
            auVar89._20_4_ = fVar153 * fVar168;
            auVar89._24_4_ = fVar174 * fVar170;
            auVar89._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar89,auVar88);
            auVar32 = vsubps_avx(auVar33,auVar141);
            fVar218 = auVar29._28_4_ + auVar346._28_4_;
            auVar328._0_4_ = auVar29._0_4_ + auVar346._0_4_ * 0.0 + auVar234._0_4_ * 0.0;
            auVar328._4_4_ = auVar29._4_4_ + auVar346._4_4_ * 0.0 + auVar234._4_4_ * 0.0;
            auVar328._8_4_ = auVar29._8_4_ + auVar346._8_4_ * 0.0 + auVar234._8_4_ * 0.0;
            auVar328._12_4_ = auVar29._12_4_ + auVar346._12_4_ * 0.0 + auVar234._12_4_ * 0.0;
            auVar328._16_4_ = auVar29._16_4_ + auVar346._16_4_ * 0.0 + auVar234._16_4_ * 0.0;
            auVar328._20_4_ = auVar29._20_4_ + auVar346._20_4_ * 0.0 + auVar234._20_4_ * 0.0;
            auVar328._24_4_ = auVar29._24_4_ + auVar346._24_4_ * 0.0 + auVar234._24_4_ * 0.0;
            auVar328._28_4_ = fVar218 + auVar234._28_4_;
            fVar205 = auVar31._0_4_;
            fVar243 = auVar31._4_4_;
            auVar90._4_4_ = auVar141._4_4_ * fVar243;
            auVar90._0_4_ = auVar141._0_4_ * fVar205;
            fVar294 = auVar31._8_4_;
            auVar90._8_4_ = auVar141._8_4_ * fVar294;
            fVar307 = auVar31._12_4_;
            auVar90._12_4_ = auVar141._12_4_ * fVar307;
            fVar364 = auVar31._16_4_;
            auVar90._16_4_ = auVar141._16_4_ * fVar364;
            fVar160 = auVar31._20_4_;
            auVar90._20_4_ = auVar141._20_4_ * fVar160;
            fVar265 = auVar31._24_4_;
            auVar90._24_4_ = auVar141._24_4_ * fVar265;
            auVar90._28_4_ = fVar218;
            fVar218 = auVar32._0_4_;
            fVar246 = auVar32._4_4_;
            auVar91._4_4_ = auVar212._4_4_ * fVar246;
            auVar91._0_4_ = auVar212._0_4_ * fVar218;
            fVar223 = auVar32._8_4_;
            auVar91._8_4_ = auVar212._8_4_ * fVar223;
            fVar309 = auVar32._12_4_;
            auVar91._12_4_ = auVar212._12_4_ * fVar309;
            fVar365 = auVar32._16_4_;
            auVar91._16_4_ = auVar212._16_4_ * fVar365;
            fVar163 = auVar32._20_4_;
            auVar91._20_4_ = auVar212._20_4_ * fVar163;
            fVar274 = auVar32._24_4_;
            auVar91._24_4_ = auVar212._24_4_ * fVar274;
            auVar91._28_4_ = auVar29._28_4_;
            auVar346 = vsubps_avx(auVar91,auVar90);
            auVar29 = vsubps_avx(auVar28,auVar326);
            fVar220 = auVar29._0_4_;
            fVar256 = auVar29._4_4_;
            auVar92._4_4_ = auVar141._4_4_ * fVar256;
            auVar92._0_4_ = auVar141._0_4_ * fVar220;
            fVar335 = auVar29._8_4_;
            auVar92._8_4_ = auVar141._8_4_ * fVar335;
            fVar225 = auVar29._12_4_;
            auVar92._12_4_ = auVar141._12_4_ * fVar225;
            fVar366 = auVar29._16_4_;
            auVar92._16_4_ = auVar141._16_4_ * fVar366;
            fVar166 = auVar29._20_4_;
            auVar92._20_4_ = auVar141._20_4_ * fVar166;
            fVar276 = auVar29._24_4_;
            auVar92._24_4_ = auVar141._24_4_ * fVar276;
            auVar92._28_4_ = auVar141._28_4_;
            auVar93._4_4_ = fVar246 * auVar326._4_4_;
            auVar93._0_4_ = fVar218 * auVar326._0_4_;
            auVar93._8_4_ = fVar223 * auVar326._8_4_;
            auVar93._12_4_ = fVar309 * auVar326._12_4_;
            auVar93._16_4_ = fVar365 * auVar326._16_4_;
            auVar93._20_4_ = fVar163 * auVar326._20_4_;
            auVar93._24_4_ = fVar274 * auVar326._24_4_;
            auVar93._28_4_ = auVar234._28_4_;
            auVar141 = vsubps_avx(auVar92,auVar93);
            auVar94._4_4_ = auVar212._4_4_ * fVar256;
            auVar94._0_4_ = auVar212._0_4_ * fVar220;
            auVar94._8_4_ = auVar212._8_4_ * fVar335;
            auVar94._12_4_ = auVar212._12_4_ * fVar225;
            auVar94._16_4_ = auVar212._16_4_ * fVar366;
            auVar94._20_4_ = auVar212._20_4_ * fVar166;
            auVar94._24_4_ = auVar212._24_4_ * fVar276;
            auVar94._28_4_ = auVar212._28_4_;
            auVar95._4_4_ = fVar243 * auVar326._4_4_;
            auVar95._0_4_ = fVar205 * auVar326._0_4_;
            auVar95._8_4_ = fVar294 * auVar326._8_4_;
            auVar95._12_4_ = fVar307 * auVar326._12_4_;
            auVar95._16_4_ = fVar364 * auVar326._16_4_;
            auVar95._20_4_ = fVar160 * auVar326._20_4_;
            auVar95._24_4_ = fVar265 * auVar326._24_4_;
            auVar95._28_4_ = auVar326._28_4_;
            auVar326 = vsubps_avx(auVar95,auVar94);
            auVar148._0_4_ = auVar346._0_4_ * 0.0 + auVar326._0_4_ + auVar141._0_4_ * 0.0;
            auVar148._4_4_ = auVar346._4_4_ * 0.0 + auVar326._4_4_ + auVar141._4_4_ * 0.0;
            auVar148._8_4_ = auVar346._8_4_ * 0.0 + auVar326._8_4_ + auVar141._8_4_ * 0.0;
            auVar148._12_4_ = auVar346._12_4_ * 0.0 + auVar326._12_4_ + auVar141._12_4_ * 0.0;
            auVar148._16_4_ = auVar346._16_4_ * 0.0 + auVar326._16_4_ + auVar141._16_4_ * 0.0;
            auVar148._20_4_ = auVar346._20_4_ * 0.0 + auVar326._20_4_ + auVar141._20_4_ * 0.0;
            auVar148._24_4_ = auVar346._24_4_ * 0.0 + auVar326._24_4_ + auVar141._24_4_ * 0.0;
            auVar148._28_4_ = auVar141._28_4_ + auVar326._28_4_ + auVar141._28_4_;
            auVar150 = ZEXT3264(auVar148);
            auVar326 = vmaxps_avx(auVar328,auVar148);
            auVar326 = vcmpps_avx(auVar326,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar212 = auVar253 & auVar326;
            if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar212 >> 0x7f,0) == '\0') &&
                  (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar212 >> 0xbf,0) == '\0') &&
                (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar212[0x1f]) {
LAB_00f50014:
              auVar188._8_8_ = uStack_5d8;
              auVar188._0_8_ = local_5e0;
              auVar188._16_8_ = uStack_5d0;
              auVar188._24_8_ = uStack_5c8;
              auVar301 = ZEXT3264(CONCAT428(fVar172,CONCAT424(fVar169,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar159,CONCAT48(fVar156,
                                                  CONCAT44(fVar152,fVar133))))))));
            }
            else {
              auVar212 = vandps_avx(auVar326,auVar253);
              auVar96._4_4_ = fVar246 * fVar221;
              auVar96._0_4_ = fVar218 * fVar338;
              auVar96._8_4_ = fVar223 * fVar257;
              auVar96._12_4_ = fVar309 * fVar303;
              auVar96._16_4_ = fVar365 * fVar260;
              auVar96._20_4_ = fVar163 * fVar168;
              auVar96._24_4_ = fVar274 * fVar170;
              auVar96._28_4_ = auVar253._28_4_;
              auVar97._4_4_ = fVar243 * fVar275;
              auVar97._0_4_ = fVar205 * fVar273;
              auVar97._8_4_ = fVar294 * fVar277;
              auVar97._12_4_ = fVar307 * fVar293;
              auVar97._16_4_ = fVar364 * fVar302;
              auVar97._20_4_ = fVar160 * fVar304;
              auVar97._24_4_ = fVar265 * fVar306;
              auVar97._28_4_ = auVar326._28_4_;
              auVar326 = vsubps_avx(auVar97,auVar96);
              auVar98._4_4_ = fVar256 * fVar275;
              auVar98._0_4_ = fVar220 * fVar273;
              auVar98._8_4_ = fVar335 * fVar277;
              auVar98._12_4_ = fVar225 * fVar293;
              auVar98._16_4_ = fVar366 * fVar302;
              auVar98._20_4_ = fVar166 * fVar304;
              auVar98._24_4_ = fVar276 * fVar306;
              auVar98._28_4_ = auVar291._28_4_;
              auVar99._4_4_ = fVar246 * fVar241;
              auVar99._0_4_ = fVar218 * fVar222;
              auVar99._8_4_ = fVar223 * fVar283;
              auVar99._12_4_ = fVar309 * fVar336;
              auVar99._16_4_ = fVar365 * fVar155;
              auVar99._20_4_ = fVar163 * fVar157;
              auVar99._24_4_ = fVar274 * fVar190;
              auVar99._28_4_ = auVar32._28_4_;
              auVar141 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar243 * fVar241;
              auVar100._0_4_ = fVar205 * fVar222;
              auVar100._8_4_ = fVar294 * fVar283;
              auVar100._12_4_ = fVar307 * fVar336;
              auVar100._16_4_ = fVar364 * fVar155;
              auVar100._20_4_ = fVar160 * fVar157;
              auVar100._24_4_ = fVar265 * fVar190;
              auVar100._28_4_ = auVar211._28_4_;
              auVar101._4_4_ = fVar256 * fVar221;
              auVar101._0_4_ = fVar220 * fVar338;
              auVar101._8_4_ = fVar335 * fVar257;
              auVar101._12_4_ = fVar225 * fVar303;
              auVar101._16_4_ = fVar366 * fVar260;
              auVar101._20_4_ = fVar166 * fVar168;
              auVar101._24_4_ = fVar276 * fVar170;
              auVar101._28_4_ = auVar30._28_4_;
              auVar234 = vsubps_avx(auVar101,auVar100);
              auVar187._0_4_ = auVar326._0_4_ * 0.0 + auVar234._0_4_ + auVar141._0_4_ * 0.0;
              auVar187._4_4_ = auVar326._4_4_ * 0.0 + auVar234._4_4_ + auVar141._4_4_ * 0.0;
              auVar187._8_4_ = auVar326._8_4_ * 0.0 + auVar234._8_4_ + auVar141._8_4_ * 0.0;
              auVar187._12_4_ = auVar326._12_4_ * 0.0 + auVar234._12_4_ + auVar141._12_4_ * 0.0;
              auVar187._16_4_ = auVar326._16_4_ * 0.0 + auVar234._16_4_ + auVar141._16_4_ * 0.0;
              auVar187._20_4_ = auVar326._20_4_ * 0.0 + auVar234._20_4_ + auVar141._20_4_ * 0.0;
              auVar187._24_4_ = auVar326._24_4_ * 0.0 + auVar234._24_4_ + auVar141._24_4_ * 0.0;
              auVar187._28_4_ = auVar30._28_4_ + auVar234._28_4_ + auVar211._28_4_;
              auVar253 = vrcpps_avx(auVar187);
              fVar338 = auVar253._0_4_;
              fVar222 = auVar253._4_4_;
              auVar102._4_4_ = auVar187._4_4_ * fVar222;
              auVar102._0_4_ = auVar187._0_4_ * fVar338;
              fVar205 = auVar253._8_4_;
              auVar102._8_4_ = auVar187._8_4_ * fVar205;
              fVar218 = auVar253._12_4_;
              auVar102._12_4_ = auVar187._12_4_ * fVar218;
              fVar220 = auVar253._16_4_;
              auVar102._16_4_ = auVar187._16_4_ * fVar220;
              fVar221 = auVar253._20_4_;
              auVar102._20_4_ = auVar187._20_4_ * fVar221;
              fVar241 = auVar253._24_4_;
              auVar102._24_4_ = auVar187._24_4_ * fVar241;
              auVar102._28_4_ = auVar32._28_4_;
              auVar350._8_4_ = 0x3f800000;
              auVar350._0_8_ = 0x3f8000003f800000;
              auVar350._12_4_ = 0x3f800000;
              auVar350._16_4_ = 0x3f800000;
              auVar350._20_4_ = 0x3f800000;
              auVar350._24_4_ = 0x3f800000;
              auVar350._28_4_ = 0x3f800000;
              auVar253 = vsubps_avx(auVar350,auVar102);
              fVar338 = auVar253._0_4_ * fVar338 + fVar338;
              fVar222 = auVar253._4_4_ * fVar222 + fVar222;
              fVar205 = auVar253._8_4_ * fVar205 + fVar205;
              fVar218 = auVar253._12_4_ * fVar218 + fVar218;
              fVar220 = auVar253._16_4_ * fVar220 + fVar220;
              fVar221 = auVar253._20_4_ * fVar221 + fVar221;
              fVar241 = auVar253._24_4_ * fVar241 + fVar241;
              auVar103._4_4_ =
                   (fVar239 * auVar326._4_4_ + auVar141._4_4_ * fVar226 + auVar234._4_4_ * fVar279)
                   * fVar222;
              auVar103._0_4_ =
                   (fVar342 * auVar326._0_4_ + auVar141._0_4_ * fVar219 + auVar234._0_4_ * fVar278)
                   * fVar338;
              auVar103._8_4_ =
                   (fVar281 * auVar326._8_4_ + auVar141._8_4_ * fVar258 + auVar234._8_4_ * fVar280)
                   * fVar205;
              auVar103._12_4_ =
                   (fVar224 * auVar326._12_4_ +
                   auVar141._12_4_ * fVar305 + auVar234._12_4_ * fVar282) * fVar218;
              auVar103._16_4_ =
                   (fVar262 * auVar326._16_4_ +
                   auVar141._16_4_ * fVar261 + auVar234._16_4_ * fVar284) * fVar220;
              auVar103._20_4_ =
                   (fVar153 * auVar326._20_4_ +
                   auVar141._20_4_ * fVar245 + auVar234._20_4_ * fVar259) * fVar221;
              auVar103._24_4_ =
                   (fVar174 * auVar326._24_4_ +
                   auVar141._24_4_ * fVar173 + auVar234._24_4_ * fVar264) * fVar241;
              auVar103._28_4_ = auVar28._28_4_ + auVar27._28_4_ + auVar33._28_4_;
              auVar217 = ZEXT3264(auVar103);
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar238._4_4_ = uVar11;
              auVar238._0_4_ = uVar11;
              auVar238._8_4_ = uVar11;
              auVar238._12_4_ = uVar11;
              auVar238._16_4_ = uVar11;
              auVar238._20_4_ = uVar11;
              auVar238._24_4_ = uVar11;
              auVar238._28_4_ = uVar11;
              auVar253 = vcmpps_avx(_local_4e0,auVar103,2);
              auVar28 = vcmpps_avx(auVar103,auVar238,2);
              auVar253 = vandps_avx(auVar253,auVar28);
              auVar27 = auVar212 & auVar253;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0x7f,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0xbf,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar27[0x1f]) goto LAB_00f50014;
              auVar253 = vandps_avx(auVar212,auVar253);
              auVar27 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar187,4);
              auVar33 = auVar253 & auVar27;
              auVar188._8_8_ = uStack_5d8;
              auVar188._0_8_ = local_5e0;
              auVar188._16_8_ = uStack_5d0;
              auVar188._24_8_ = uStack_5c8;
              auVar301 = ZEXT3264(CONCAT428(fVar172,CONCAT424(fVar169,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar159,CONCAT48(fVar156,
                                                  CONCAT44(fVar152,fVar133))))))));
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar188 = vandps_avx(auVar27,auVar253);
                auVar104._4_4_ = auVar328._4_4_ * fVar222;
                auVar104._0_4_ = auVar328._0_4_ * fVar338;
                auVar104._8_4_ = auVar328._8_4_ * fVar205;
                auVar104._12_4_ = auVar328._12_4_ * fVar218;
                auVar104._16_4_ = auVar328._16_4_ * fVar220;
                auVar104._20_4_ = auVar328._20_4_ * fVar221;
                auVar104._24_4_ = auVar328._24_4_ * fVar241;
                auVar104._28_4_ = auVar28._28_4_;
                auVar105._4_4_ = auVar148._4_4_ * fVar222;
                auVar105._0_4_ = auVar148._0_4_ * fVar338;
                auVar105._8_4_ = auVar148._8_4_ * fVar205;
                auVar105._12_4_ = auVar148._12_4_ * fVar218;
                auVar105._16_4_ = auVar148._16_4_ * fVar220;
                auVar105._20_4_ = auVar148._20_4_ * fVar221;
                auVar105._24_4_ = auVar148._24_4_ * fVar241;
                auVar105._28_4_ = auVar148._28_4_;
                auVar272._8_4_ = 0x3f800000;
                auVar272._0_8_ = 0x3f8000003f800000;
                auVar272._12_4_ = 0x3f800000;
                auVar272._16_4_ = 0x3f800000;
                auVar272._20_4_ = 0x3f800000;
                auVar272._24_4_ = 0x3f800000;
                auVar272._28_4_ = 0x3f800000;
                auVar253 = vsubps_avx(auVar272,auVar104);
                local_280 = vblendvps_avx(auVar253,auVar104,auVar314);
                auVar253 = vsubps_avx(auVar272,auVar105);
                _local_540 = vblendvps_avx(auVar253,auVar105,auVar314);
                auVar150 = ZEXT3264(_local_540);
                local_2a0 = auVar103;
              }
            }
            auVar360 = ZEXT3264(auVar233);
            local_580 = auVar21;
            if ((((((((auVar188 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar188 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar188 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar188 >> 0x7f,0) != '\0') ||
                  (auVar188 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar188 >> 0xbf,0) != '\0') ||
                (auVar188 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar188[0x1f] < '\0') {
              auVar253 = vsubps_avx(auVar299,auVar301._0_32_);
              auVar217 = ZEXT3264(local_280);
              fVar219 = auVar301._0_4_ + auVar253._0_4_ * local_280._0_4_;
              fVar342 = auVar301._4_4_ + auVar253._4_4_ * local_280._4_4_;
              fVar222 = auVar301._8_4_ + auVar253._8_4_ * local_280._8_4_;
              fVar205 = auVar301._12_4_ + auVar253._12_4_ * local_280._12_4_;
              fVar218 = auVar301._16_4_ + auVar253._16_4_ * local_280._16_4_;
              fVar220 = auVar301._20_4_ + auVar253._20_4_ * local_280._20_4_;
              fVar221 = auVar301._24_4_ + auVar253._24_4_ * local_280._24_4_;
              fVar226 = auVar301._28_4_ + auVar253._28_4_;
              fVar338 = *(float *)((long)local_718->ray_space + k * 4 + -0x20);
              auVar106._4_4_ = (fVar342 + fVar342) * fVar338;
              auVar106._0_4_ = (fVar219 + fVar219) * fVar338;
              auVar106._8_4_ = (fVar222 + fVar222) * fVar338;
              auVar106._12_4_ = (fVar205 + fVar205) * fVar338;
              auVar106._16_4_ = (fVar218 + fVar218) * fVar338;
              auVar106._20_4_ = (fVar220 + fVar220) * fVar338;
              auVar106._24_4_ = (fVar221 + fVar221) * fVar338;
              auVar106._28_4_ = fVar226 + fVar226;
              auVar253 = vcmpps_avx(local_2a0,auVar106,6);
              auVar150 = ZEXT3264(auVar253);
              auVar21 = auVar188 & auVar253;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                local_320 = vandps_avx(auVar253,auVar188);
                auVar150 = ZEXT3264(local_320);
                local_3c0 = (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0;
                fStack_3bc = (float)local_540._4_4_ + (float)local_540._4_4_ + -1.0;
                fStack_3b8 = (float)uStack_538 + (float)uStack_538 + -1.0;
                fStack_3b4 = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
                fStack_3b0 = (float)uStack_530 + (float)uStack_530 + -1.0;
                fStack_3ac = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
                fStack_3a8 = (float)uStack_528 + (float)uStack_528 + -1.0;
                fStack_3a4 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
                local_3e0 = local_280;
                local_3a0 = local_2a0;
                local_370 = local_740;
                uStack_368 = uStack_738;
                local_360 = local_650;
                uStack_358 = uStack_648;
                local_350 = local_660;
                uStack_348 = uStack_658;
                local_340 = local_670;
                uStack_338 = uStack_668;
                pGVar16 = (context->scene->geometries).items[uVar13].ptr;
                local_540._4_4_ = fStack_3bc;
                local_540._0_4_ = local_3c0;
                uStack_538._0_4_ = fStack_3b8;
                uStack_538._4_4_ = fStack_3b4;
                uStack_530._0_4_ = fStack_3b0;
                uStack_530._4_4_ = fStack_3ac;
                auVar121 = _local_540;
                uStack_528._0_4_ = fStack_3a8;
                uStack_528._4_4_ = fStack_3a4;
                auVar253 = _local_540;
                _local_540 = auVar253;
                if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar125 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar125 = context->args;
                  if ((pRVar125->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar125 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar125 >> 8),1),
                     pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar180._0_4_ = (float)(int)local_380;
                    auVar180._4_8_ = SUB128(ZEXT812(0),4);
                    auVar180._12_4_ = 0;
                    auVar248 = vshufps_avx(auVar180,auVar180,0);
                    local_300[0] = (auVar248._0_4_ + local_280._0_4_ + 0.0) * (float)local_e0._0_4_;
                    local_300[1] = (auVar248._4_4_ + local_280._4_4_ + 1.0) * (float)local_e0._4_4_;
                    local_300[2] = (auVar248._8_4_ + local_280._8_4_ + 2.0) * fStack_d8;
                    local_300[3] = (auVar248._12_4_ + local_280._12_4_ + 3.0) * fStack_d4;
                    fStack_2f0 = (auVar248._0_4_ + local_280._16_4_ + 4.0) * fStack_d0;
                    fStack_2ec = (auVar248._4_4_ + local_280._20_4_ + 5.0) * fStack_cc;
                    fStack_2e8 = (auVar248._8_4_ + local_280._24_4_ + 6.0) * fStack_c8;
                    fStack_2e4 = auVar248._12_4_ + (float)local_280._28_4_ + 7.0;
                    uStack_530 = auVar121._16_8_;
                    uStack_528 = auVar253._24_8_;
                    local_2e0 = local_540;
                    uStack_2d8 = uStack_538;
                    uStack_2d0 = uStack_530;
                    uStack_2c8 = uStack_528;
                    local_2c0 = local_2a0;
                    iVar123 = vmovmskps_avx(local_320);
                    local_7e0 = CONCAT44((int)((ulong)pRVar125 >> 0x20),iVar123);
                    lVar18 = 0;
                    if (local_7e0 != 0) {
                      for (; (local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                      }
                    }
                    local_8a0 = (uint)lVar18;
                    uStack_89c = (undefined4)((ulong)lVar18 >> 0x20);
                    if (iVar123 == 0) {
                      pRVar125 = (RTCIntersectArguments *)0x0;
                    }
                    else {
                      local_6c0 = ZEXT1632(*local_728);
                      uStack_6d0 = *(undefined8 *)(local_730 + 0x10);
                      _local_6e0 = *local_728;
                      uStack_6c8 = *(undefined8 *)(local_730 + 0x18);
                      uVar126 = *(uint *)(ray + k * 4 + 0x100);
                      local_37c = uVar15;
                      do {
                        lVar18 = CONCAT44(uStack_89c,local_8a0);
                        local_1a0 = local_300[lVar18];
                        local_180 = *(undefined4 *)((long)&local_2e0 + lVar18 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2c0 + lVar18 * 4);
                        fVar219 = 1.0 - local_1a0;
                        fVar338 = local_1a0 * fVar219 * 4.0;
                        auVar248 = ZEXT416((uint)(local_1a0 * local_1a0 * 0.5));
                        auVar248 = vshufps_avx(auVar248,auVar248,0);
                        auVar197 = ZEXT416((uint)((fVar219 * fVar219 + fVar338) * 0.5));
                        auVar197 = vshufps_avx(auVar197,auVar197,0);
                        auVar232 = ZEXT416((uint)((-local_1a0 * local_1a0 - fVar338) * 0.5));
                        auVar232 = vshufps_avx(auVar232,auVar232,0);
                        local_710.context = context->user;
                        auVar210 = ZEXT416((uint)(fVar219 * -fVar219 * 0.5));
                        auVar210 = vshufps_avx(auVar210,auVar210,0);
                        auVar198._0_4_ =
                             auVar210._0_4_ * (float)local_740._0_4_ +
                             auVar232._0_4_ * (float)local_650._0_4_ +
                             auVar248._0_4_ * (float)local_670._0_4_ +
                             auVar197._0_4_ * (float)local_660._0_4_;
                        auVar198._4_4_ =
                             auVar210._4_4_ * (float)local_740._4_4_ +
                             auVar232._4_4_ * (float)local_650._4_4_ +
                             auVar248._4_4_ * (float)local_670._4_4_ +
                             auVar197._4_4_ * (float)local_660._4_4_;
                        auVar198._8_4_ =
                             auVar210._8_4_ * (float)uStack_738 +
                             auVar232._8_4_ * (float)uStack_648 +
                             auVar248._8_4_ * (float)uStack_668 + auVar197._8_4_ * (float)uStack_658
                        ;
                        auVar198._12_4_ =
                             auVar210._12_4_ * uStack_738._4_4_ +
                             auVar232._12_4_ * uStack_648._4_4_ +
                             auVar248._12_4_ * uStack_668._4_4_ + auVar197._12_4_ * uStack_658._4_4_
                        ;
                        local_1f0 = vshufps_avx(auVar198,auVar198,0);
                        local_200[0] = (RTCHitN)local_1f0[0];
                        local_200[1] = (RTCHitN)local_1f0[1];
                        local_200[2] = (RTCHitN)local_1f0[2];
                        local_200[3] = (RTCHitN)local_1f0[3];
                        local_200[4] = (RTCHitN)local_1f0[4];
                        local_200[5] = (RTCHitN)local_1f0[5];
                        local_200[6] = (RTCHitN)local_1f0[6];
                        local_200[7] = (RTCHitN)local_1f0[7];
                        local_200[8] = (RTCHitN)local_1f0[8];
                        local_200[9] = (RTCHitN)local_1f0[9];
                        local_200[10] = (RTCHitN)local_1f0[10];
                        local_200[0xb] = (RTCHitN)local_1f0[0xb];
                        local_200[0xc] = (RTCHitN)local_1f0[0xc];
                        local_200[0xd] = (RTCHitN)local_1f0[0xd];
                        local_200[0xe] = (RTCHitN)local_1f0[0xe];
                        local_200[0xf] = (RTCHitN)local_1f0[0xf];
                        local_1d0 = vshufps_avx(auVar198,auVar198,0x55);
                        local_1e0 = local_1d0;
                        local_1b0 = vshufps_avx(auVar198,auVar198,0xaa);
                        local_1c0 = local_1b0;
                        fStack_19c = local_1a0;
                        fStack_198 = local_1a0;
                        fStack_194 = local_1a0;
                        fStack_190 = local_1a0;
                        fStack_18c = local_1a0;
                        fStack_188 = local_1a0;
                        fStack_184 = local_1a0;
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = local_5a0._0_8_;
                        uStack_158 = local_5a0._8_8_;
                        uStack_150 = local_5a0._16_8_;
                        uStack_148 = local_5a0._24_8_;
                        local_140 = local_500._0_8_;
                        uStack_138 = local_500._8_8_;
                        uStack_130 = local_500._16_8_;
                        uStack_128 = local_500._24_8_;
                        auVar253 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),
                                              ZEXT1632(ZEXT816(0) << 0x40),0xf);
                        local_720[1] = auVar253;
                        *local_720 = auVar253;
                        local_120 = (local_710.context)->instID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_100 = (local_710.context)->instPrimID[0];
                        uStack_fc = local_100;
                        uStack_f8 = local_100;
                        uStack_f4 = local_100;
                        uStack_f0 = local_100;
                        uStack_ec = local_100;
                        uStack_e8 = local_100;
                        uStack_e4 = local_100;
                        local_760 = local_6e0;
                        uStack_758 = uStack_6d8;
                        uStack_750 = uStack_6d0;
                        uStack_748 = uStack_6c8;
                        local_710.valid = (int *)&local_760;
                        local_710.geometryUserPtr = pGVar16->userPtr;
                        local_710.hit = local_200;
                        local_710.N = 8;
                        auVar181 = local_6c0._0_16_;
                        auVar140 = _local_780;
                        local_710.ray = (RTCRayN *)ray;
                        if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar301 = ZEXT1664(auVar301._0_16_);
                          (*pGVar16->occlusionFilterN)(&local_710);
                          auVar181._8_8_ = uStack_758;
                          auVar181._0_8_ = local_760;
                          auVar140._8_8_ = uStack_748;
                          auVar140._0_8_ = uStack_750;
                        }
                        auVar248 = vpcmpeqd_avx(auVar181,ZEXT816(0) << 0x40);
                        auVar197 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                        auVar217 = ZEXT1664(auVar197);
                        auVar203._16_16_ = auVar197;
                        auVar203._0_16_ = auVar248;
                        auVar21 = auVar253 & ~auVar203;
                        local_900._0_4_ = auVar253._0_4_;
                        local_900._4_4_ = auVar253._4_4_;
                        fStack_8f8 = auVar253._8_4_;
                        fStack_8f4 = auVar253._12_4_;
                        fStack_8f0 = auVar253._16_4_;
                        fStack_8ec = auVar253._20_4_;
                        fStack_8e8 = auVar253._24_4_;
                        fStack_8e4 = auVar253._28_4_;
                        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar21 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar21 >> 0x7f,0) == '\0') &&
                              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar21 >> 0xbf,0) == '\0') &&
                            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar21[0x1f]) {
                          auVar149._0_4_ = auVar248._0_4_ ^ local_900._0_4_;
                          auVar149._4_4_ = auVar248._4_4_ ^ local_900._4_4_;
                          auVar149._8_4_ = auVar248._8_4_ ^ (uint)fStack_8f8;
                          auVar149._12_4_ = auVar248._12_4_ ^ (uint)fStack_8f4;
                          auVar149._16_4_ = auVar197._0_4_ ^ (uint)fStack_8f0;
                          auVar149._20_4_ = auVar197._4_4_ ^ (uint)fStack_8ec;
                          auVar149._24_4_ = auVar197._8_4_ ^ (uint)fStack_8e8;
                          auVar149._28_4_ = auVar197._12_4_ ^ (uint)fStack_8e4;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar217 = ZEXT1664(auVar197);
                            auVar301 = ZEXT1664(auVar301._0_16_);
                            (*p_Var19)(&local_710);
                            auVar181._8_8_ = uStack_758;
                            auVar181._0_8_ = local_760;
                            auVar140._8_8_ = uStack_748;
                            auVar140._0_8_ = uStack_750;
                          }
                          auVar248 = vpcmpeqd_avx(auVar181,ZEXT816(0) << 0x40);
                          auVar197 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                          auVar189._16_16_ = auVar197;
                          auVar189._0_16_ = auVar248;
                          auVar149._0_4_ = auVar248._0_4_ ^ local_900._0_4_;
                          auVar149._4_4_ = auVar248._4_4_ ^ local_900._4_4_;
                          auVar149._8_4_ = auVar248._8_4_ ^ (uint)fStack_8f8;
                          auVar149._12_4_ = auVar248._12_4_ ^ (uint)fStack_8f4;
                          auVar149._16_4_ = auVar197._0_4_ ^ (uint)fStack_8f0;
                          auVar149._20_4_ = auVar197._4_4_ ^ (uint)fStack_8ec;
                          auVar149._24_4_ = auVar197._8_4_ ^ (uint)fStack_8e8;
                          auVar149._28_4_ = auVar197._12_4_ ^ (uint)fStack_8e4;
                          auVar204._8_4_ = 0xff800000;
                          auVar204._0_8_ = 0xff800000ff800000;
                          auVar204._12_4_ = 0xff800000;
                          auVar204._16_4_ = 0xff800000;
                          auVar204._20_4_ = 0xff800000;
                          auVar204._24_4_ = 0xff800000;
                          auVar204._28_4_ = 0xff800000;
                          auVar253 = vblendvps_avx(auVar204,*(undefined1 (*) [32])
                                                             (local_710.ray + 0x100),auVar189);
                          *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar253;
                        }
                        auVar150 = ZEXT3264(auVar149);
                        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0')
                              || (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                            (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar149[0x1f] < '\0') {
                          pRVar125 = (RTCIntersectArguments *)0x1;
                          break;
                        }
                        auVar150 = ZEXT464(uVar126);
                        *(uint *)(ray + k * 4 + 0x100) = uVar126;
                        local_7e0 = local_7e0 ^ 1L << ((ulong)local_8a0 & 0x3f);
                        lVar18 = 0;
                        if (local_7e0 != 0) {
                          for (; (local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        local_8a0 = (uint)lVar18;
                        uStack_89c = (undefined4)((ulong)lVar18 >> 0x20);
                        pRVar125 = (RTCIntersectArguments *)0x0;
                      } while (local_7e0 != 0);
                    }
                  }
                }
                auVar360 = ZEXT3264(auVar233);
                bVar128 = (bool)(bVar128 | (byte)pRVar125);
              }
            }
          }
          lVar131 = lVar131 + 8;
        } while ((int)lVar131 < (int)uVar15);
      }
      if (bVar128 != false) {
        return bVar128;
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar137._4_4_ = uVar11;
      auVar137._0_4_ = uVar11;
      auVar137._8_4_ = uVar11;
      auVar137._12_4_ = uVar11;
      auVar248 = vcmpps_avx(local_3f0,auVar137,2);
      uVar126 = vmovmskps_avx(auVar248);
      uVar122 = uVar122 & uVar122 + 0xf & uVar126;
    } while (uVar122 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }